

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::reflux
          (MLNodeLaplacian *this,int crse_amrlev,MultiFab *res,MultiFab *crse_sol,MultiFab *crse_rhs
          ,MultiFab *a_fine_res,MultiFab *fine_sol,MultiFab *fine_rhs)

{
  BoxArray *ba;
  DistributionMapping *dm;
  int *piVar1;
  int iVar2;
  pointer pVVar3;
  Geometry *this_00;
  Geometry *this_01;
  pointer paVar4;
  pointer puVar5;
  undefined8 uVar6;
  pointer puVar7;
  FabArray<amrex::IArrayBox> *this_02;
  pointer puVar8;
  pointer puVar9;
  long *plVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  LinOpBCType LVar16;
  LinOpBCType LVar17;
  int i;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  FabArray<amrex::FArrayBox> *this_03;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  pointer *ppbVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int ioff;
  long lVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  int iVar69;
  ulong uVar70;
  long lVar71;
  long lVar72;
  int iVar73;
  long lVar74;
  long lVar75;
  int iVar76;
  int iVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  uint uVar83;
  int iVar84;
  long lVar85;
  long lVar86;
  int iVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  int iVar100;
  int iVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  int iVar107;
  long lVar108;
  bool bVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  undefined *puVar117;
  double dVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  undefined1 auVar160 [16];
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar184;
  undefined1 auVar178 [16];
  double dVar177;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar196;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  double dVar219;
  double dVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  double dVar226;
  double dVar227;
  double dVar228;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  double dVar229;
  double dVar241;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  double dVar242;
  double dVar243;
  double dVar244;
  undefined1 auVar247 [16];
  double dVar245;
  double dVar251;
  undefined1 auVar248 [16];
  double dVar246;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  double dVar252;
  double dVar253;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  double dVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  Periodicity PVar269;
  Box bx_2;
  MFIter mfi_2;
  Box bx;
  Box bx_1;
  MultiFab fine_contrib_on_crse;
  MFItInfo mfi_info;
  MultiFab fine_contrib;
  MultiFab fine_res_for_coarse;
  long local_df8;
  long local_de8;
  long local_de0;
  long local_dd0;
  long local_dc8;
  long local_dc0;
  long local_db8;
  long local_db0;
  long local_da8;
  long local_da0;
  long local_d98;
  long local_d88;
  long local_d78;
  long local_d68;
  long local_d60;
  long local_d58;
  long local_d50;
  long local_d48;
  long local_d40;
  long local_d38;
  long local_d30;
  long local_d18;
  long local_d10;
  long local_d08;
  long local_d00;
  long local_cf8;
  long local_cf0;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  int local_cd8;
  int local_cd4;
  int local_cd0;
  int local_ccc;
  int local_cc8;
  long local_cc0;
  long local_cb8;
  long local_cb0;
  long local_ca0;
  long local_c98;
  long local_c90;
  long local_c80;
  long local_c68;
  long local_c50;
  long local_c40;
  long local_c38;
  long local_c28;
  long local_c20;
  long local_c18;
  long local_c10;
  long local_c08;
  long local_bf0;
  long local_bd8;
  long local_bd0;
  long local_bb8;
  long local_ba8;
  long local_b70;
  long local_b68;
  long local_b58;
  long local_b50;
  long local_b48;
  long local_b40;
  long local_b38;
  long local_b30;
  long local_b28;
  long local_b20;
  long local_b18;
  long local_b10;
  long local_b08;
  long local_af8;
  long local_af0;
  long local_ac0;
  long local_ab8;
  long local_ab0;
  long local_a98;
  long local_a70;
  long local_a68;
  long local_a60;
  long local_a58;
  long local_a50;
  long local_a48;
  long local_a40;
  long local_a38;
  long local_a30;
  long local_a18;
  long local_9e8;
  long local_998;
  long local_988;
  long local_978;
  Array4<const_double> local_878;
  Array4<const_double> local_838;
  undefined8 local_7f8;
  LinOpBCType local_7f0;
  undefined8 local_7e8;
  LinOpBCType local_7e0;
  double *local_7d8;
  undefined8 uStack_7d0;
  long local_7c0;
  long local_7b8;
  uint local_7ac;
  Array4<const_double> local_7a8;
  Array4<const_double> local_768;
  undefined1 local_728 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  int local_700;
  Vector<int,_std::allocator<int>_> *local_6e8;
  FabArray<amrex::FArrayBox> *local_6c8;
  long local_6c0;
  Array4<const_int> local_6b8;
  Array4<const_int> local_678;
  undefined8 local_638;
  int local_630;
  int local_62c [2];
  undefined8 uStack_624;
  double local_618;
  double local_610;
  double local_608;
  ulong local_600;
  int *local_5f8;
  long local_5f0;
  long local_5e8;
  ulong local_5e0;
  Box local_5d4;
  Array4<const_double> local_5b8;
  undefined8 local_578;
  int local_570;
  int local_56c [2];
  undefined8 uStack_564;
  Geometry *local_558;
  FabArray<amrex::FArrayBox> *local_550;
  FabArray<amrex::IArrayBox> *local_548;
  Real local_540;
  Real local_538;
  Real local_530;
  FabArray<amrex::FArrayBox> *local_528;
  long *local_520;
  undefined1 local_518 [192];
  IntVect local_458;
  int local_44c;
  Array4<const_double> local_390;
  MFItInfo local_34c;
  undefined1 local_338 [392];
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_6c0 = (long)crse_amrlev;
  iVar2 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[local_6c0];
  local_6c8 = &res->super_FabArray<amrex::FArrayBox>;
  local_550 = &crse_sol->super_FabArray<amrex::FArrayBox>;
  local_528 = &crse_rhs->super_FabArray<amrex::FArrayBox>;
  if ((iVar2 != 2) && ((this->super_MLNodeLinOp).m_coarsening_strategy != Sigma)) {
    Assert_host("amrrr == 2 || m_coarsening_strategy == CoarseningStrategy::Sigma",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sync.cpp"
                ,0x277,(char *)0x0);
  }
  pVVar3 = (this->super_MLNodeLinOp).super_MLLinOp.m_geom.
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(Geometry **)
             &pVVar3[local_6c0].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  iVar31 = (int)local_6c0 + 1;
  this_01 = *(Geometry **)
             &pVVar3[iVar31].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_540 = (this_00->super_CoordSys).inv_dx[0];
  local_538 = (this_00->super_CoordSys).inv_dx[1];
  local_530 = (this_00->super_CoordSys).inv_dx[2];
  dVar133 = (this_01->super_CoordSys).inv_dx[0];
  dVar118 = (this_01->super_CoordSys).inv_dx[1];
  dVar146 = (this_01->super_CoordSys).inv_dx[2];
  Geometry::growPeriodicDomain(this_00,1);
  uVar6 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
  local_558 = this_00;
  local_62c[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
  uStack_624 = *(undefined8 *)((this_00->domain).bigend.vect + 2);
  local_638 = *(undefined8 *)(this_00->domain).smallend.vect;
  local_630 = (int)uVar6;
  local_62c[0] = (int)((ulong)uVar6 >> 0x20);
  lVar24 = 0;
  do {
    if ((uStack_624._4_4_ >> ((uint)lVar24 & 0x1f) & 1) == 0) {
      local_62c[lVar24] = local_62c[lVar24] + 1;
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3);
  uStack_624 = CONCAT44(7,(int)uStack_624);
  uVar6 = *(undefined8 *)((this_01->domain).smallend.vect + 2);
  local_56c[1] = (int)((ulong)*(undefined8 *)(this_01->domain).bigend.vect >> 0x20);
  uStack_564 = *(undefined8 *)((this_01->domain).bigend.vect + 2);
  local_578 = *(undefined8 *)(this_01->domain).smallend.vect;
  local_570 = (int)uVar6;
  local_56c[0] = (int)((ulong)uVar6 >> 0x20);
  lVar24 = 0;
  do {
    if ((uStack_564._4_4_ >> ((uint)lVar24 & 0x1f) & 1) == 0) {
      local_56c[lVar24] = local_56c[lVar24] + 1;
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3);
  uStack_564 = CONCAT44(7,(int)uStack_564);
  paVar4 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_7e8 = *(undefined8 *)paVar4->_M_elems;
  local_7e0 = paVar4->_M_elems[2];
  paVar4 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_7f8 = *(undefined8 *)paVar4->_M_elems;
  local_7f0 = paVar4->_M_elems[2];
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
    lVar24 = 0;
    uVar83 = 0;
    do {
      local_7ac = 1;
      if (((uVar83 == 0) && (iVar73 = *(int *)((long)&local_7e8 + lVar24 * 4), iVar73 != 0x66)) &&
         (iVar73 != 0x6a)) {
        local_7ac = (uint)((*(int *)((long)&local_7f8 + lVar24 * 4) - 0x66U & 0xfffffffb) == 0);
      }
      lVar24 = lVar24 + 1;
      uVar83 = local_7ac;
    } while (lVar24 != 3);
  }
  else {
    local_7ac = 0;
  }
  ba = &(fine_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(fine_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  local_548 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(this->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar31].
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  puVar5 = (this->m_nosigma_stencil).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  amrex::coarsen((BoxArray *)local_338,ba,iVar2);
  local_518._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_518._8_8_ = (Arena *)0x0;
  local_518._16_8_ = (pointer)0x0;
  local_518._24_8_ = (pointer)0x0;
  local_518._32_8_ = (pointer)0x0;
  local_728._0_4_ = 0x8378d0;
  local_728._4_4_ = 0;
  MultiFab::MultiFab((MultiFab *)&local_1b0,(BoxArray *)local_338,dm,1,0,(MFInfo *)local_518,
                     (FabFactory<amrex::FArrayBox> *)local_728);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_518 + 0x10));
  BoxArray::~BoxArray((BoxArray *)local_338);
  if ((iVar2 == 4) &&
     (((uVar6 = *(undefined8 *)
                 (a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect,
       (int)uVar6 < 3 || ((int)((ulong)uVar6 >> 0x20) < 3)) ||
      ((a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] < 3)))) {
    this_03 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    local_338._1_7_ = 0;
    local_338[0] = true;
    local_338._8_4_ = 0;
    local_338._12_4_ = 0;
    local_338._16_8_ = 0;
    local_338._24_8_ = 0;
    local_338._32_8_ = 0;
    local_518._0_8_ = &PTR__FabFactory_008378d0;
    MultiFab::MultiFab((MultiFab *)this_03,
                       &(a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                       &(a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        distributionMap,1,3,(MFInfo *)local_338,
                       (FabFactory<amrex::FArrayBox> *)local_518);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_338 + 0x10));
    MultiFab::Copy((MultiFab *)this_03,a_fine_res,0,0,1,0);
  }
  else {
    this_03 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  if (this_03 != (FabArray<amrex::FArrayBox> *)0x0) {
    a_fine_res = (MultiFab *)this_03;
  }
  PVar269 = Geometry::periodicity(this_01);
  local_338[0] = PVar269.period.vect[0]._0_1_;
  local_338._1_7_ = PVar269.period.vect._1_7_;
  local_338._8_4_ = PVar269.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&a_fine_res->super_FabArray<amrex::FArrayBox>,(Periodicity *)local_338,false);
  MFIter::MFIter((MFIter *)local_338,&local_1b0.super_FabArrayBase,true);
  iVar87 = local_56c[1];
  iVar76 = local_56c[0];
  iVar73 = local_570;
  LVar17 = local_7e0;
  LVar16 = local_7f0;
  if ((int)local_338._32_4_ < (int)local_338._40_4_) {
    iVar12 = (int)local_578;
    iVar13 = local_578._4_4_;
    iVar45 = (int)uStack_564;
    iVar46 = (int)local_7e8;
    iVar84 = local_7e8._4_4_;
    iVar53 = (int)local_7f8;
    iVar59 = local_7f8._4_4_;
    do {
      MFIter::tilebox((Box *)&local_838,(MFIter *)local_338);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_518,&local_1b0,(MFIter *)local_338);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)local_728,&a_fine_res->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)local_338);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_878,local_548,(MFIter *)local_338);
      if ((this->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
        if (iVar2 == 2) {
          if ((int)local_838.jstride <= local_838.kstride._4_4_) {
            iVar19 = (int)local_838.jstride;
            do {
              if (local_838.p._4_4_ <= (int)local_838.kstride) {
                lVar24 = (long)iVar19 * 2;
                local_de0 = (long)local_838.p._4_4_;
                do {
                  if ((int)local_838.p <= local_838.jstride._4_4_) {
                    lVar64 = (long)(int)local_838.p;
                    iVar42 = (int)local_838.p * 2;
                    do {
                      dVar122 = 0.0;
                      dVar121 = 0.0;
                      if (*(int *)((long)local_878.p +
                                  (lVar64 * 2 - (long)local_878.begin.x) * 4 +
                                  (local_de0 * 2 - (long)local_878.begin.y) * local_878.jstride * 4
                                  + (lVar24 - local_878.begin.z) * local_878.kstride * 4) == 0) {
                        iVar55 = -1;
                        do {
                          iVar18 = -iVar55;
                          if (iVar55 < 1) {
                            iVar18 = iVar55;
                          }
                          iVar11 = (int)lVar24;
                          iVar20 = iVar55 + iVar11;
                          iVar23 = -1;
                          do {
                            iVar44 = -iVar23;
                            if (iVar23 < 1) {
                              iVar44 = iVar23;
                            }
                            iVar57 = (int)(local_de0 * 2);
                            iVar58 = iVar23 + iVar57;
                            iVar69 = -1;
                            do {
                              iVar21 = -iVar69;
                              if (iVar69 < 1) {
                                iVar21 = iVar69;
                              }
                              iVar56 = iVar42 + iVar69;
                              if (((iVar56 < iVar12) && ((iVar46 == 0x66 || (iVar46 == 0x6a)))) ||
                                 ((iVar76 < iVar56 && ((iVar53 == 0x66 || (iVar53 == 0x6a)))))) {
                                iVar56 = (int)(lVar64 * 2) - iVar69;
                              }
                              if (((iVar58 < iVar13) && ((iVar84 == 0x66 || (iVar84 == 0x6a)))) ||
                                 ((iVar52 = iVar58, iVar87 < iVar58 &&
                                  ((iVar59 == 0x6a || (iVar59 == 0x66)))))) {
                                iVar52 = iVar57 - iVar23;
                              }
                              if (((iVar20 < iVar73) && ((LVar17 == Neumann || (LVar17 == inflow))))
                                 || ((iVar22 = iVar20, iVar45 < iVar20 &&
                                     ((LVar16 == inflow || (LVar16 == Neumann)))))) {
                                iVar22 = iVar11 - iVar55;
                              }
                              dVar121 = dVar121 + (double)(iVar21 + 2) * (double)(iVar44 + 2) *
                                                  (double)(iVar18 + 2) *
                                                  *(double *)
                                                   (((long)iVar52 -
                                                    (long)local_718.
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_) * CONCAT44(local_728._12_4_,
                                                                     local_728._8_4_) * 8 +
                                                  CONCAT44(local_728._4_4_,local_728._0_4_) +
                                                  ((long)iVar56 -
                                                  (long)(int)local_718.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) * 8 + ((long)iVar22 - (long)local_700) *
                                                          (long)local_718.
                                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 8);
                              iVar69 = iVar69 + 1;
                            } while (iVar69 != 2);
                            iVar23 = iVar23 + 1;
                          } while (iVar23 != 2);
                          iVar55 = iVar55 + 1;
                        } while (iVar55 != 2);
                        dVar122 = dVar121 * 0.015625;
                      }
                      *(double *)
                       (local_518._0_8_ +
                       (lVar64 - (int)local_518._32_4_) * 8 +
                       ((long)iVar19 - (long)(int)local_518._40_4_) * local_518._16_8_ * 8 +
                       (local_de0 - (int)local_518._36_4_) * local_518._8_8_ * 8) = dVar122;
                      lVar64 = lVar64 + 1;
                      iVar42 = iVar42 + 2;
                    } while (local_838.jstride._4_4_ + 1 != (int)lVar64);
                  }
                  local_de0 = local_de0 + 1;
                } while ((int)local_838.kstride + 1 != (int)local_de0);
              }
              bVar109 = iVar19 != local_838.kstride._4_4_;
              iVar19 = iVar19 + 1;
            } while (bVar109);
          }
        }
        else if ((int)local_838.jstride <= local_838.kstride._4_4_) {
          iVar19 = (int)local_838.jstride;
          do {
            if (local_838.p._4_4_ <= (int)local_838.kstride) {
              lVar24 = (long)iVar19 * 4;
              local_de0 = (long)local_838.p._4_4_;
              do {
                if ((int)local_838.p <= local_838.jstride._4_4_) {
                  lVar64 = (long)(int)local_838.p;
                  iVar42 = (int)local_838.p * 4;
                  do {
                    dVar121 = 0.0;
                    if (*(int *)((long)local_878.p +
                                (lVar64 * 4 - (long)local_878.begin.x) * 4 +
                                (local_de0 * 4 - (long)local_878.begin.y) * local_878.jstride * 4 +
                                (lVar24 - local_878.begin.z) * local_878.kstride * 4) == 0) {
                      iVar55 = -3;
                      do {
                        iVar18 = -iVar55;
                        if (iVar55 < 1) {
                          iVar18 = iVar55;
                        }
                        iVar11 = (int)lVar24;
                        iVar20 = iVar55 + iVar11;
                        iVar23 = -3;
                        do {
                          iVar44 = -iVar23;
                          if (iVar23 < 1) {
                            iVar44 = iVar23;
                          }
                          iVar57 = (int)(local_de0 * 4);
                          iVar58 = iVar23 + iVar57;
                          iVar69 = -3;
                          do {
                            iVar21 = -iVar69;
                            if (iVar69 < 1) {
                              iVar21 = iVar69;
                            }
                            iVar56 = iVar42 + iVar69;
                            if (((iVar56 < iVar12) && ((iVar46 == 0x66 || (iVar46 == 0x6a)))) ||
                               ((iVar76 < iVar56 && ((iVar53 == 0x66 || (iVar53 == 0x6a)))))) {
                              iVar56 = (int)(lVar64 * 4) - iVar69;
                            }
                            if (((iVar58 < iVar13) && ((iVar84 == 0x66 || (iVar84 == 0x6a)))) ||
                               ((iVar52 = iVar58, iVar87 < iVar58 &&
                                ((iVar59 == 0x6a || (iVar59 == 0x66)))))) {
                              iVar52 = iVar57 - iVar23;
                            }
                            if (((iVar20 < iVar73) && ((LVar17 == Neumann || (LVar17 == inflow))))
                               || ((iVar22 = iVar20, iVar45 < iVar20 &&
                                   ((LVar16 == inflow || (LVar16 == Neumann)))))) {
                              iVar22 = iVar11 - iVar55;
                            }
                            dVar121 = dVar121 + (double)(iVar21 + 4) * (double)(iVar44 + 4) *
                                                (double)(iVar18 + 4) *
                                                *(double *)
                                                 (((long)iVar52 -
                                                  (long)local_718.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_) * CONCAT44(local_728._12_4_,
                                                                     local_728._8_4_) * 8 +
                                                  CONCAT44(local_728._4_4_,local_728._0_4_) +
                                                  ((long)iVar56 -
                                                  (long)(int)local_718.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) * 8 + ((long)iVar22 - (long)local_700) *
                                                          (long)local_718.
                                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 8);
                            iVar69 = iVar69 + 1;
                          } while (iVar69 != 4);
                          iVar23 = iVar23 + 1;
                        } while (iVar23 != 4);
                        iVar55 = iVar55 + 1;
                      } while (iVar55 != 4);
                      dVar121 = dVar121 * 0.000244140625;
                    }
                    *(double *)
                     (local_518._0_8_ +
                     (lVar64 - (int)local_518._32_4_) * 8 +
                     ((long)iVar19 - (long)(int)local_518._40_4_) * local_518._16_8_ * 8 +
                     (local_de0 - (int)local_518._36_4_) * local_518._8_8_ * 8) = dVar121;
                    lVar64 = lVar64 + 1;
                    iVar42 = iVar42 + 4;
                  } while (local_838.jstride._4_4_ + 1 != (int)lVar64);
                }
                local_de0 = local_de0 + 1;
              } while ((int)local_838.kstride + 1 != (int)local_de0);
            }
            bVar109 = iVar19 != local_838.kstride._4_4_;
            iVar19 = iVar19 + 1;
          } while (bVar109);
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_768,
                   (FabArray<amrex::FArrayBox> *)
                   puVar5[iVar31]._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                   (MFIter *)local_338);
        if ((int)local_838.jstride <= local_838.kstride._4_4_) {
          iVar19 = (int)local_838.jstride;
          do {
            if (local_838.p._4_4_ <= (int)local_838.kstride) {
              lVar24 = (long)iVar19 * 2;
              iVar42 = (int)lVar24;
              local_c28 = (long)local_838.p._4_4_;
              do {
                if ((int)local_838.p <= local_838.jstride._4_4_) {
                  lVar38 = local_c28 * 2;
                  lVar60 = (long)local_718.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                  lVar80 = CONCAT44(local_728._4_4_,local_728._0_4_);
                  lVar104 = CONCAT44(local_728._12_4_,local_728._8_4_);
                  lVar64 = lVar80 + (lVar38 - lVar60) * lVar104 * 8;
                  lVar88 = (long)local_768.begin.y;
                  lVar79 = local_c28 * 2 + -1;
                  lVar65 = local_c28 * 2 + 1;
                  lVar85 = (lVar38 - lVar88) * local_768.jstride;
                  lVar95 = (((int)lVar38 - local_768.begin.y) + -2) * local_768.jstride;
                  lVar102 = (lVar79 - lVar88) * local_768.jstride;
                  lVar92 = (lVar65 - lVar88) * local_768.jstride;
                  lVar79 = lVar80 + (lVar79 - lVar60) * lVar104 * 8;
                  lVar80 = lVar80 + (lVar65 - lVar60) * lVar104 * 8;
                  lVar96 = (iVar42 - local_768.begin.z) * local_768.kstride;
                  lVar61 = ((iVar42 + -2) - local_768.begin.z) * local_768.kstride;
                  lVar62 = ((iVar42 + -1) - local_768.begin.z) * local_768.kstride;
                  lVar63 = ((iVar42 + 1) - local_768.begin.z) * local_768.kstride;
                  lVar47 = (long)(iVar42 - local_700) *
                           (long)local_718.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar74 = (long)((iVar42 + -1) - local_700) *
                           (long)local_718.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar89 = (long)((iVar42 + 1) - local_700) *
                           (long)local_718.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (long)local_768.begin.x;
                  lVar26 = (long)(int)local_718.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  lVar65 = lVar64 + lVar47 * 8;
                  lVar104 = lVar79 + lVar47 * 8;
                  lVar60 = lVar80 + lVar47 * 8;
                  lVar88 = (long)(int)local_838.p;
                  do {
                    uVar15 = lVar88 * 2;
                    puVar117 = (undefined *)0x0;
                    if (*(int *)((long)local_878.p +
                                (uVar15 - (long)local_878.begin.x) * 4 +
                                (lVar38 - local_878.begin.y) * local_878.jstride * 4 +
                                (lVar24 - local_878.begin.z) * local_878.kstride * 4) == 0) {
                      lVar93 = uVar15 - lVar26;
                      lVar75 = lVar64 + lVar93 * 8;
                      lVar48 = (long)(((int)uVar15 - local_768.begin.x) + -2);
                      lVar78 = uVar15 - 1;
                      lVar49 = lVar78 - lVar25;
                      dVar121 = local_768.p[lVar85 + lVar49 + lVar96 + local_768.nstride];
                      if (((local_768.p[lVar85 + lVar48 + lVar96 + local_768.nstride] != 0.0) ||
                          (dVar121 != 0.0)) || (NAN(dVar121))) {
                        dVar121 = (*(double *)(lVar65 + (lVar78 - lVar26) * 8) * ABS(dVar121)) /
                                  (ABS(local_768.p[lVar85 + lVar48 + lVar96 + local_768.nstride]) +
                                  ABS(dVar121));
                      }
                      else {
                        dVar121 = *(double *)(lVar65 + (lVar78 - lVar26) * 8) * 0.5;
                      }
                      lVar51 = uVar15 - lVar25;
                      uVar70 = uVar15 | 1;
                      dVar122 = local_768.p[lVar85 + lVar51 + lVar96 + local_768.nstride];
                      dVar123 = (local_768.p + lVar85 + lVar51 + lVar96 + local_768.nstride)[1];
                      if (((dVar122 != 0.0) || (NAN(dVar122))) ||
                         ((dVar123 != 0.0 || (NAN(dVar123))))) {
                        dVar122 = (*(double *)(lVar65 + (uVar70 - lVar26) * 8) * ABS(dVar122)) /
                                  (ABS(dVar123) + ABS(dVar122));
                      }
                      else {
                        dVar122 = *(double *)(lVar65 + (uVar70 - lVar26) * 8) * 0.5;
                      }
                      dVar123 = local_768.p[lVar95 + lVar51 + lVar96 + local_768.nstride * 2];
                      dVar124 = local_768.p[lVar102 + lVar51 + lVar96 + local_768.nstride * 2];
                      if (((dVar123 != 0.0) || (NAN(dVar123))) ||
                         ((dVar124 != 0.0 || (NAN(dVar124))))) {
                        dVar123 = (*(double *)(lVar104 + lVar93 * 8) * ABS(dVar124)) /
                                  (ABS(dVar123) + ABS(dVar124));
                      }
                      else {
                        dVar123 = *(double *)(lVar104 + lVar93 * 8) * 0.5;
                      }
                      dVar124 = local_768.p[lVar85 + lVar51 + lVar96 + local_768.nstride * 2];
                      dVar125 = local_768.p[lVar92 + lVar51 + lVar96 + local_768.nstride * 2];
                      if ((((dVar124 != 0.0) || (NAN(dVar124))) || (dVar125 != 0.0)) ||
                         (NAN(dVar125))) {
                        dVar124 = (*(double *)(lVar60 + lVar93 * 8) * ABS(dVar124)) /
                                  (ABS(dVar124) + ABS(dVar125));
                      }
                      else {
                        dVar124 = *(double *)(lVar60 + lVar93 * 8) * 0.5;
                      }
                      dVar125 = local_768.p[lVar85 + lVar51 + lVar61 + local_768.nstride * 3];
                      dVar126 = local_768.p[lVar85 + lVar51 + lVar62 + local_768.nstride * 3];
                      if (((dVar125 != 0.0) || (NAN(dVar125))) ||
                         ((dVar126 != 0.0 || (NAN(dVar126))))) {
                        dVar125 = (*(double *)(lVar75 + lVar74 * 8) * ABS(dVar126)) /
                                  (ABS(dVar125) + ABS(dVar126));
                      }
                      else {
                        dVar125 = *(double *)(lVar75 + lVar74 * 8) * 0.5;
                      }
                      lVar50 = (uVar15 - lVar25) + 1;
                      dVar126 = local_768.p[lVar85 + lVar51 + lVar96 + local_768.nstride * 3];
                      dVar110 = local_768.p[lVar85 + lVar51 + lVar63 + local_768.nstride * 3];
                      if (((dVar126 != 0.0) || (NAN(dVar126))) ||
                         ((dVar110 != 0.0 || (NAN(dVar110))))) {
                        dVar126 = (*(double *)(lVar75 + lVar89 * 8) * ABS(dVar126)) /
                                  (ABS(dVar126) + ABS(dVar110));
                      }
                      else {
                        dVar126 = *(double *)(lVar75 + lVar89 * 8) * 0.5;
                      }
                      dVar161 = ABS(local_768.p[lVar95 + lVar48 + lVar96 + local_768.nstride * 4]);
                      dVar127 = ABS(local_768.p[lVar102 + lVar48 + lVar96 + local_768.nstride * 4]);
                      dVar185 = ABS(local_768.p[lVar95 + lVar49 + lVar96 + local_768.nstride * 4]);
                      dVar169 = ABS(local_768.p[lVar102 + lVar49 + lVar96 + local_768.nstride * 4]);
                      dVar197 = ABS(local_768.p[lVar95 + lVar49 + lVar96 + local_768.nstride * 2]) /
                                (dVar161 + dVar185 + 1e-100);
                      dVar206 = ABS(local_768.p[lVar102 + lVar49 + lVar96 + local_768.nstride * 2])
                                / (dVar127 + dVar169 + 1e-100);
                      dVar136 = ABS(local_768.p[lVar102 + lVar48 + lVar96 + local_768.nstride]) /
                                (dVar161 + dVar127 + 1e-100) + 1.0;
                      dVar155 = ABS(local_768.p[lVar102 + lVar49 + lVar96 + local_768.nstride]) /
                                (dVar185 + dVar169 + 1e-100) + 1.0;
                      dVar169 = (dVar155 + dVar206) * dVar169;
                      lVar78 = lVar78 - lVar26;
                      lVar94 = lVar79 + lVar78 * 8;
                      dVar162 = ABS(local_768.p[lVar95 + lVar51 + lVar96 + local_768.nstride * 4]);
                      dVar110 = ABS(local_768.p[lVar102 + lVar51 + lVar96 + local_768.nstride * 4]);
                      dVar198 = ABS(local_768.p[lVar95 + lVar50 + lVar96 + local_768.nstride * 4]);
                      dVar170 = ABS(local_768.p[lVar102 + lVar50 + lVar96 + local_768.nstride * 4]);
                      dVar186 = ABS(local_768.p[lVar95 + lVar50 + lVar96 + local_768.nstride * 2]) /
                                (dVar162 + dVar198 + 1e-100);
                      dVar207 = ABS(local_768.p[lVar102 + lVar50 + lVar96 + local_768.nstride * 2])
                                / (dVar110 + dVar170 + 1e-100);
                      dVar137 = ABS(local_768.p[lVar102 + lVar51 + lVar96 + local_768.nstride]) /
                                (dVar162 + dVar110 + 1e-100) + 1.0;
                      dVar156 = ABS(local_768.p[lVar102 + lVar50 + lVar96 + local_768.nstride]) /
                                (dVar198 + dVar170 + 1e-100) + 1.0;
                      dVar110 = (dVar137 + dVar207) * dVar110;
                      lVar71 = uVar70 - lVar26;
                      lVar97 = lVar79 + lVar71 * 8;
                      dVar171 = ABS(local_768.p[lVar85 + lVar48 + lVar96 + local_768.nstride * 4]);
                      dVar163 = ABS(local_768.p[lVar92 + lVar48 + lVar96 + local_768.nstride * 4]);
                      dVar199 = ABS(local_768.p[lVar85 + lVar49 + lVar96 + local_768.nstride * 4]);
                      dVar187 = ABS(local_768.p[lVar92 + lVar49 + lVar96 + local_768.nstride * 4]);
                      dVar128 = ABS(local_768.p[lVar85 + lVar49 + lVar96 + local_768.nstride * 2]) /
                                (dVar171 + dVar199 + 1e-100);
                      dVar208 = ABS(local_768.p[lVar92 + lVar49 + lVar96 + local_768.nstride * 2]) /
                                (dVar163 + dVar187 + 1e-100);
                      dVar138 = ABS(local_768.p[lVar92 + lVar48 + lVar96 + local_768.nstride]) /
                                (dVar171 + dVar163 + 1e-100) + 1.0;
                      dVar157 = ABS(local_768.p[lVar92 + lVar49 + lVar96 + local_768.nstride]) /
                                (dVar199 + dVar187 + 1e-100) + 1.0;
                      dVar199 = (dVar128 + dVar157) * dVar199;
                      lVar98 = lVar80 + lVar78 * 8;
                      dVar111 = ABS(local_768.p[lVar92 + lVar51 + lVar96 + local_768.nstride * 4]);
                      dVar172 = ABS(local_768.p[lVar85 + lVar51 + lVar96 + local_768.nstride * 4]);
                      dVar188 = ABS(local_768.p[lVar92 + lVar50 + lVar96 + local_768.nstride * 4]);
                      dVar200 = ABS(local_768.p[lVar85 + lVar50 + lVar96 + local_768.nstride * 4]);
                      dVar164 = ABS(local_768.p[lVar85 + lVar50 + lVar96 + local_768.nstride * 2]) /
                                (dVar172 + dVar200 + 1e-100);
                      dVar209 = ABS(local_768.p[lVar92 + lVar50 + lVar96 + local_768.nstride * 2]) /
                                (dVar111 + dVar188 + 1e-100);
                      dVar139 = ABS(local_768.p[lVar92 + lVar51 + lVar96 + local_768.nstride]) /
                                (dVar111 + dVar172 + 1e-100) + 1.0;
                      dVar172 = (dVar139 + dVar164) * dVar172;
                      dVar158 = ABS(local_768.p[lVar92 + lVar50 + lVar96 + local_768.nstride]) /
                                (dVar188 + dVar200 + 1e-100) + 1.0;
                      lVar27 = lVar80 + lVar71 * 8;
                      dVar129 = ABS(local_768.p[lVar85 + lVar48 + lVar61 + local_768.nstride * 5]);
                      dVar140 = ABS(local_768.p[lVar85 + lVar48 + lVar62 + local_768.nstride * 5]);
                      dVar252 = ABS(local_768.p[lVar85 + lVar49 + lVar61 + local_768.nstride * 5]);
                      dVar242 = ABS(local_768.p[lVar85 + lVar49 + lVar62 + local_768.nstride * 5]);
                      dVar260 = ABS(local_768.p[lVar85 + lVar49 + lVar61 + local_768.nstride * 3]) /
                                (dVar129 + dVar252 + 1e-100);
                      dVar265 = ABS(local_768.p[lVar85 + lVar49 + lVar62 + local_768.nstride * 3]) /
                                (dVar140 + dVar242 + 1e-100);
                      dVar159 = ABS(local_768.p[lVar85 + lVar48 + lVar62 + local_768.nstride]) /
                                (dVar129 + dVar140 + 1e-100) + 1.0;
                      dVar112 = ABS(local_768.p[lVar85 + lVar48 + lVar63 + local_768.nstride * 5]);
                      dVar226 = ABS(local_768.p[lVar85 + lVar48 + lVar96 + local_768.nstride * 5]);
                      dVar130 = ABS(local_768.p[lVar85 + lVar49 + lVar63 + local_768.nstride * 5]);
                      dVar113 = ABS(local_768.p[lVar85 + lVar49 + lVar96 + local_768.nstride * 5]);
                      dVar131 = ABS(local_768.p[lVar85 + lVar49 + lVar96 + local_768.nstride * 3]) /
                                (dVar226 + dVar113 + 1e-100);
                      dVar165 = ABS(local_768.p[lVar85 + lVar48 + lVar63 + local_768.nstride]) /
                                (dVar112 + dVar226 + 1e-100) + 1.0;
                      lVar78 = lVar64 + lVar78 * 8;
                      dVar141 = ABS(local_768.p[lVar85 + lVar49 + lVar63 + local_768.nstride]) /
                                (dVar130 + dVar113 + 1e-100) + 1.0;
                      dVar113 = (dVar131 + dVar141) * dVar113;
                      dVar219 = ABS(local_768.p[lVar85 + lVar49 + lVar62 + local_768.nstride]) /
                                (dVar252 + dVar242 + 1e-100) + 1.0;
                      dVar242 = (dVar219 + dVar265) * dVar242;
                      dVar173 = ABS(local_768.p[lVar85 + lVar51 + lVar61 + local_768.nstride * 5]);
                      dVar114 = ABS(local_768.p[lVar85 + lVar51 + lVar62 + local_768.nstride * 5]);
                      dVar220 = ABS(local_768.p[lVar85 + lVar50 + lVar61 + local_768.nstride * 5]);
                      dVar142 = ABS(local_768.p[lVar85 + lVar50 + lVar62 + local_768.nstride * 5]);
                      uStack_7d0 = 0;
                      dVar266 = ABS(local_768.p[lVar85 + lVar50 + lVar61 + local_768.nstride * 3]) /
                                (dVar173 + dVar220 + 1e-100);
                      dVar143 = ABS(local_768.p[lVar85 + lVar50 + lVar62 + local_768.nstride * 3]) /
                                (dVar114 + dVar142 + 1e-100);
                      dVar243 = ABS(local_768.p[lVar85 + lVar51 + lVar62 + local_768.nstride]) /
                                (dVar173 + dVar114 + 1e-100) + 1.0;
                      dVar253 = ABS(local_768.p[lVar85 + lVar50 + lVar62 + local_768.nstride]) /
                                (dVar220 + dVar142 + 1e-100) + 1.0;
                      lVar71 = lVar64 + lVar71 * 8;
                      dVar114 = (dVar243 + dVar143) * dVar114;
                      lVar40 = lVar79 + lVar93 * 8;
                      lVar93 = lVar80 + lVar93 * 8;
                      dVar174 = ABS(local_768.p[lVar85 + lVar49 + lVar63 + local_768.nstride * 3]) /
                                (dVar112 + dVar130 + 1e-100);
                      dVar166 = ABS(local_768.p[lVar85 + lVar51 + lVar63 + local_768.nstride * 5]);
                      dVar115 = ABS(local_768.p[lVar85 + lVar51 + lVar96 + local_768.nstride * 5]);
                      dVar189 = ABS(local_768.p[lVar85 + lVar50 + lVar63 + local_768.nstride * 5]);
                      dVar210 = ABS(local_768.p[lVar85 + lVar50 + lVar96 + local_768.nstride * 5]);
                      dVar227 = ABS(local_768.p[lVar85 + lVar50 + lVar96 + local_768.nstride * 3]) /
                                (dVar115 + dVar210 + 1e-100);
                      dVar244 = ABS(local_768.p[lVar85 + lVar50 + lVar63 + local_768.nstride * 3]) /
                                (dVar166 + dVar189 + 1e-100);
                      dVar144 = ABS(local_768.p[lVar85 + lVar51 + lVar63 + local_768.nstride]) /
                                (dVar166 + dVar115 + 1e-100) + 1.0;
                      dVar115 = (dVar144 + dVar227) * dVar115;
                      dVar175 = ABS(local_768.p[lVar85 + lVar50 + lVar63 + local_768.nstride]) /
                                (dVar189 + dVar210 + 1e-100) + 1.0;
                      dVar228 = ABS(local_768.p[lVar95 + lVar51 + lVar62 + local_768.nstride * 6]);
                      local_7d8 = local_768.p + lVar92 + lVar51 + lVar62;
                      dVar145 = ABS(local_7d8[local_768.nstride * 6]);
                      dVar176 = ABS(local_768.p[lVar95 + lVar51 + lVar61 + local_768.nstride * 6]);
                      dVar184 = ABS(local_768.p[lVar85 + lVar51 + lVar61 + local_768.nstride * 6]);
                      dVar116 = ABS(local_768.p[lVar95 + lVar51 + lVar62 + local_768.nstride * 2]) /
                                (dVar176 + dVar228 + 1e-100) + 1.0;
                      dVar190 = ABS(local_768.p[lVar102 + lVar51 + lVar62 + local_768.nstride * 6]);
                      dVar196 = ABS(local_768.p[lVar85 + lVar51 + lVar62 + local_768.nstride * 6]);
                      auVar235._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar62 + local_768.nstride * 3]);
                      auVar235._8_8_ = ABS(local_7d8[local_768.nstride * 3]);
                      auVar247._0_8_ = dVar190 + dVar228 + 1e-100;
                      auVar247._8_8_ = dVar145 + dVar196 + 1e-100;
                      auVar167 = divpd(auVar235,auVar247);
                      auVar230._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar62 + local_768.nstride * 2]);
                      auVar230._8_8_ =
                           ABS(local_768.p[lVar85 + lVar51 + lVar62 + local_768.nstride * 2]);
                      dVar245 = ABS(local_768.p[lVar102 + lVar51 + lVar61 + local_768.nstride * 6]);
                      dVar251 = ABS(local_768.p[lVar92 + lVar51 + lVar61 + local_768.nstride * 6]);
                      auVar261._0_8_ = dVar245 + dVar190 + 1e-100;
                      auVar261._8_8_ = dVar196 + dVar184 + 1e-100;
                      auVar231 = divpd(auVar230,auVar261);
                      auVar254._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar61 + local_768.nstride * 3]);
                      auVar254._8_8_ =
                           ABS(local_768.p[lVar92 + lVar51 + lVar61 + local_768.nstride * 3]);
                      auVar262._0_8_ = dVar176 + dVar245 + 1e-100;
                      auVar262._8_8_ = dVar184 + dVar251 + 1e-100;
                      auVar255 = divpd(auVar254,auVar262);
                      dVar229 = auVar231._0_8_ + 1.0;
                      dVar241 = auVar231._8_8_ + 1.0;
                      dVar132 = ABS(local_7d8[local_768.nstride * 2]) / (dVar251 + dVar145 + 1e-100)
                                + 1.0;
                      dVar190 = (auVar167._0_8_ + dVar229) * dVar190;
                      dVar196 = (auVar167._8_8_ + dVar241) * dVar196;
                      auVar231._0_8_ = *(double *)(lVar40 + lVar74 * 8) * dVar190;
                      auVar231._8_8_ = *(double *)(lVar93 + lVar74 * 8) * dVar196;
                      auVar237._0_8_ =
                           dVar190 + (dVar116 + auVar167._0_8_) * dVar228 +
                                     (dVar229 + auVar255._0_8_) * dVar245 +
                                     (dVar116 + auVar255._0_8_) * dVar176 + 1e-100;
                      auVar237._8_8_ =
                           (auVar167._8_8_ + dVar132) * dVar145 +
                           dVar196 + (dVar132 + auVar255._8_8_) * dVar251 +
                                     (dVar241 + auVar255._8_8_) * dVar184 + 1e-100;
                      auVar231 = divpd(auVar231,auVar237);
                      dVar116 = ABS(local_768.p[lVar95 + lVar51 + lVar96 + local_768.nstride * 6]);
                      dVar184 = ABS(local_768.p[lVar92 + lVar51 + lVar96 + local_768.nstride * 6]);
                      dVar176 = ABS(local_768.p[lVar95 + lVar51 + lVar63 + local_768.nstride * 6]);
                      dVar190 = ABS(local_768.p[lVar85 + lVar51 + lVar63 + local_768.nstride * 6]);
                      dVar251 = ABS(local_768.p[lVar95 + lVar51 + lVar63 + local_768.nstride * 2]) /
                                (dVar176 + dVar116 + 1e-100) + 1.0;
                      dVar132 = ABS(local_768.p[lVar102 + lVar51 + lVar96 + local_768.nstride * 6]);
                      dVar145 = ABS(local_768.p[lVar85 + lVar51 + lVar96 + local_768.nstride * 6]);
                      auVar232._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar96 + local_768.nstride * 3]);
                      auVar232._8_8_ =
                           ABS(local_768.p[lVar92 + lVar51 + lVar96 + local_768.nstride * 3]);
                      auVar257._0_8_ = dVar132 + dVar116 + 1e-100;
                      auVar257._8_8_ = dVar184 + dVar145 + 1e-100;
                      auVar233 = divpd(auVar232,auVar257);
                      auVar194._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar63 + local_768.nstride * 2]);
                      auVar194._8_8_ =
                           ABS(local_768.p[lVar85 + lVar51 + lVar63 + local_768.nstride * 2]);
                      dVar229 = ABS(local_768.p[lVar102 + lVar51 + lVar63 + local_768.nstride * 6]);
                      dVar241 = ABS(local_768.p[lVar92 + lVar51 + lVar63 + local_768.nstride * 6]);
                      auVar160._0_8_ = dVar229 + dVar132 + 1e-100;
                      auVar160._8_8_ = dVar145 + dVar190 + 1e-100;
                      auVar255 = divpd(auVar194,auVar160);
                      auVar181._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar63 + local_768.nstride * 3]);
                      auVar181._8_8_ =
                           ABS(local_768.p[lVar92 + lVar51 + lVar63 + local_768.nstride * 3]);
                      auVar248._0_8_ = dVar176 + dVar229 + 1e-100;
                      auVar248._8_8_ = dVar241 + dVar190 + 1e-100;
                      auVar167 = divpd(auVar181,auVar248);
                      dVar196 = auVar255._0_8_ + 1.0;
                      dVar228 = auVar255._8_8_ + 1.0;
                      dVar132 = (auVar233._0_8_ + dVar196) * dVar132;
                      dVar145 = (auVar233._8_8_ + dVar228) * dVar145;
                      dVar245 = ABS(local_768.p[lVar92 + lVar51 + lVar63 + local_768.nstride * 2]) /
                                (dVar241 + dVar184 + 1e-100) + 1.0;
                      auVar255._0_8_ =
                           dVar132 + (dVar251 + auVar233._0_8_) * dVar116 +
                           (dVar251 + auVar167._0_8_) * dVar176 +
                           (dVar196 + auVar167._0_8_) * dVar229 + 1e-100;
                      auVar255._8_8_ =
                           (auVar233._8_8_ + dVar245) * dVar184 + dVar145 +
                           (dVar228 + auVar167._8_8_) * dVar190 +
                           (dVar245 + auVar167._8_8_) * dVar241 + 1e-100;
                      auVar222._8_8_ = *(double *)(lVar93 + lVar89 * 8) * dVar145;
                      auVar222._0_8_ = *(double *)(lVar40 + lVar89 * 8) * dVar132;
                      auVar160 = divpd(auVar222,auVar255);
                      dVar228 = ABS(local_768.p[lVar85 + lVar51 + lVar96 + local_768.nstride * 7]);
                      dVar211 = ABS(local_768.p[lVar85 + lVar51 + lVar63 + local_768.nstride * 7]);
                      auVar233._8_4_ = SUB84(dVar228,0);
                      auVar233._0_8_ = dVar228;
                      auVar233._12_4_ = (int)((ulong)dVar228 >> 0x20);
                      dVar116 = dVar228 + ABS(local_768.p
                                              [lVar85 + lVar50 + lVar96 + local_768.nstride * 7]);
                      dVar145 = auVar233._8_8_ +
                                ABS(local_768.p[lVar92 + lVar51 + lVar96 + local_768.nstride * 7]);
                      auVar234._0_8_ =
                           ABS(local_768.p[lVar85 + lVar50 + lVar96 + local_768.nstride * 6]);
                      auVar234._8_8_ =
                           ABS(local_768.p[lVar92 + lVar51 + lVar96 + local_768.nstride * 5]);
                      auVar135._0_8_ = dVar116 + 1e-100;
                      auVar135._8_8_ = dVar145 + 1e-100;
                      auVar235 = divpd(auVar234,auVar135);
                      dVar251 = ABS(local_768.p[lVar85 + lVar49 + lVar96 + local_768.nstride * 7]);
                      dVar229 = ABS(local_768.p[lVar85 + lVar49 + lVar63 + local_768.nstride * 7]);
                      auVar203._8_4_ = SUB84(dVar251,0);
                      auVar203._0_8_ = dVar251;
                      auVar203._12_4_ = (int)((ulong)dVar251 >> 0x20);
                      dVar176 = dVar251 + ABS(local_768.p
                                              [lVar85 + lVar48 + lVar96 + local_768.nstride * 7]);
                      dVar190 = auVar203._8_8_ +
                                ABS(local_768.p[lVar92 + lVar49 + lVar96 + local_768.nstride * 7]);
                      auVar221._0_8_ =
                           ABS(local_768.p[lVar85 + lVar49 + lVar96 + local_768.nstride * 6]);
                      auVar221._8_8_ =
                           ABS(local_768.p[lVar92 + lVar49 + lVar96 + local_768.nstride * 5]);
                      auVar205._0_8_ = dVar176 + 1e-100;
                      auVar205._8_8_ = dVar190 + 1e-100;
                      auVar222 = divpd(auVar221,auVar205);
                      dVar246 = ABS(local_768.p[lVar102 + lVar51 + lVar96 + local_768.nstride * 7]);
                      dVar212 = ABS(local_768.p[lVar102 + lVar51 + lVar63 + local_768.nstride * 7]);
                      dVar241 = ABS(local_768.p[lVar102 + lVar50 + lVar96 + local_768.nstride * 7])
                                + dVar246;
                      dVar245 = dVar246 + ABS(local_768.p
                                              [lVar95 + lVar51 + lVar96 + local_768.nstride * 7]);
                      auVar202._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar63 + local_768.nstride * 4]);
                      auVar202._8_8_ =
                           ABS(local_768.p[lVar102 + lVar50 + lVar96 + local_768.nstride * 3]);
                      auVar178._0_8_ = dVar246 + dVar212 + 1e-100;
                      auVar178._8_8_ =
                           ABS(local_768.p[lVar95 + lVar51 + lVar96 + local_768.nstride * 7]) +
                           ABS(local_768.p[lVar95 + lVar50 + lVar96 + local_768.nstride * 7]) +
                           dVar246 + ABS(local_768.p
                                         [lVar102 + lVar50 + lVar96 + local_768.nstride * 7]) +
                           1e-100;
                      auVar203 = divpd(auVar202,auVar178);
                      auVar236._0_8_ =
                           ABS(local_768.p[lVar102 + lVar50 + lVar96 + local_768.nstride * 6]);
                      auVar236._8_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar96 + local_768.nstride * 5]);
                      auVar224._0_8_ = dVar241 + 1e-100;
                      auVar224._8_8_ = dVar245 + 1e-100;
                      auVar237 = divpd(auVar236,auVar224);
                      dVar184 = ABS(local_768.p[lVar102 + lVar49 + lVar96 + local_768.nstride * 7]);
                      dVar267 = ABS(local_768.p[lVar102 + lVar48 + lVar96 + local_768.nstride * 7])
                                + dVar184;
                      dVar268 = dVar184 + ABS(local_768.p
                                              [lVar95 + lVar49 + lVar96 + local_768.nstride * 7]);
                      dVar177 = ABS(local_768.p[lVar102 + lVar49 + lVar63 + local_768.nstride * 7]);
                      auVar152._8_4_ = SUB84(dVar184,0);
                      auVar152._0_8_ = dVar184;
                      auVar152._12_4_ = (int)((ulong)dVar184 >> 0x20);
                      auVar256._0_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar63 + local_768.nstride * 4]);
                      auVar256._8_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar96 + local_768.nstride * 3]);
                      auVar179._0_8_ = dVar177 + dVar184 + 1e-100;
                      auVar179._8_8_ =
                           ABS(local_768.p[lVar95 + lVar49 + lVar96 + local_768.nstride * 7]) +
                           ABS(local_768.p[lVar95 + lVar48 + lVar96 + local_768.nstride * 7]) +
                           ABS(local_768.p[lVar102 + lVar48 + lVar96 + local_768.nstride * 7]) +
                           auVar152._8_8_ + 1e-100;
                      auVar257 = divpd(auVar256,auVar179);
                      auVar223._0_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar96 + local_768.nstride * 6]);
                      auVar223._8_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar96 + local_768.nstride * 5]);
                      auVar167._8_8_ = dVar268 + 1e-100;
                      auVar167._0_8_ = dVar267 + 1e-100;
                      auVar224 = divpd(auVar223,auVar167);
                      dVar213 = ABS(local_768.p[lVar85 + lVar51 + lVar61 + local_768.nstride * 7]);
                      dVar132 = ABS(local_7d8[local_768.nstride * 7]);
                      dVar191 = ABS(local_768.p[lVar85 + lVar51 + lVar62 + local_768.nstride * 7]);
                      auVar154._0_8_ =
                           ABS(local_768.p[lVar85 + lVar50 + lVar62 + local_768.nstride * 2]);
                      auVar154._8_8_ = ABS(local_7d8[local_768.nstride]);
                      auVar258._8_4_ = SUB84(dVar213,0);
                      auVar258._0_8_ = dVar213;
                      auVar258._12_4_ = (int)((ulong)dVar213 >> 0x20);
                      auVar147._8_4_ = SUB84(dVar191,0);
                      auVar147._0_8_ = dVar191;
                      auVar147._12_4_ = (int)((ulong)dVar191 >> 0x20);
                      auVar259._0_8_ =
                           dVar213 + ABS(local_768.p
                                         [lVar85 + lVar50 + lVar61 + local_768.nstride * 7]) +
                           dVar191 + ABS(local_768.p
                                         [lVar85 + lVar50 + lVar62 + local_768.nstride * 7]) +
                           1e-100;
                      auVar259._8_8_ =
                           auVar258._8_8_ +
                           ABS(local_768.p[lVar92 + lVar51 + lVar61 + local_768.nstride * 7]) +
                           auVar147._8_8_ + dVar132 + 1e-100;
                      auVar167 = divpd(auVar154,auVar259);
                      auVar204._0_8_ =
                           ABS(local_768.p[lVar85 + lVar51 + lVar62 + local_768.nstride * 4]);
                      auVar204._8_8_ =
                           ABS(local_768.p[lVar92 + lVar50 + lVar62 + local_768.nstride * 3]);
                      dVar196 = dVar191 + ABS(local_768.p
                                              [lVar85 + lVar50 + lVar62 + local_768.nstride * 7]);
                      auVar214._0_8_ = dVar213 + dVar191 + 1e-100;
                      auVar214._8_8_ =
                           dVar132 + dVar196 +
                           ABS(local_768.p[lVar92 + lVar50 + lVar62 + local_768.nstride * 7]) +
                           1e-100;
                      auVar205 = divpd(auVar204,auVar214);
                      auVar180._0_8_ =
                           ABS(local_768.p[lVar85 + lVar50 + lVar62 + local_768.nstride * 6]);
                      auVar180._8_8_ = ABS(local_7d8[local_768.nstride * 5]);
                      auVar148._0_8_ = dVar196 + 1e-100;
                      auVar148._8_8_ = auVar147._8_8_ + dVar132 + 1e-100;
                      auVar181 = divpd(auVar180,auVar148);
                      dVar213 = ABS(local_768.p[lVar85 + lVar49 + lVar61 + local_768.nstride * 7]);
                      dVar201 = ABS(local_768.p[lVar85 + lVar49 + lVar62 + local_768.nstride * 7]);
                      dVar196 = ABS(local_768.p[lVar92 + lVar49 + lVar62 + local_768.nstride * 7]);
                      auVar216._8_4_ = SUB84(dVar213,0);
                      auVar216._0_8_ = dVar213;
                      auVar216._12_4_ = (int)((ulong)dVar213 >> 0x20);
                      auVar264._0_8_ =
                           ABS(local_768.p[lVar92 + lVar49 + lVar62 + local_768.nstride]);
                      auVar264._8_8_ =
                           ABS(local_768.p[lVar85 + lVar49 + lVar62 + local_768.nstride * 2]);
                      auVar240._0_8_ =
                           dVar196 + dVar201 + dVar213 + ABS(local_768.p
                                                             [lVar92 + lVar49 + lVar61 + local_768.
                                                                                         nstride * 7
                                                             ]) + 1e-100;
                      auVar240._8_8_ =
                           dVar201 + ABS(local_768.p
                                         [lVar85 + lVar48 + lVar62 + local_768.nstride * 7]) +
                                     auVar216._8_8_ +
                                     ABS(local_768.p
                                         [lVar85 + lVar48 + lVar61 + local_768.nstride * 7]) +
                           1e-100;
                      auVar233 = divpd(auVar264,auVar240);
                      auVar250._8_4_ = SUB84(dVar201,0);
                      auVar250._0_8_ = dVar201;
                      auVar250._12_4_ = (int)((ulong)dVar201 >> 0x20);
                      dVar132 = dVar201 + ABS(local_768.p
                                              [lVar85 + lVar48 + lVar62 + local_768.nstride * 7]);
                      auVar263._0_8_ =
                           ABS(local_768.p[lVar85 + lVar49 + lVar62 + local_768.nstride * 4]);
                      auVar263._8_8_ =
                           ABS(local_768.p[lVar92 + lVar49 + lVar62 + local_768.nstride * 3]);
                      auVar238._0_8_ = dVar201 + dVar213 + 1e-100;
                      auVar238._8_8_ =
                           ABS(local_768.p[lVar92 + lVar48 + lVar62 + local_768.nstride * 7]) +
                           dVar132 + dVar196 + 1e-100;
                      auVar264 = divpd(auVar263,auVar238);
                      auVar215._0_8_ =
                           ABS(local_768.p[lVar85 + lVar49 + lVar62 + local_768.nstride * 6]);
                      auVar215._8_8_ =
                           ABS(local_768.p[lVar92 + lVar49 + lVar62 + local_768.nstride * 5]);
                      auVar119._0_8_ = dVar132 + 1e-100;
                      auVar119._8_8_ = auVar250._8_8_ + dVar196 + 1e-100;
                      auVar216 = divpd(auVar215,auVar119);
                      dVar192 = ABS(local_768.p[lVar102 + lVar51 + lVar62 + local_768.nstride * 7]);
                      dVar213 = ABS(local_768.p[lVar95 + lVar51 + lVar62 + local_768.nstride * 7]);
                      dVar132 = ABS(local_768.p[lVar102 + lVar51 + lVar61 + local_768.nstride * 7]);
                      dVar196 = ABS(local_768.p[lVar102 + lVar50 + lVar62 + local_768.nstride * 7]);
                      auVar217._8_4_ = SUB84(dVar132,0);
                      auVar217._0_8_ = dVar132;
                      auVar217._12_4_ = (int)((ulong)dVar132 >> 0x20);
                      auVar239._0_8_ =
                           ABS(local_768.p[lVar102 + lVar50 + lVar62 + local_768.nstride * 2]);
                      auVar239._8_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar62 + local_768.nstride]);
                      auVar218._0_8_ =
                           dVar132 + ABS(local_768.p
                                         [lVar102 + lVar50 + lVar61 + local_768.nstride * 7]) +
                           dVar192 + dVar196 + 1e-100;
                      auVar218._8_8_ =
                           auVar217._8_8_ +
                           ABS(local_768.p[lVar95 + lVar51 + lVar61 + local_768.nstride * 7]) +
                           dVar213 + dVar192 + 1e-100;
                      auVar240 = divpd(auVar239,auVar218);
                      auVar134._0_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar62 + local_768.nstride * 4]);
                      auVar134._8_8_ =
                           ABS(local_768.p[lVar102 + lVar50 + lVar62 + local_768.nstride * 3]);
                      auVar225._0_8_ = dVar192 + dVar132 + 1e-100;
                      auVar225._8_8_ =
                           dVar213 + ABS(local_768.p
                                         [lVar95 + lVar50 + lVar62 + local_768.nstride * 7]) +
                           dVar192 + dVar196 + 1e-100;
                      auVar135 = divpd(auVar134,auVar225);
                      auVar249._0_8_ =
                           ABS(local_768.p[lVar102 + lVar50 + lVar62 + local_768.nstride * 6]);
                      auVar249._8_8_ =
                           ABS(local_768.p[lVar102 + lVar51 + lVar62 + local_768.nstride * 5]);
                      auVar182._0_8_ = dVar196 + dVar192 + 1e-100;
                      auVar182._8_8_ = dVar192 + dVar213 + 1e-100;
                      auVar250 = divpd(auVar249,auVar182);
                      dVar193 = ABS(local_768.p[lVar102 + lVar49 + lVar61 + local_768.nstride * 7]);
                      dVar213 = ABS(local_768.p[lVar102 + lVar48 + lVar62 + local_768.nstride * 7]);
                      dVar132 = ABS(local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride * 7]);
                      dVar196 = ABS(local_768.p[lVar95 + lVar49 + lVar62 + local_768.nstride * 7]);
                      auVar120._0_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride]);
                      auVar120._8_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride * 2]);
                      auVar149._8_4_ = SUB84(dVar193,0);
                      auVar149._0_8_ = dVar193;
                      auVar149._12_4_ = (int)((ulong)dVar193 >> 0x20);
                      auVar150._8_4_ = SUB84(dVar132,0);
                      auVar150._0_8_ = dVar132;
                      auVar150._12_4_ = (int)((ulong)dVar132 >> 0x20);
                      auVar168._0_8_ =
                           dVar196 + dVar193 + ABS(local_768.p
                                                   [lVar95 + lVar49 + lVar61 + local_768.nstride * 7
                                                   ]) + dVar132 + 1e-100;
                      auVar168._8_8_ =
                           dVar213 + auVar149._8_8_ +
                                     ABS(local_768.p
                                         [lVar102 + lVar48 + lVar61 + local_768.nstride * 7]) +
                           auVar150._8_8_ + 1e-100;
                      auVar255 = divpd(auVar120,auVar168);
                      auVar151._0_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride * 4]);
                      auVar151._8_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride * 3]);
                      auVar195._0_8_ = dVar193 + dVar132 + 1e-100;
                      auVar195._8_8_ =
                           dVar196 + ABS(local_768.p
                                         [lVar95 + lVar48 + lVar62 + local_768.nstride * 7]) +
                           dVar213 + auVar150._8_8_ + 1e-100;
                      auVar152 = divpd(auVar151,auVar195);
                      auVar153._0_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride * 6]);
                      auVar153._8_8_ =
                           ABS(local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride * 5]);
                      auVar183._0_8_ = dVar213 + dVar132 + 1e-100;
                      auVar183._8_8_ = dVar132 + dVar196 + 1e-100;
                      auVar154 = divpd(auVar153,auVar183);
                      puVar117 = (undefined *)
                                 (((auVar154._8_8_ +
                                    auVar152._8_8_ + auVar255._8_8_ + auVar255._0_8_ + 1.0 +
                                    auVar152._0_8_ + auVar154._0_8_) * dVar132 *
                                   *(double *)(lVar94 + lVar74 * 8) *
                                   local_768.p[lVar102 + lVar49 + lVar62 + local_768.nstride * 8] +
                                  (auVar250._8_8_ +
                                   auVar135._8_8_ + auVar240._8_8_ + 1.0 + auVar240._0_8_ +
                                   auVar135._0_8_ + auVar250._0_8_) * dVar192 *
                                  *(double *)(lVar97 + lVar74 * 8) *
                                  local_768.p[lVar102 + lVar50 + lVar62 + local_768.nstride * 8] +
                                  (auVar216._8_8_ +
                                   auVar264._8_8_ + auVar233._8_8_ + auVar233._0_8_ + 1.0 +
                                   auVar264._0_8_ + auVar216._0_8_) * dVar201 *
                                  *(double *)(lVar98 + lVar74 * 8) *
                                  local_768.p[lVar92 + lVar49 + lVar62 + local_768.nstride * 8] +
                                  (auVar181._8_8_ +
                                   auVar205._8_8_ + auVar167._8_8_ + 1.0 + auVar167._0_8_ +
                                   auVar205._0_8_ + auVar181._0_8_) * dVar191 *
                                  *(double *)(lVar27 + lVar74 * 8) *
                                  local_768.p[lVar92 + lVar50 + lVar62 + local_768.nstride * 8] +
                                  (auVar224._8_8_ +
                                   auVar257._8_8_ +
                                   ABS(local_768.p
                                       [lVar102 + lVar49 + lVar63 + local_768.nstride * 2]) /
                                   (ABS(local_768.p
                                        [lVar102 + lVar48 + lVar63 + local_768.nstride * 7]) +
                                    dVar267 + dVar177 + 1e-100) +
                                   ABS(local_768.p[lVar102 + lVar49 + lVar63 + local_768.nstride]) /
                                   (dVar268 + ABS(local_768.p
                                                  [lVar95 + lVar49 + lVar63 + local_768.nstride * 7]
                                                 ) + dVar177 + 1e-100) + 1.0 + auVar257._0_8_ +
                                  auVar224._0_8_) * dVar184 * *(double *)(lVar94 + lVar89 * 8) *
                                  local_768.p[lVar102 + lVar49 + lVar63 + local_768.nstride * 8] +
                                  (auVar237._8_8_ +
                                   auVar203._8_8_ +
                                   ABS(local_768.p
                                       [lVar102 + lVar50 + lVar63 + local_768.nstride * 2]) /
                                   (dVar212 + dVar241 +
                                    ABS(local_768.p
                                        [lVar102 + lVar50 + lVar63 + local_768.nstride * 7]) +
                                   1e-100) + ABS(local_768.p
                                                 [lVar102 + lVar51 + lVar63 + local_768.nstride]) /
                                             (dVar245 + ABS(local_768.p
                                                            [lVar95 + lVar51 + lVar63 + local_768.
                                                                                        nstride * 7]
                                                           ) + dVar212 + 1e-100) + 1.0 +
                                   auVar203._0_8_ + auVar237._0_8_) * dVar246 *
                                  *(double *)(lVar97 + lVar89 * 8) *
                                  local_768.p[lVar102 + lVar50 + lVar63 + local_768.nstride * 8] +
                                  (auVar222._8_8_ +
                                   ABS(local_768.p[lVar92 + lVar49 + lVar96 + local_768.nstride * 3]
                                      ) / (ABS(local_768.p
                                               [lVar92 + lVar49 + lVar96 + local_768.nstride * 7]) +
                                           ABS(local_768.p
                                               [lVar92 + lVar48 + lVar96 + local_768.nstride * 7]) +
                                           dVar176 + 1e-100) +
                                   ABS(local_768.p[lVar85 + lVar49 + lVar63 + local_768.nstride * 2]
                                      ) / (ABS(local_768.p
                                               [lVar85 + lVar48 + lVar63 + local_768.nstride * 7]) +
                                           dVar176 + dVar229 + 1e-100) +
                                   ABS(local_768.p[lVar92 + lVar49 + lVar63 + local_768.nstride]) /
                                   (dVar190 + dVar229 +
                                    ABS(local_768.p
                                        [lVar92 + lVar49 + lVar63 + local_768.nstride * 7]) + 1e-100
                                   ) + 1.0 + ABS(local_768.p
                                                 [lVar85 + lVar49 + lVar63 + local_768.nstride * 4])
                                             / (dVar251 + dVar229 + 1e-100) + auVar222._0_8_) *
                                  dVar251 * *(double *)(lVar98 + lVar89 * 8) *
                                  local_768.p[lVar92 + lVar49 + lVar63 + local_768.nstride * 8] +
                                  (auVar235._8_8_ +
                                   ABS(local_768.p[lVar92 + lVar50 + lVar96 + local_768.nstride * 3]
                                      ) / (ABS(local_768.p
                                               [lVar92 + lVar51 + lVar96 + local_768.nstride * 7]) +
                                           dVar116 + ABS(local_768.p
                                                         [lVar92 + lVar50 + lVar96 + local_768.
                                                                                     nstride * 7]) +
                                          1e-100) +
                                   ABS(local_768.p[lVar85 + lVar50 + lVar63 + local_768.nstride * 2]
                                      ) / (dVar211 + dVar116 +
                                           ABS(local_768.p
                                               [lVar85 + lVar50 + lVar63 + local_768.nstride * 7]) +
                                          1e-100) +
                                   ABS(local_768.p[lVar92 + lVar51 + lVar63 + local_768.nstride]) /
                                   (dVar145 + dVar211 +
                                    ABS(local_768.p
                                        [lVar92 + lVar51 + lVar63 + local_768.nstride * 7]) + 1e-100
                                   ) + 1.0 + ABS(local_768.p
                                                 [lVar85 + lVar51 + lVar63 + local_768.nstride * 4])
                                             / (dVar228 + dVar211 + 1e-100) + auVar235._0_8_) *
                                  dVar228 * *(double *)(lVar27 + lVar89 * 8) *
                                  local_768.p[lVar92 + lVar50 + lVar63 + local_768.nstride * 8] +
                                  auVar160._8_8_ +
                                  auVar231._8_8_ +
                                  (*(double *)(lVar71 + lVar89 * 8) * dVar115) /
                                  ((dVar227 + dVar175) * dVar210 + dVar115 +
                                   (dVar144 + dVar244) * dVar166 + (dVar175 + dVar244) * dVar189 +
                                  1e-100) + (dVar113 * *(double *)(lVar78 + lVar89 * 8)) /
                                            ((dVar165 + dVar131) * dVar226 + dVar113 +
                                             (dVar165 + dVar174) * dVar112 +
                                             (dVar141 + dVar174) * dVar130 + 1e-100) +
                                            (*(double *)(lVar71 + lVar74 * 8) * dVar114) /
                                            (dVar114 + (dVar266 + dVar253) * dVar220 +
                                                       (dVar243 + dVar266) * dVar173 +
                                             (dVar253 + dVar143) * dVar142 + 1e-100) +
                                            (*(double *)(lVar78 + lVar74 * 8) * dVar242) /
                                            (dVar242 + (dVar159 + dVar265) * dVar140 +
                                                       (dVar260 + dVar219) * dVar252 +
                                                       (dVar159 + dVar260) * dVar129 + 1e-100) +
                                            (*(double *)(lVar27 + lVar47 * 8) * dVar172) /
                                            ((dVar164 + dVar158) * dVar200 + dVar172 +
                                             (dVar139 + dVar209) * dVar111 +
                                             (dVar158 + dVar209) * dVar188 + 1e-100) +
                                            (dVar199 * *(double *)(lVar98 + lVar47 * 8)) /
                                            ((dVar138 + dVar128) * dVar171 + dVar199 +
                                             (dVar138 + dVar208) * dVar163 +
                                             (dVar157 + dVar208) * dVar187 + 1e-100) +
                                            (*(double *)(lVar97 + lVar47 * 8) * dVar110) /
                                            (dVar110 + (dVar186 + dVar156) * dVar198 +
                                                       (dVar137 + dVar186) * dVar162 +
                                             (dVar156 + dVar207) * dVar170 + 1e-100) +
                                            (*(double *)(lVar94 + lVar47 * 8) * dVar169) /
                                            (dVar169 + (dVar136 + dVar206) * dVar127 +
                                                       (dVar197 + dVar155) * dVar185 +
                                                       (dVar136 + dVar197) * dVar161 + 1e-100) +
                                            *(double *)(lVar75 + lVar47 * 8) + dVar121 + dVar122 +
                                            dVar123 + dVar124 + dVar125 + dVar126 + auVar231._0_8_ +
                                  auVar160._0_8_) * 0.125);
                    }
                    ((undefined **)
                    ((local_c28 - (int)local_518._36_4_) * local_518._8_8_ * 8 + local_518._0_8_))
                    [((long)iVar19 - (long)(int)local_518._40_4_) * local_518._16_8_ +
                     (lVar88 - (int)local_518._32_4_)] = puVar117;
                    lVar88 = lVar88 + 1;
                  } while (local_838.jstride._4_4_ + 1 != (int)lVar88);
                }
                local_c28 = local_c28 + 1;
              } while ((int)local_838.kstride + 1 != (int)local_c28);
            }
            bVar109 = iVar19 != local_838.kstride._4_4_;
            iVar19 = iVar19 + 1;
          } while (bVar109);
        }
      }
      MFIter::operator++((MFIter *)local_338);
    } while ((int)local_338._32_4_ < (int)local_338._40_4_);
  }
  MFIter::~MFIter((MFIter *)local_338);
  PVar269 = Geometry::periodicity(local_558);
  local_338[0] = PVar269.period.vect[0]._0_1_;
  local_338._1_7_ = PVar269.period.vect._1_7_;
  local_338._8_4_ = PVar269.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy(local_6c8,&local_1b0,(Periodicity *)local_338,COPY);
  amrex::coarsen((BoxArray *)local_518,ba,iVar2);
  local_728._4_4_ = 0;
  local_728._0_4_ = 1;
  local_728._8_4_ = 0;
  local_728._12_4_ = 0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_878.p = (double *)&PTR__FabFactory_008378d0;
  MultiFab::MultiFab((MultiFab *)local_338,(BoxArray *)local_518,dm,1,0,(MFInfo *)local_728,
                     (FabFactory<amrex::FArrayBox> *)&local_878);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_718);
  BoxArray::~BoxArray((BoxArray *)local_518);
  local_520 = *(long **)&(this->m_sigma).
                         super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar31].
                         super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                         .
                         super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  local_34c.num_streams = Gpu::Device::max_gpu_streams;
  local_34c.do_tiling = true;
  local_34c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_34c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_34c.tilesize.vect[2] = DAT_0083cec0;
  local_34c.dynamic = true;
  local_34c.device_sync = true;
  MFIter::MFIter((MFIter *)local_518,(FabArrayBase *)local_338,&local_34c);
  if ((int)local_518._32_4_ < (int)local_518._40_4_) {
    local_610 = dVar133 * 0.027777777777777776 * dVar133;
    local_618 = dVar118 * 0.027777777777777776 * dVar118;
    local_608 = dVar146 * 0.027777777777777776 * dVar146;
    do {
      MFIter::tilebox((Box *)&local_6b8,(MFIter *)local_518);
      BATransformer::operator()
                ((Box *)local_728,(BATransformer *)(local_518._8_8_ + 8),
                 (Box *)((long)*(int *)(*(long *)local_518._56_8_ + (long)(int)local_518._32_4_ * 4)
                         * 0x1c + *(long *)((ArenaInfo *)(local_518._8_8_ + 0x50))->
                                           release_threshold));
      iVar31 = local_728._0_4_;
      iVar73 = local_728._4_4_;
      iVar76 = local_728._8_4_;
      uVar83 = local_728._12_4_;
      iVar87 = (int)local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      iVar53 = local_718.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._4_4_;
      if (iVar2 != 1) {
        iVar31 = local_728._0_4_ * iVar2;
        iVar73 = local_728._4_4_ * iVar2;
        iVar76 = local_728._8_4_ * iVar2;
        uVar32 = (uint)(((ulong)local_718.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 2) == 0);
        uVar43 = (uint)(((ulong)local_718.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 4) == 0);
        uVar83 = (local_728._12_4_ +
                 (~(uint)local_718.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 1)) * iVar2 -
                 (~(uint)local_718.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 1);
        iVar87 = ((int)local_718.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar32) * iVar2 - uVar32;
        iVar53 = (local_718.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ + uVar43) * iVar2 - uVar43;
      }
      local_7a8.jstride._4_4_ = uVar83;
      local_7a8.kstride._0_4_ = iVar87;
      local_7a8.kstride._4_4_ = iVar53;
      lVar24 = 0;
      do {
        if (((uint)local_718.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish >> ((uint)lVar24 & 0x1f) & 1) != 0) {
          piVar1 = (int *)((long)&local_7a8.jstride + lVar24 * 4 + 4);
          *piVar1 = *piVar1 + -1;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      local_7a8.nstride._0_4_ = 0;
      local_7a8.p._0_4_ = iVar31;
      local_7a8.p._4_4_ = iVar73;
      local_7a8.jstride._0_4_ = iVar76;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_728,(FabArray<amrex::FArrayBox> *)local_338,
                 (MFIter *)local_518);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_878,&a_fine_res->super_FabArray<amrex::FArrayBox>,(MFIter *)local_518);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_768,&fine_rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_518);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_838,&fine_sol->super_FabArray<amrex::FArrayBox>,(MFIter *)local_518);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_678,local_548,(MFIter *)local_518);
      if (*local_520 == 0) {
        dVar133 = this->m_const_sigma;
        if (iVar2 == 2) {
          lVar24 = (long)(int)local_6b8.jstride;
          if ((int)local_6b8.jstride <= local_6b8.kstride._4_4_) {
            lVar79 = (long)iVar31;
            lVar64 = (long)iVar73;
            iVar59 = (int)local_6b8.jstride * 2 + -1;
            lVar80 = (long)iVar76;
            do {
              lVar65 = (long)iVar59;
              if (iVar59 < lVar80) {
                lVar65 = lVar80;
              }
              iVar46 = iVar59;
              if (iVar59 < iVar76) {
                iVar46 = iVar76;
              }
              if (local_6b8.p._4_4_ <= (int)(uint)local_6b8.kstride) {
                iVar84 = (int)(lVar24 * 2);
                iVar12 = iVar84 + -1;
                if (iVar84 + -1 <= iVar76) {
                  iVar12 = iVar76;
                }
                iVar13 = iVar84 + 1;
                if (iVar53 < iVar84 + 1) {
                  iVar13 = iVar53;
                }
                iVar19 = (int)lVar65 + 1;
                iVar45 = local_6b8.p._4_4_ * 2 + -1;
                local_b70 = (long)local_6b8.p._4_4_;
                do {
                  lVar104 = (long)iVar45;
                  if (iVar45 < lVar64) {
                    lVar104 = lVar64;
                  }
                  iVar42 = iVar45;
                  if (iVar45 < iVar73) {
                    iVar42 = iVar73;
                  }
                  if ((int)local_6b8.p <= (int)local_6b8.jstride._4_4_) {
                    local_7d8 = (double *)(local_b70 * 2);
                    iVar55 = (int)local_7d8;
                    iVar18 = iVar55 + -1;
                    if (iVar55 + -1 <= iVar73) {
                      iVar18 = iVar73;
                    }
                    iVar11 = iVar55 + 1;
                    if (iVar87 < iVar55 + 1) {
                      iVar11 = iVar87;
                    }
                    iVar20 = (int)lVar104 + 1;
                    lVar60 = (long)(int)local_6b8.p;
                    iVar23 = (int)local_6b8.p * 2 + -1;
                    local_ce0 = (int)local_6b8.p * 2;
                    do {
                      lVar38 = (long)iVar23;
                      if (iVar23 < lVar79) {
                        lVar38 = lVar79;
                      }
                      dVar118 = 0.0;
                      if ((local_678.p
                           [(lVar24 * 2 - (long)local_678.begin.z) * local_678.kstride +
                            ((long)local_7d8 - (long)local_678.begin.y) * local_678.jstride +
                            (lVar60 * 2 - (long)local_678.begin.x)] != 0) && (iVar12 <= iVar13)) {
                        lVar88 = lVar38 * 8;
                        uVar43 = (uint)(lVar60 * 2);
                        uVar32 = uVar43 | 1;
                        if ((int)uVar83 < (int)uVar32) {
                          uVar32 = uVar83;
                        }
                        iVar44 = uVar43 - 1;
                        if (iVar44 <= iVar31) {
                          iVar44 = iVar31;
                        }
                        lVar75 = (long)local_838.begin.y;
                        lVar49 = (long)local_838.begin.z;
                        lVar63 = CONCAT44(local_838.kstride._4_4_,(int)local_838.kstride);
                        lVar26 = lVar63 * 8;
                        lVar92 = ((lVar65 + -1) - lVar49) * lVar26;
                        lVar61 = (lVar65 - lVar49) * lVar26;
                        lVar62 = CONCAT44(local_838.jstride._4_4_,(int)local_838.jstride);
                        lVar47 = lVar62 * 8;
                        lVar89 = ((lVar104 + -1) - lVar75) * lVar47;
                        lVar25 = lVar61 + lVar88;
                        lVar74 = (long)local_838.begin.x;
                        lVar85 = (lVar104 - lVar75) * lVar47;
                        local_ab8 = lVar85 + lVar88 + lVar92 + lVar74 * -8;
                        local_b10 = lVar92 + lVar89 + lVar88 + lVar74 * -8;
                        local_b18 = lVar25 + lVar89 + lVar74 * -8;
                        local_ab0 = lVar85 + lVar92 + lVar88 + lVar74 * -8;
                        local_a18 = lVar89 + lVar88 + lVar61 + lVar74 * -8;
                        local_c08 = lVar92 + lVar88 + lVar74 * -8;
                        lVar78 = (lVar104 - local_768.begin.y) * local_768.jstride * 8 +
                                 (lVar65 - local_768.begin.z) * local_768.kstride * 8 + lVar88 +
                                 (long)local_768.begin.x * -8 + (long)local_768.p;
                        iVar69 = ((int)lVar38 - local_838.begin.x) + 1;
                        local_b08 = (lVar104 - local_878.begin.y) * local_878.jstride * 8 +
                                    (lVar65 - local_878.begin.z) * local_878.kstride * 8 + lVar88 +
                                    (long)local_878.begin.x * -8 + (long)local_878.p;
                        lVar61 = CONCAT44(local_838.p._4_4_,(int)local_838.p);
                        local_d48 = lVar25 + lVar85 + lVar74 * -8 + lVar61;
                        local_c90 = lVar61 + local_b18;
                        local_b18 = local_b18 + lVar61;
                        lVar48 = lVar85 + lVar88 + lVar74 * -8 + lVar61;
                        iVar56 = iVar19 - local_838.begin.z;
                        lVar96 = lVar89 + lVar88 + lVar74 * -8 + lVar61;
                        iVar58 = iVar19 - local_838.begin.z;
                        lVar95 = lVar88 + lVar74 * -8 + lVar61;
                        local_c98 = lVar61 + local_b10;
                        local_b10 = local_b10 + lVar61;
                        iVar21 = iVar19 - local_838.begin.z;
                        local_cf0 = lVar25 + lVar74 * -8 + lVar61;
                        iVar57 = iVar19 - local_838.begin.z;
                        local_c28 = lVar61 + local_a18;
                        local_a18 = local_a18 + lVar61;
                        local_bd8 = lVar61 + local_ab0;
                        local_ab0 = local_ab0 + lVar61;
                        local_af0 = lVar61 + local_c08;
                        local_c08 = local_c08 + lVar61;
                        local_b20 = lVar61 + local_ab8;
                        local_ab8 = local_ab8 + lVar61;
                        lVar92 = (long)(int)local_7a8.p;
                        lVar89 = (long)(int)local_7a8.jstride._4_4_;
                        lVar102 = (long)local_7a8.p._4_4_;
                        lVar25 = (long)(int)local_7a8.kstride;
                        lVar74 = (long)(int)local_7a8.jstride;
                        lVar85 = (long)local_7a8.kstride._4_4_;
                        lVar88 = (long)iVar46;
                        local_c18 = local_cf0;
                        local_c10 = local_cf0;
                        local_b58 = local_d48;
                        local_b50 = local_d48;
                        local_b48 = local_d48;
                        local_b40 = local_d48;
                        local_b38 = local_d48;
                        local_b30 = local_d48;
                        local_b28 = local_d48;
                        local_af8 = local_cf0;
                        do {
                          if (iVar18 <= iVar11) {
                            local_da8 = lVar48 + iVar56 * lVar26;
                            local_c68 = iVar56 * lVar26 + lVar96;
                            local_de0 = lVar48 + iVar58 * lVar26;
                            local_db0 = lVar48 + iVar21 * lVar26;
                            local_d60 = lVar48 + iVar57 * lVar26;
                            local_d88 = iVar57 * lVar26 + lVar96;
                            iVar22 = iVar84 - (int)lVar88;
                            iVar52 = -iVar22;
                            if (iVar22 < 1) {
                              iVar52 = iVar22;
                            }
                            lVar93 = lVar88 + -1;
                            lVar94 = (lVar88 - lVar49) * lVar63;
                            lVar97 = ((lVar88 - lVar49) + -1) * lVar63;
                            iVar22 = (int)lVar88 + 1;
                            lVar98 = (iVar22 - local_838.begin.z) * lVar63;
                            lVar50 = (iVar22 - local_838.begin.z) * lVar63;
                            local_db8 = local_d48;
                            local_d68 = local_ab8;
                            local_d50 = local_b28;
                            local_d58 = local_ab0;
                            local_ba8 = local_a18;
                            local_dc8 = local_b30;
                            local_bb8 = local_b38;
                            local_d98 = local_b10;
                            local_d78 = local_b40;
                            local_a98 = local_c28;
                            local_9e8 = local_b48;
                            local_d30 = local_b18;
                            local_d00 = local_b50;
                            local_d08 = local_bd8;
                            local_d10 = local_c90;
                            local_d38 = local_c98;
                            local_d40 = local_b58;
                            local_d18 = local_b20;
                            local_da0 = local_b08;
                            lVar51 = (long)iVar42;
                            iVar22 = iVar20 - local_838.begin.y;
                            iVar54 = iVar20 - local_838.begin.y;
                            iVar107 = iVar20 - local_838.begin.y;
                            iVar101 = iVar20 - local_838.begin.y;
                            local_df8 = lVar78;
                            do {
                              if (iVar44 <= (int)uVar32) {
                                lVar40 = iVar58 * lVar26 + lVar95 + iVar101 * lVar47;
                                lVar28 = iVar101 * lVar47 + local_c10;
                                lVar71 = local_c08 + iVar22 * lVar47;
                                lVar27 = iVar22 * lVar47 + local_cf0;
                                iVar33 = iVar55 - (int)lVar51;
                                iVar77 = -iVar33;
                                if (iVar33 < 1) {
                                  iVar77 = iVar33;
                                }
                                lVar29 = lVar51 + -1;
                                lVar35 = lVar61 + (lVar51 - lVar75) * lVar62 * 8;
                                lVar36 = lVar61 + ((lVar51 - lVar75) + -1) * lVar62 * 8;
                                iVar34 = (int)lVar51 + 1;
                                lVar81 = 0;
                                iVar33 = local_ce0 - (int)lVar38;
                                do {
                                  lVar82 = lVar38 + lVar81;
                                  iVar14 = -iVar33;
                                  if (iVar33 < 1) {
                                    iVar14 = iVar33;
                                  }
                                  if (((((lVar79 < lVar82) && (lVar82 < (int)uVar83)) &&
                                       (lVar64 < lVar51)) &&
                                      ((lVar51 < iVar87 && (lVar80 < lVar88)))) && (lVar88 < iVar53)
                                     ) {
                                    dVar146 = *(double *)(local_df8 + lVar81 * 8) -
                                              *(double *)(local_da0 + lVar81 * 8);
                                  }
                                  else {
                                    lVar90 = lVar38 + lVar81 + -1;
                                    dVar146 = 0.0;
                                    if (((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                       ((lVar102 < lVar51 &&
                                        (((lVar29 <= lVar25 && (lVar74 < lVar88)) &&
                                         (lVar93 <= lVar85)))))) {
                                      dVar146 = *(double *)(local_d40 + -8 + lVar81 * 8);
                                      dVar121 = *(double *)(local_d40 + lVar81 * 8);
                                      dVar122 = *(double *)(local_d10 + -8 + lVar81 * 8);
                                      dVar123 = *(double *)(local_d18 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_d38 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(local_d10 + lVar81 * 8);
                                      dVar126 = *(double *)(local_d18 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d38 + lVar81 * 8);
                                      dVar146 = (((dVar124 - dVar122) +
                                                 (dVar110 - dVar125) + (dVar110 - dVar125) +
                                                 (dVar126 - dVar121) * 4.0 +
                                                 (dVar123 - dVar146) + (dVar123 - dVar146)) *
                                                 local_608 +
                                                ((dVar124 - dVar110) +
                                                (dVar123 - dVar126) + (dVar123 - dVar126) +
                                                (dVar146 - dVar121) * 4.0 +
                                                (dVar122 - dVar125) + (dVar122 - dVar125)) *
                                                local_610 +
                                                ((dVar124 - dVar123) +
                                                (dVar110 - dVar126) + (dVar110 - dVar126) +
                                                (dVar125 - dVar121) * 4.0 +
                                                (dVar122 - dVar146) + (dVar122 - dVar146)) *
                                                local_618) * dVar133 + 0.0;
                                    }
                                    iVar100 = (int)lVar81;
                                    if ((((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                        ((lVar102 < lVar51 &&
                                         ((lVar29 <= lVar25 && (lVar74 < lVar88)))))) &&
                                       (lVar93 <= lVar85)) {
                                      lVar66 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar66 + lVar94 * 8);
                                      dVar122 = *(double *)(local_db8 + lVar81 * 8);
                                      lVar72 = lVar36 + (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar72 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar66 + lVar97 * 8);
                                      dVar125 = *(double *)(lVar72 + lVar97 * 8);
                                      dVar126 = *(double *)(local_d30 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d68 + lVar81 * 8);
                                      dVar111 = *(double *)(local_d98 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if ((((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                        (lVar102 <= lVar51)) &&
                                       (((lVar51 <= lVar25 && (lVar74 < lVar88)) &&
                                        (lVar93 <= lVar85)))) {
                                      dVar121 = *(double *)(local_d00 + -8 + lVar81 * 8);
                                      dVar122 = *(double *)(local_d00 + lVar81 * 8);
                                      dVar123 = *(double *)(lVar27 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_d08 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(lVar71 + -8 + lVar81 * 8);
                                      dVar126 = *(double *)(lVar27 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d08 + lVar81 * 8);
                                      dVar111 = *(double *)(lVar71 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                       ((lVar102 <= lVar51 &&
                                        (((lVar51 <= lVar25 && (lVar74 < lVar88)) &&
                                         (lVar93 <= lVar85)))))) {
                                      lVar66 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar66 + lVar94 * 8);
                                      dVar122 = *(double *)(local_d50 + lVar81 * 8);
                                      lVar72 = lVar61 + (iVar34 - local_838.begin.y) * lVar62 * 8 +
                                               (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar72 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar66 + lVar97 * 8);
                                      dVar125 = *(double *)(lVar72 + lVar97 * 8);
                                      dVar126 = *(double *)
                                                 (iVar54 * lVar47 + local_af8 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d58 + lVar81 * 8);
                                      dVar111 = *(double *)
                                                 (local_af0 + iVar54 * lVar47 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                       (((lVar102 < lVar51 &&
                                         ((lVar29 <= lVar25 && (lVar74 <= lVar88)))) &&
                                        (lVar88 <= lVar85)))) {
                                      dVar121 = *(double *)(local_9e8 + -8 + lVar81 * 8);
                                      dVar122 = *(double *)(local_9e8 + lVar81 * 8);
                                      dVar123 = *(double *)(local_a98 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_da8 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(local_c68 + -8 + lVar81 * 8);
                                      dVar126 = *(double *)(local_a98 + lVar81 * 8);
                                      dVar110 = *(double *)(local_da8 + lVar81 * 8);
                                      dVar111 = *(double *)(local_c68 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                         (lVar102 < lVar51)) &&
                                        ((lVar29 <= lVar25 && (lVar74 <= lVar88)))) &&
                                       (lVar88 <= lVar85)) {
                                      lVar66 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar66 + lVar94 * 8);
                                      dVar122 = *(double *)(local_dc8 + lVar81 * 8);
                                      lVar72 = lVar36 + (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar72 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar66 + lVar98 * 8);
                                      dVar125 = *(double *)(lVar72 + lVar98 * 8);
                                      dVar126 = *(double *)(local_ba8 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d60 + lVar81 * 8);
                                      dVar111 = *(double *)(local_d88 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                       ((lVar102 <= lVar51 &&
                                        (((lVar51 <= lVar25 && (lVar74 <= lVar88)) &&
                                         (lVar88 <= lVar85)))))) {
                                      dVar121 = *(double *)(local_d78 + -8 + lVar81 * 8);
                                      dVar122 = *(double *)(local_d78 + lVar81 * 8);
                                      dVar123 = *(double *)(lVar28 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_de0 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(lVar40 + -8 + lVar81 * 8);
                                      dVar126 = *(double *)(lVar28 + lVar81 * 8);
                                      dVar110 = *(double *)(local_de0 + lVar81 * 8);
                                      dVar111 = *(double *)(lVar40 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                       (((lVar102 <= lVar51 &&
                                         ((lVar51 <= lVar25 && (lVar74 <= lVar88)))) &&
                                        (lVar88 <= lVar85)))) {
                                      lVar82 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar82 + lVar94 * 8);
                                      dVar122 = *(double *)(local_bb8 + lVar81 * 8);
                                      lVar90 = lVar61 + (iVar34 - local_838.begin.y) * lVar62 * 8 +
                                               (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar90 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar82 + lVar50 * 8);
                                      dVar125 = *(double *)(lVar90 + lVar50 * 8);
                                      dVar126 = *(double *)
                                                 (iVar107 * lVar47 + local_c18 + lVar81 * 8);
                                      dVar110 = *(double *)(local_db0 + lVar81 * 8);
                                      dVar111 = *(double *)
                                                 (iVar21 * lVar26 + lVar95 + iVar107 * lVar47 +
                                                 lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                  }
                                  dVar118 = dVar118 + (double)((iVar14 + 2) *
                                                              (iVar77 + 2) * (iVar52 + 2)) * dVar146
                                  ;
                                  lVar82 = lVar38 + lVar81;
                                  lVar81 = lVar81 + 1;
                                  iVar33 = iVar33 + -1;
                                } while (lVar82 < (int)uVar32);
                              }
                              local_df8 = local_df8 + local_768.jstride * 8;
                              local_da0 = local_da0 + local_878.jstride * 8;
                              local_d18 = local_d18 + lVar47;
                              local_d40 = local_d40 + lVar47;
                              local_d38 = local_d38 + lVar47;
                              local_d10 = local_d10 + lVar47;
                              local_d08 = local_d08 + lVar47;
                              local_d00 = local_d00 + lVar47;
                              local_d30 = local_d30 + lVar47;
                              local_da8 = local_da8 + lVar47;
                              local_9e8 = local_9e8 + lVar47;
                              local_c68 = local_c68 + lVar47;
                              local_a98 = local_a98 + lVar47;
                              local_de0 = local_de0 + lVar47;
                              local_d78 = local_d78 + lVar47;
                              iVar101 = iVar101 + 1;
                              local_d98 = local_d98 + lVar47;
                              local_db0 = local_db0 + lVar47;
                              local_bb8 = local_bb8 + lVar47;
                              iVar107 = iVar107 + 1;
                              local_d60 = local_d60 + lVar47;
                              local_dc8 = local_dc8 + lVar47;
                              local_d88 = local_d88 + lVar47;
                              local_ba8 = local_ba8 + lVar47;
                              local_d58 = local_d58 + lVar47;
                              local_d50 = local_d50 + lVar47;
                              iVar54 = iVar54 + 1;
                              iVar22 = iVar22 + 1;
                              local_d68 = local_d68 + lVar47;
                              local_db8 = local_db8 + lVar47;
                              bVar109 = lVar51 < iVar11;
                              lVar51 = lVar51 + 1;
                            } while (bVar109);
                          }
                          lVar78 = lVar78 + local_768.kstride * 8;
                          local_b08 = local_b08 + local_878.kstride * 8;
                          local_b20 = local_b20 + lVar26;
                          local_b58 = local_b58 + lVar26;
                          local_c98 = local_c98 + lVar26;
                          local_c90 = local_c90 + lVar26;
                          local_bd8 = local_bd8 + lVar26;
                          local_b50 = local_b50 + lVar26;
                          local_b18 = local_b18 + lVar26;
                          iVar56 = iVar56 + 1;
                          local_b48 = local_b48 + lVar26;
                          local_c28 = local_c28 + lVar26;
                          iVar58 = iVar58 + 1;
                          local_b40 = local_b40 + lVar26;
                          local_b10 = local_b10 + lVar26;
                          iVar21 = iVar21 + 1;
                          local_b38 = local_b38 + lVar26;
                          local_c18 = local_c18 + lVar26;
                          local_c10 = local_c10 + lVar26;
                          iVar57 = iVar57 + 1;
                          local_b30 = local_b30 + lVar26;
                          local_a18 = local_a18 + lVar26;
                          local_ab0 = local_ab0 + lVar26;
                          local_b28 = local_b28 + lVar26;
                          local_af0 = local_af0 + lVar26;
                          local_af8 = local_af8 + lVar26;
                          local_c08 = local_c08 + lVar26;
                          local_cf0 = local_cf0 + lVar26;
                          local_ab8 = local_ab8 + lVar26;
                          local_d48 = local_d48 + lVar26;
                          bVar109 = lVar88 < iVar13;
                          lVar88 = lVar88 + 1;
                        } while (bVar109);
                        dVar118 = dVar118 * 0.015625;
                      }
                      *(double *)
                       (CONCAT44(local_728._4_4_,local_728._0_4_) +
                        (local_b70 -
                        local_718.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_728._12_4_,local_728._8_4_) * 8 +
                        (lVar60 - (int)local_718.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8 +
                       (lVar24 - local_700) *
                       (long)local_718.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start * 8) = dVar118;
                      lVar60 = lVar60 + 1;
                      iVar23 = iVar23 + 2;
                      local_ce0 = local_ce0 + 2;
                    } while (local_6b8.jstride._4_4_ + 1 != (int)lVar60);
                  }
                  local_b70 = local_b70 + 1;
                  iVar45 = iVar45 + 2;
                } while ((uint)local_6b8.kstride + 1 != (int)local_b70);
              }
              lVar24 = lVar24 + 1;
              iVar59 = iVar59 + 2;
            } while (local_6b8.kstride._4_4_ + 1 != (int)lVar24);
          }
        }
        else {
          lVar24 = (long)(int)local_6b8.jstride;
          if ((int)local_6b8.jstride <= local_6b8.kstride._4_4_) {
            lVar79 = (long)iVar31;
            lVar64 = (long)iVar73;
            iVar59 = (int)local_6b8.jstride * 4 + -3;
            lVar80 = (long)iVar76;
            do {
              lVar65 = (long)iVar59;
              if (iVar59 < lVar80) {
                lVar65 = lVar80;
              }
              iVar46 = iVar59;
              if (iVar59 < iVar76) {
                iVar46 = iVar76;
              }
              if (local_6b8.p._4_4_ <= (int)(uint)local_6b8.kstride) {
                iVar84 = (int)(lVar24 * 4);
                iVar12 = iVar84 + -3;
                if (iVar84 + -3 <= iVar76) {
                  iVar12 = iVar76;
                }
                iVar13 = iVar84 + 3;
                if (iVar53 < iVar84 + 3) {
                  iVar13 = iVar53;
                }
                iVar19 = (int)lVar65 + 1;
                iVar45 = local_6b8.p._4_4_ * 4 + -3;
                local_b70 = (long)local_6b8.p._4_4_;
                do {
                  lVar104 = (long)iVar45;
                  if (iVar45 < lVar64) {
                    lVar104 = lVar64;
                  }
                  iVar42 = iVar45;
                  if (iVar45 < iVar73) {
                    iVar42 = iVar73;
                  }
                  if ((int)local_6b8.p <= (int)local_6b8.jstride._4_4_) {
                    local_7d8 = (double *)(local_b70 * 4);
                    iVar55 = (int)local_7d8;
                    iVar18 = iVar55 + -3;
                    if (iVar55 + -3 <= iVar73) {
                      iVar18 = iVar73;
                    }
                    iVar11 = iVar55 + 3;
                    if (iVar87 < iVar55 + 3) {
                      iVar11 = iVar87;
                    }
                    iVar20 = (int)lVar104 + 1;
                    lVar60 = (long)(int)local_6b8.p;
                    iVar23 = (int)local_6b8.p * 4 + -3;
                    local_ce0 = (int)local_6b8.p * 4;
                    do {
                      lVar38 = (long)iVar23;
                      if (iVar23 < lVar79) {
                        lVar38 = lVar79;
                      }
                      dVar118 = 0.0;
                      if ((local_678.p
                           [(lVar24 * 4 - (long)local_678.begin.z) * local_678.kstride +
                            ((long)local_7d8 - (long)local_678.begin.y) * local_678.jstride +
                            (lVar60 * 4 - (long)local_678.begin.x)] != 0) && (iVar12 <= iVar13)) {
                        lVar88 = lVar38 * 8;
                        uVar43 = (uint)(lVar60 * 4);
                        uVar32 = uVar43 | 3;
                        if ((int)uVar83 < (int)uVar32) {
                          uVar32 = uVar83;
                        }
                        iVar44 = uVar43 - 3;
                        if (iVar44 <= iVar31) {
                          iVar44 = iVar31;
                        }
                        lVar75 = (long)local_838.begin.y;
                        lVar49 = (long)local_838.begin.z;
                        lVar63 = CONCAT44(local_838.kstride._4_4_,(int)local_838.kstride);
                        lVar26 = lVar63 * 8;
                        lVar92 = ((lVar65 + -1) - lVar49) * lVar26;
                        lVar61 = (lVar65 - lVar49) * lVar26;
                        lVar62 = CONCAT44(local_838.jstride._4_4_,(int)local_838.jstride);
                        lVar47 = lVar62 * 8;
                        lVar89 = ((lVar104 + -1) - lVar75) * lVar47;
                        lVar25 = lVar61 + lVar88;
                        lVar74 = (long)local_838.begin.x;
                        lVar85 = (lVar104 - lVar75) * lVar47;
                        local_ab8 = lVar85 + lVar88 + lVar92 + lVar74 * -8;
                        local_b10 = lVar92 + lVar89 + lVar88 + lVar74 * -8;
                        local_b18 = lVar25 + lVar89 + lVar74 * -8;
                        local_ab0 = lVar85 + lVar92 + lVar88 + lVar74 * -8;
                        local_a18 = lVar89 + lVar88 + lVar61 + lVar74 * -8;
                        local_c08 = lVar92 + lVar88 + lVar74 * -8;
                        lVar78 = (lVar104 - local_768.begin.y) * local_768.jstride * 8 +
                                 (lVar65 - local_768.begin.z) * local_768.kstride * 8 + lVar88 +
                                 (long)local_768.begin.x * -8 + (long)local_768.p;
                        iVar69 = ((int)lVar38 - local_838.begin.x) + 1;
                        local_b08 = (lVar104 - local_878.begin.y) * local_878.jstride * 8 +
                                    (lVar65 - local_878.begin.z) * local_878.kstride * 8 + lVar88 +
                                    (long)local_878.begin.x * -8 + (long)local_878.p;
                        lVar61 = CONCAT44(local_838.p._4_4_,(int)local_838.p);
                        local_d48 = lVar25 + lVar85 + lVar74 * -8 + lVar61;
                        local_c90 = lVar61 + local_b18;
                        local_b18 = local_b18 + lVar61;
                        lVar48 = lVar85 + lVar88 + lVar74 * -8 + lVar61;
                        iVar56 = iVar19 - local_838.begin.z;
                        lVar96 = lVar89 + lVar88 + lVar74 * -8 + lVar61;
                        iVar58 = iVar19 - local_838.begin.z;
                        lVar95 = lVar88 + lVar74 * -8 + lVar61;
                        local_c98 = lVar61 + local_b10;
                        local_b10 = local_b10 + lVar61;
                        iVar21 = iVar19 - local_838.begin.z;
                        local_cf0 = lVar25 + lVar74 * -8 + lVar61;
                        iVar57 = iVar19 - local_838.begin.z;
                        local_c28 = lVar61 + local_a18;
                        local_a18 = local_a18 + lVar61;
                        local_bd8 = lVar61 + local_ab0;
                        local_ab0 = local_ab0 + lVar61;
                        local_af0 = lVar61 + local_c08;
                        local_c08 = local_c08 + lVar61;
                        local_b20 = lVar61 + local_ab8;
                        local_ab8 = local_ab8 + lVar61;
                        lVar92 = (long)(int)local_7a8.p;
                        lVar89 = (long)(int)local_7a8.jstride._4_4_;
                        lVar102 = (long)local_7a8.p._4_4_;
                        lVar25 = (long)(int)local_7a8.kstride;
                        lVar74 = (long)(int)local_7a8.jstride;
                        lVar85 = (long)local_7a8.kstride._4_4_;
                        lVar88 = (long)iVar46;
                        local_c18 = local_cf0;
                        local_c10 = local_cf0;
                        local_b58 = local_d48;
                        local_b50 = local_d48;
                        local_b48 = local_d48;
                        local_b40 = local_d48;
                        local_b38 = local_d48;
                        local_b30 = local_d48;
                        local_b28 = local_d48;
                        local_af8 = local_cf0;
                        do {
                          if (iVar18 <= iVar11) {
                            local_da8 = lVar48 + iVar56 * lVar26;
                            local_c68 = iVar56 * lVar26 + lVar96;
                            local_de0 = lVar48 + iVar58 * lVar26;
                            local_db0 = lVar48 + iVar21 * lVar26;
                            local_d60 = lVar48 + iVar57 * lVar26;
                            local_d88 = iVar57 * lVar26 + lVar96;
                            iVar22 = iVar84 - (int)lVar88;
                            iVar52 = -iVar22;
                            if (iVar22 < 1) {
                              iVar52 = iVar22;
                            }
                            lVar93 = lVar88 + -1;
                            lVar94 = (lVar88 - lVar49) * lVar63;
                            lVar97 = ((lVar88 - lVar49) + -1) * lVar63;
                            iVar22 = (int)lVar88 + 1;
                            lVar98 = (iVar22 - local_838.begin.z) * lVar63;
                            lVar50 = (iVar22 - local_838.begin.z) * lVar63;
                            local_db8 = local_d48;
                            local_d68 = local_ab8;
                            local_d50 = local_b28;
                            local_d58 = local_ab0;
                            local_ba8 = local_a18;
                            local_dc8 = local_b30;
                            local_bb8 = local_b38;
                            local_d98 = local_b10;
                            local_d78 = local_b40;
                            local_a98 = local_c28;
                            local_9e8 = local_b48;
                            local_d30 = local_b18;
                            local_d00 = local_b50;
                            local_d08 = local_bd8;
                            local_d10 = local_c90;
                            local_d38 = local_c98;
                            local_d40 = local_b58;
                            local_d18 = local_b20;
                            local_da0 = local_b08;
                            lVar51 = (long)iVar42;
                            iVar22 = iVar20 - local_838.begin.y;
                            iVar54 = iVar20 - local_838.begin.y;
                            iVar107 = iVar20 - local_838.begin.y;
                            iVar101 = iVar20 - local_838.begin.y;
                            local_df8 = lVar78;
                            do {
                              if (iVar44 <= (int)uVar32) {
                                lVar40 = iVar58 * lVar26 + lVar95 + iVar101 * lVar47;
                                lVar28 = iVar101 * lVar47 + local_c10;
                                lVar71 = local_c08 + iVar22 * lVar47;
                                lVar27 = iVar22 * lVar47 + local_cf0;
                                iVar33 = iVar55 - (int)lVar51;
                                iVar77 = -iVar33;
                                if (iVar33 < 1) {
                                  iVar77 = iVar33;
                                }
                                lVar29 = lVar51 + -1;
                                lVar35 = lVar61 + (lVar51 - lVar75) * lVar62 * 8;
                                lVar36 = lVar61 + ((lVar51 - lVar75) + -1) * lVar62 * 8;
                                iVar34 = (int)lVar51 + 1;
                                lVar81 = 0;
                                iVar33 = local_ce0 - (int)lVar38;
                                do {
                                  lVar82 = lVar38 + lVar81;
                                  iVar14 = -iVar33;
                                  if (iVar33 < 1) {
                                    iVar14 = iVar33;
                                  }
                                  if ((((lVar79 < lVar82) && (lVar82 < (int)uVar83)) &&
                                      (lVar64 < lVar51)) &&
                                     (((lVar51 < iVar87 && (lVar80 < lVar88)) && (lVar88 < iVar53)))
                                     ) {
                                    dVar146 = *(double *)(local_df8 + lVar81 * 8) -
                                              *(double *)(local_da0 + lVar81 * 8);
                                  }
                                  else {
                                    lVar90 = lVar38 + lVar81 + -1;
                                    dVar146 = 0.0;
                                    if (((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                       ((lVar102 < lVar51 &&
                                        (((lVar29 <= lVar25 && (lVar74 < lVar88)) &&
                                         (lVar93 <= lVar85)))))) {
                                      dVar146 = *(double *)(local_d40 + -8 + lVar81 * 8);
                                      dVar121 = *(double *)(local_d40 + lVar81 * 8);
                                      dVar122 = *(double *)(local_d10 + -8 + lVar81 * 8);
                                      dVar123 = *(double *)(local_d18 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_d38 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(local_d10 + lVar81 * 8);
                                      dVar126 = *(double *)(local_d18 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d38 + lVar81 * 8);
                                      dVar146 = (((dVar124 - dVar122) +
                                                 (dVar110 - dVar125) + (dVar110 - dVar125) +
                                                 (dVar126 - dVar121) * 4.0 +
                                                 (dVar123 - dVar146) + (dVar123 - dVar146)) *
                                                 local_608 +
                                                ((dVar124 - dVar110) +
                                                (dVar123 - dVar126) + (dVar123 - dVar126) +
                                                (dVar146 - dVar121) * 4.0 +
                                                (dVar122 - dVar125) + (dVar122 - dVar125)) *
                                                local_610 +
                                                ((dVar124 - dVar123) +
                                                (dVar110 - dVar126) + (dVar110 - dVar126) +
                                                (dVar125 - dVar121) * 4.0 +
                                                (dVar122 - dVar146) + (dVar122 - dVar146)) *
                                                local_618) * dVar133 + 0.0;
                                    }
                                    iVar100 = (int)lVar81;
                                    if (((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                       (((lVar102 < lVar51 &&
                                         ((lVar29 <= lVar25 && (lVar74 < lVar88)))) &&
                                        (lVar93 <= lVar85)))) {
                                      lVar66 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar66 + lVar94 * 8);
                                      dVar122 = *(double *)(local_db8 + lVar81 * 8);
                                      lVar72 = lVar36 + (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar72 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar66 + lVar97 * 8);
                                      dVar125 = *(double *)(lVar72 + lVar97 * 8);
                                      dVar126 = *(double *)(local_d30 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d68 + lVar81 * 8);
                                      dVar111 = *(double *)(local_d98 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                         (lVar102 <= lVar51)) &&
                                        ((lVar51 <= lVar25 && (lVar74 < lVar88)))) &&
                                       (lVar93 <= lVar85)) {
                                      dVar121 = *(double *)(local_d00 + -8 + lVar81 * 8);
                                      dVar122 = *(double *)(local_d00 + lVar81 * 8);
                                      dVar123 = *(double *)(lVar27 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_d08 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(lVar71 + -8 + lVar81 * 8);
                                      dVar126 = *(double *)(lVar27 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d08 + lVar81 * 8);
                                      dVar111 = *(double *)(lVar71 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                       ((lVar102 <= lVar51 &&
                                        (((lVar51 <= lVar25 && (lVar74 < lVar88)) &&
                                         (lVar93 <= lVar85)))))) {
                                      lVar66 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar66 + lVar94 * 8);
                                      dVar122 = *(double *)(local_d50 + lVar81 * 8);
                                      lVar72 = lVar61 + (iVar34 - local_838.begin.y) * lVar62 * 8 +
                                               (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar72 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar66 + lVar97 * 8);
                                      dVar125 = *(double *)(lVar72 + lVar97 * 8);
                                      dVar126 = *(double *)
                                                 (iVar54 * lVar47 + local_af8 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d58 + lVar81 * 8);
                                      dVar111 = *(double *)
                                                 (local_af0 + iVar54 * lVar47 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if ((((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                        ((lVar102 < lVar51 &&
                                         ((lVar29 <= lVar25 && (lVar74 <= lVar88)))))) &&
                                       (lVar88 <= lVar85)) {
                                      dVar121 = *(double *)(local_9e8 + -8 + lVar81 * 8);
                                      dVar122 = *(double *)(local_9e8 + lVar81 * 8);
                                      dVar123 = *(double *)(local_a98 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_da8 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(local_c68 + -8 + lVar81 * 8);
                                      dVar126 = *(double *)(local_a98 + lVar81 * 8);
                                      dVar110 = *(double *)(local_da8 + lVar81 * 8);
                                      dVar111 = *(double *)(local_c68 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if ((((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                        (lVar102 < lVar51)) &&
                                       (((lVar29 <= lVar25 && (lVar74 <= lVar88)) &&
                                        (lVar88 <= lVar85)))) {
                                      lVar66 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar66 + lVar94 * 8);
                                      dVar122 = *(double *)(local_dc8 + lVar81 * 8);
                                      lVar72 = lVar36 + (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar72 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar66 + lVar98 * 8);
                                      dVar125 = *(double *)(lVar72 + lVar98 * 8);
                                      dVar126 = *(double *)(local_ba8 + lVar81 * 8);
                                      dVar110 = *(double *)(local_d60 + lVar81 * 8);
                                      dVar111 = *(double *)(local_d88 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((lVar92 < lVar82) && (lVar90 <= lVar89)) &&
                                       ((lVar102 <= lVar51 &&
                                        (((lVar51 <= lVar25 && (lVar74 <= lVar88)) &&
                                         (lVar88 <= lVar85)))))) {
                                      dVar121 = *(double *)(local_d78 + -8 + lVar81 * 8);
                                      dVar122 = *(double *)(local_d78 + lVar81 * 8);
                                      dVar123 = *(double *)(lVar28 + -8 + lVar81 * 8);
                                      dVar124 = *(double *)(local_de0 + -8 + lVar81 * 8);
                                      dVar125 = *(double *)(lVar40 + -8 + lVar81 * 8);
                                      dVar126 = *(double *)(lVar28 + lVar81 * 8);
                                      dVar110 = *(double *)(local_de0 + lVar81 * 8);
                                      dVar111 = *(double *)(lVar40 + lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                    if (((lVar92 <= lVar82) && (lVar82 <= lVar89)) &&
                                       (((lVar102 <= lVar51 &&
                                         ((lVar51 <= lVar25 && (lVar74 <= lVar88)))) &&
                                        (lVar88 <= lVar85)))) {
                                      lVar82 = lVar35 + (long)(iVar69 + iVar100) * 8;
                                      dVar121 = *(double *)(lVar82 + lVar94 * 8);
                                      dVar122 = *(double *)(local_bb8 + lVar81 * 8);
                                      lVar90 = lVar61 + (iVar34 - local_838.begin.y) * lVar62 * 8 +
                                               (long)(iVar69 + iVar100) * 8;
                                      dVar123 = *(double *)(lVar90 + lVar94 * 8);
                                      dVar124 = *(double *)(lVar82 + lVar50 * 8);
                                      dVar125 = *(double *)(lVar90 + lVar50 * 8);
                                      dVar126 = *(double *)
                                                 (iVar107 * lVar47 + local_c18 + lVar81 * 8);
                                      dVar110 = *(double *)(local_db0 + lVar81 * 8);
                                      dVar111 = *(double *)
                                                 (iVar21 * lVar26 + lVar95 + iVar107 * lVar47 +
                                                 lVar81 * 8);
                                      dVar146 = dVar146 + (((dVar125 - dVar123) +
                                                           (dVar111 - dVar126) + (dVar111 - dVar126)
                                                           + (dVar110 - dVar122) * 4.0 +
                                                             (dVar124 - dVar121) +
                                                             (dVar124 - dVar121)) * local_608 +
                                                          ((dVar125 - dVar111) +
                                                          (dVar124 - dVar110) + (dVar124 - dVar110)
                                                          + (dVar121 - dVar122) * 4.0 +
                                                            (dVar123 - dVar126) +
                                                            (dVar123 - dVar126)) * local_610 +
                                                          ((dVar125 - dVar124) +
                                                          (dVar111 - dVar110) + (dVar111 - dVar110)
                                                          + (dVar126 - dVar122) * 4.0 +
                                                            (dVar123 - dVar121) +
                                                            (dVar123 - dVar121)) * local_618) *
                                                          dVar133;
                                    }
                                  }
                                  dVar118 = dVar118 + (double)((iVar14 + 4) *
                                                              (iVar77 + 4) * (iVar52 + 4)) * dVar146
                                  ;
                                  lVar82 = lVar38 + lVar81;
                                  lVar81 = lVar81 + 1;
                                  iVar33 = iVar33 + -1;
                                } while (lVar82 < (int)uVar32);
                              }
                              local_df8 = local_df8 + local_768.jstride * 8;
                              local_da0 = local_da0 + local_878.jstride * 8;
                              local_d18 = local_d18 + lVar47;
                              local_d40 = local_d40 + lVar47;
                              local_d38 = local_d38 + lVar47;
                              local_d10 = local_d10 + lVar47;
                              local_d08 = local_d08 + lVar47;
                              local_d00 = local_d00 + lVar47;
                              local_d30 = local_d30 + lVar47;
                              local_da8 = local_da8 + lVar47;
                              local_9e8 = local_9e8 + lVar47;
                              local_c68 = local_c68 + lVar47;
                              local_a98 = local_a98 + lVar47;
                              local_de0 = local_de0 + lVar47;
                              local_d78 = local_d78 + lVar47;
                              iVar101 = iVar101 + 1;
                              local_d98 = local_d98 + lVar47;
                              local_db0 = local_db0 + lVar47;
                              local_bb8 = local_bb8 + lVar47;
                              iVar107 = iVar107 + 1;
                              local_d60 = local_d60 + lVar47;
                              local_dc8 = local_dc8 + lVar47;
                              local_d88 = local_d88 + lVar47;
                              local_ba8 = local_ba8 + lVar47;
                              local_d58 = local_d58 + lVar47;
                              local_d50 = local_d50 + lVar47;
                              iVar54 = iVar54 + 1;
                              iVar22 = iVar22 + 1;
                              local_d68 = local_d68 + lVar47;
                              local_db8 = local_db8 + lVar47;
                              bVar109 = lVar51 < iVar11;
                              lVar51 = lVar51 + 1;
                            } while (bVar109);
                          }
                          lVar78 = lVar78 + local_768.kstride * 8;
                          local_b08 = local_b08 + local_878.kstride * 8;
                          local_b20 = local_b20 + lVar26;
                          local_b58 = local_b58 + lVar26;
                          local_c98 = local_c98 + lVar26;
                          local_c90 = local_c90 + lVar26;
                          local_bd8 = local_bd8 + lVar26;
                          local_b50 = local_b50 + lVar26;
                          local_b18 = local_b18 + lVar26;
                          iVar56 = iVar56 + 1;
                          local_b48 = local_b48 + lVar26;
                          local_c28 = local_c28 + lVar26;
                          iVar58 = iVar58 + 1;
                          local_b40 = local_b40 + lVar26;
                          local_b10 = local_b10 + lVar26;
                          iVar21 = iVar21 + 1;
                          local_b38 = local_b38 + lVar26;
                          local_c18 = local_c18 + lVar26;
                          local_c10 = local_c10 + lVar26;
                          iVar57 = iVar57 + 1;
                          local_b30 = local_b30 + lVar26;
                          local_a18 = local_a18 + lVar26;
                          local_ab0 = local_ab0 + lVar26;
                          local_b28 = local_b28 + lVar26;
                          local_af0 = local_af0 + lVar26;
                          local_af8 = local_af8 + lVar26;
                          local_c08 = local_c08 + lVar26;
                          local_cf0 = local_cf0 + lVar26;
                          local_ab8 = local_ab8 + lVar26;
                          local_d48 = local_d48 + lVar26;
                          bVar109 = lVar88 < iVar13;
                          lVar88 = lVar88 + 1;
                        } while (bVar109);
                        dVar118 = dVar118 * 0.000244140625;
                      }
                      *(double *)
                       (CONCAT44(local_728._4_4_,local_728._0_4_) +
                        (local_b70 -
                        local_718.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_728._12_4_,local_728._8_4_) * 8 +
                        (lVar60 - (int)local_718.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8 +
                       (lVar24 - local_700) *
                       (long)local_718.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start * 8) = dVar118;
                      lVar60 = lVar60 + 1;
                      iVar23 = iVar23 + 4;
                      local_ce0 = local_ce0 + 4;
                    } while (local_6b8.jstride._4_4_ + 1 != (int)lVar60);
                  }
                  local_b70 = local_b70 + 1;
                  iVar45 = iVar45 + 4;
                } while ((uint)local_6b8.kstride + 1 != (int)local_b70);
              }
              lVar24 = lVar24 + 1;
              iVar59 = iVar59 + 4;
            } while (local_6b8.kstride._4_4_ + 1 != (int)lVar24);
          }
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_5b8,(FabArray<amrex::FArrayBox> *)*local_520,(MFIter *)local_518);
        if (iVar2 == 2) {
          lVar24 = (long)(int)local_6b8.jstride;
          if ((int)local_6b8.jstride <= local_6b8.kstride._4_4_) {
            local_5e0 = (ulong)local_6b8.jstride._4_4_;
            local_600 = (ulong)(uint)local_6b8.kstride;
            local_7c0 = (long)local_6b8.p._4_4_;
            local_7b8 = (long)(int)local_6b8.p;
            lVar79 = (long)iVar31;
            lVar64 = (long)iVar73;
            iVar59 = (int)local_6b8.jstride * 2 + -1;
            lVar80 = (long)iVar76;
            do {
              lVar65 = (long)iVar59;
              if (iVar59 < lVar80) {
                lVar65 = lVar80;
              }
              iVar46 = iVar59;
              if (iVar59 < iVar76) {
                iVar46 = iVar76;
              }
              if (local_6b8.p._4_4_ <= (int)(uint)local_6b8.kstride) {
                local_5e8 = (long)local_678.begin.y;
                local_5f0 = local_678.jstride;
                local_5f8 = local_678.p + (lVar24 * 2 - (long)local_678.begin.z) * local_678.kstride
                ;
                iVar84 = (int)(lVar24 * 2);
                iVar12 = iVar84 + -1;
                if (iVar84 + -1 <= iVar76) {
                  iVar12 = iVar76;
                }
                iVar13 = iVar84 + 1;
                if (iVar53 < iVar84 + 1) {
                  iVar13 = iVar53;
                }
                iVar19 = (int)lVar65 + 1;
                lVar104 = local_7c0;
                iVar45 = local_6b8.p._4_4_ * 2 + -1;
                do {
                  lVar60 = (long)iVar45;
                  if (iVar45 < lVar64) {
                    lVar60 = lVar64;
                  }
                  iVar42 = iVar45;
                  if (iVar45 < iVar73) {
                    iVar42 = iVar73;
                  }
                  if ((int)local_6b8.p <= (int)local_6b8.jstride._4_4_) {
                    iVar55 = (int)(lVar104 * 2);
                    iVar18 = iVar55 + -1;
                    if (iVar55 + -1 <= iVar73) {
                      iVar18 = iVar73;
                    }
                    iVar11 = iVar55 + 1;
                    if (iVar87 < iVar55 + 1) {
                      iVar11 = iVar87;
                    }
                    iVar20 = (int)lVar60 + 1;
                    lVar38 = local_7b8;
                    iVar23 = (int)local_6b8.p * 2 + -1;
                    local_ce4 = (int)local_6b8.p * 2;
                    do {
                      lVar88 = (long)iVar23;
                      if (iVar23 < lVar79) {
                        lVar88 = lVar79;
                      }
                      dVar118 = 0.0;
                      dVar133 = 0.0;
                      if ((local_5f8[(lVar104 * 2 - local_5e8) * local_678.jstride +
                                     (lVar38 * 2 - (long)local_678.begin.x)] != 0) &&
                         (dVar133 = dVar118, iVar12 <= iVar13)) {
                        lVar25 = lVar88 * 8;
                        uVar43 = (uint)(lVar38 * 2);
                        uVar32 = uVar43 | 1;
                        if ((int)uVar83 < (int)uVar32) {
                          uVar32 = uVar83;
                        }
                        iVar44 = uVar43 - 1;
                        if (iVar44 <= iVar31) {
                          iVar44 = iVar31;
                        }
                        lVar85 = local_5b8.kstride * 8;
                        lVar62 = (lVar65 - local_5b8.begin.z) * lVar85;
                        lVar102 = local_5b8.jstride * 8;
                        lVar63 = (lVar60 - local_5b8.begin.y) * lVar102;
                        lVar47 = ((lVar60 + -1) - (long)local_5b8.begin.y) * lVar102;
                        lVar61 = ((lVar65 + -1) - (long)local_5b8.begin.z) * lVar85;
                        lVar26 = (long)local_5b8.begin.x;
                        local_c90 = lVar62 + lVar63 + lVar25 + lVar26 * -8;
                        lVar78 = lVar62 + lVar47 + lVar25 + lVar26 * -8;
                        lVar97 = lVar63 + lVar61 + lVar25 + lVar26 * -8;
                        local_c28 = lVar61 + lVar47 + lVar25 + lVar26 * -8;
                        lVar89 = (long)local_838.begin.z;
                        lVar74 = CONCAT44(local_838.kstride._4_4_,(int)local_838.kstride);
                        lVar47 = lVar74 * 8;
                        lVar75 = ((lVar65 + -1) - lVar89) * lVar47;
                        lVar62 = (lVar65 - lVar89) * lVar47;
                        lVar50 = (long)local_838.begin.y;
                        lVar63 = CONCAT44(local_838.jstride._4_4_,(int)local_838.jstride);
                        lVar61 = lVar63 * 8;
                        lVar96 = ((lVar60 + -1) - lVar50) * lVar61;
                        lVar26 = lVar62 + lVar25;
                        lVar92 = (long)local_838.begin.x;
                        lVar95 = (lVar60 - lVar50) * lVar61;
                        local_ca0 = lVar95 + lVar25 + lVar75 + lVar92 * -8;
                        local_d48 = lVar75 + lVar96 + lVar25 + lVar92 * -8;
                        local_c98 = lVar26 + lVar96 + lVar92 * -8;
                        local_b28 = lVar95 + lVar75 + lVar25 + lVar92 * -8;
                        local_b20 = lVar96 + lVar25 + lVar62 + lVar92 * -8;
                        local_c20 = lVar75 + lVar25 + lVar92 * -8;
                        local_b38 = (long)local_5b8.p + local_c90 + -8;
                        local_c90 = local_c90 + (long)local_5b8.p;
                        local_b40 = (long)local_5b8.p + lVar78 + -8;
                        lVar78 = lVar78 + (long)local_5b8.p;
                        local_b48 = (long)local_5b8.p + lVar97 + -8;
                        lVar97 = lVar97 + (long)local_5b8.p;
                        local_b50 = (long)local_5b8.p + local_c28 + -8;
                        local_c28 = local_c28 + (long)local_5b8.p;
                        lVar94 = (lVar60 - local_768.begin.y) * local_768.jstride * 8 +
                                 (lVar65 - local_768.begin.z) * local_768.kstride * 8 + lVar25 +
                                 (long)local_768.begin.x * -8 + (long)local_768.p;
                        iVar56 = ((int)lVar88 - local_838.begin.x) + 1;
                        lVar93 = (lVar60 - local_878.begin.y) * local_878.jstride * 8 +
                                 (lVar65 - local_878.begin.z) * local_878.kstride * 8 + lVar25 +
                                 (long)local_878.begin.x * -8 + (long)local_878.p;
                        lVar62 = CONCAT44(local_838.p._4_4_,(int)local_838.p);
                        local_b30 = lVar26 + lVar95 + lVar92 * -8 + lVar62;
                        lVar75 = lVar95 + lVar25 + lVar92 * -8 + lVar62;
                        iVar57 = iVar19 - local_838.begin.z;
                        lVar51 = lVar96 + lVar25 + lVar92 * -8 + lVar62;
                        iVar58 = iVar19 - local_838.begin.z;
                        lVar25 = lVar25 + lVar92 * -8 + lVar62;
                        iVar69 = iVar19 - local_838.begin.z;
                        local_cf8 = lVar26 + lVar92 * -8 + lVar62;
                        iVar21 = iVar19 - local_838.begin.z;
                        local_ac0 = lVar62 + local_b20;
                        local_b20 = local_b20 + lVar62;
                        local_a30 = lVar62 + local_b28;
                        local_b28 = local_b28 + lVar62;
                        local_c50 = lVar62 + local_c20;
                        local_c20 = local_c20 + lVar62;
                        local_b68 = lVar62 + local_ca0;
                        local_ca0 = local_ca0 + lVar62;
                        local_a38 = lVar62 + local_d48;
                        local_d48 = local_d48 + lVar62;
                        local_a40 = lVar62 + local_c98;
                        local_c98 = local_c98 + lVar62;
                        lVar95 = (long)(int)local_7a8.p;
                        lVar98 = (long)(int)local_7a8.jstride._4_4_;
                        lVar49 = (long)local_7a8.p._4_4_;
                        lVar48 = (long)(int)local_7a8.kstride;
                        lVar96 = (long)(int)local_7a8.jstride;
                        lVar92 = (long)local_7a8.kstride._4_4_;
                        lVar26 = (long)iVar46;
                        local_bd0 = local_cf8;
                        local_a70 = local_b30;
                        local_a68 = local_b30;
                        local_a60 = local_b30;
                        local_a58 = local_b30;
                        local_a50 = local_b30;
                        local_a48 = local_b30;
                        local_998 = local_b30;
                        local_988 = local_cf8;
                        local_978 = local_cf8;
                        do {
                          if (iVar18 <= iVar11) {
                            local_c38 = lVar75 + iVar57 * lVar47;
                            local_df8 = iVar57 * lVar47 + lVar51;
                            local_c68 = lVar75 + iVar58 * lVar47;
                            local_da8 = lVar75 + iVar69 * lVar47;
                            local_db0 = lVar75 + iVar21 * lVar47;
                            local_de0 = iVar21 * lVar47 + lVar51;
                            iVar22 = iVar84 - (int)lVar26;
                            iVar52 = -iVar22;
                            if (iVar22 < 1) {
                              iVar52 = iVar22;
                            }
                            lVar71 = lVar26 + -1;
                            lVar27 = (lVar26 - lVar89) * lVar74;
                            lVar28 = ((lVar26 - lVar89) + -1) * lVar74;
                            iVar22 = (int)lVar26 + 1;
                            lVar35 = (iVar22 - local_838.begin.z) * lVar74;
                            lVar29 = (iVar22 - local_838.begin.z) * lVar74;
                            local_7d8 = (double *)(iVar69 * lVar47 + lVar25);
                            local_d88 = local_c28;
                            local_d60 = local_c98;
                            local_db8 = local_d48;
                            local_d68 = local_b30;
                            local_d50 = local_ca0;
                            local_d58 = local_a48;
                            local_ba8 = local_b28;
                            local_dc8 = local_b20;
                            local_bb8 = local_a50;
                            local_d98 = local_a58;
                            local_a98 = local_a60;
                            local_9e8 = local_ac0;
                            local_d30 = local_a68;
                            local_d08 = local_c90;
                            local_d10 = local_a70;
                            local_d38 = local_a30;
                            local_d40 = local_a40;
                            local_d18 = local_a38;
                            local_cb0 = local_998;
                            local_c40 = local_b68;
                            local_bf0 = local_b50;
                            local_cb8 = local_b48;
                            local_cc0 = local_b40;
                            local_c80 = local_b38;
                            lVar40 = (long)iVar42;
                            iVar22 = iVar20 - local_838.begin.y;
                            iVar54 = iVar20 - local_838.begin.y;
                            iVar107 = iVar20 - local_838.begin.y;
                            iVar101 = iVar20 - local_838.begin.y;
                            local_de8 = lVar93;
                            local_dd0 = lVar94;
                            local_d78 = lVar97;
                            local_d00 = lVar78;
                            do {
                              if (iVar44 <= (int)uVar32) {
                                lVar81 = iVar58 * lVar47 + lVar25 + iVar107 * lVar61;
                                lVar90 = iVar107 * lVar61 + local_988;
                                lVar36 = local_c20 + iVar22 * lVar61;
                                lVar82 = iVar22 * lVar61 + local_cf8;
                                iVar33 = iVar55 - (int)lVar40;
                                iVar77 = -iVar33;
                                if (iVar33 < 1) {
                                  iVar77 = iVar33;
                                }
                                lVar66 = lVar40 + -1;
                                lVar72 = lVar62 + (lVar40 - lVar50) * lVar63 * 8;
                                lVar108 = lVar62 + ((lVar40 - lVar50) + -1) * lVar63 * 8;
                                iVar34 = (int)lVar40 + 1;
                                lVar103 = 0;
                                iVar33 = local_ce4 - (int)lVar88;
                                do {
                                  lVar37 = lVar88 + lVar103;
                                  iVar14 = -iVar33;
                                  if (iVar33 < 1) {
                                    iVar14 = iVar33;
                                  }
                                  if (((((lVar79 < lVar37) && (lVar37 < (int)uVar83)) &&
                                       (lVar64 < lVar40)) &&
                                      ((lVar40 < iVar87 && (lVar80 < lVar26)))) && (lVar26 < iVar53)
                                     ) {
                                    dVar133 = *(double *)(local_dd0 + lVar103 * 8) -
                                              *(double *)(local_de8 + lVar103 * 8);
                                  }
                                  else {
                                    lVar86 = lVar88 + lVar103 + -1;
                                    dVar133 = 0.0;
                                    if (((lVar95 < lVar37) && (lVar86 <= lVar98)) &&
                                       ((lVar49 < lVar40 &&
                                        (((lVar66 <= lVar48 && (lVar96 < lVar26)) &&
                                         (lVar71 <= lVar92)))))) {
                                      dVar133 = *(double *)(local_cb0 + -8 + lVar103 * 8);
                                      dVar146 = *(double *)(local_cb0 + lVar103 * 8);
                                      dVar121 = *(double *)(local_d40 + -8 + lVar103 * 8);
                                      dVar122 = *(double *)(local_c40 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_d18 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(local_d40 + lVar103 * 8);
                                      dVar125 = *(double *)(local_c40 + lVar103 * 8);
                                      dVar126 = *(double *)(local_d18 + lVar103 * 8);
                                      dVar133 = (((dVar123 - dVar121) +
                                                 (dVar126 - dVar124) + (dVar126 - dVar124) +
                                                 (dVar125 - dVar146) * 4.0 +
                                                 (dVar122 - dVar133) + (dVar122 - dVar133)) *
                                                 local_608 +
                                                ((dVar123 - dVar126) +
                                                (dVar122 - dVar125) + (dVar122 - dVar125) +
                                                (dVar133 - dVar146) * 4.0 +
                                                (dVar121 - dVar124) + (dVar121 - dVar124)) *
                                                local_610 +
                                                ((dVar123 - dVar122) +
                                                (dVar126 - dVar125) + (dVar126 - dVar125) +
                                                (dVar124 - dVar146) * 4.0 +
                                                (dVar121 - dVar133) + (dVar121 - dVar133)) *
                                                local_618) * *(double *)(local_bf0 + lVar103 * 8) +
                                                0.0;
                                    }
                                    iVar100 = (int)lVar103;
                                    if ((((lVar95 <= lVar37) && (lVar37 <= lVar98)) &&
                                        ((lVar49 < lVar40 &&
                                         ((lVar66 <= lVar48 && (lVar96 < lVar26)))))) &&
                                       (lVar71 <= lVar92)) {
                                      lVar91 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar91 + lVar27 * 8);
                                      dVar121 = *(double *)(local_d68 + lVar103 * 8);
                                      lVar99 = lVar108 + (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar99 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar91 + lVar28 * 8);
                                      dVar124 = *(double *)(lVar99 + lVar28 * 8);
                                      dVar125 = *(double *)(local_d60 + lVar103 * 8);
                                      dVar126 = *(double *)(local_d50 + lVar103 * 8);
                                      dVar110 = *(double *)(local_db8 + lVar103 * 8);
                                      dVar133 = dVar133 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d88 + lVar103 * 8);
                                    }
                                    if ((((lVar95 < lVar37) && (lVar86 <= lVar98)) &&
                                        (lVar49 <= lVar40)) &&
                                       (((lVar40 <= lVar48 && (lVar96 < lVar26)) &&
                                        (lVar71 <= lVar92)))) {
                                      dVar146 = *(double *)(local_d10 + -8 + lVar103 * 8);
                                      dVar121 = *(double *)(local_d10 + lVar103 * 8);
                                      dVar122 = *(double *)(lVar82 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_d38 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(lVar36 + -8 + lVar103 * 8);
                                      dVar125 = *(double *)(lVar82 + lVar103 * 8);
                                      dVar126 = *(double *)(local_d38 + lVar103 * 8);
                                      dVar110 = *(double *)(lVar36 + lVar103 * 8);
                                      dVar133 = dVar133 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_cb8 + lVar103 * 8);
                                    }
                                    if (((lVar95 <= lVar37) && (lVar37 <= lVar98)) &&
                                       ((lVar49 <= lVar40 &&
                                        (((lVar40 <= lVar48 && (lVar96 < lVar26)) &&
                                         (lVar71 <= lVar92)))))) {
                                      lVar91 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar91 + lVar27 * 8);
                                      dVar121 = *(double *)(local_d58 + lVar103 * 8);
                                      lVar99 = lVar62 + (iVar34 - local_838.begin.y) * lVar63 * 8 +
                                               (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar99 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar91 + lVar28 * 8);
                                      dVar124 = *(double *)(lVar99 + lVar28 * 8);
                                      dVar125 = *(double *)
                                                 (iVar54 * lVar61 + local_978 + lVar103 * 8);
                                      dVar126 = *(double *)(local_ba8 + lVar103 * 8);
                                      dVar110 = *(double *)
                                                 (local_c50 + iVar54 * lVar61 + lVar103 * 8);
                                      dVar133 = dVar133 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d78 + lVar103 * 8);
                                    }
                                    if (((lVar95 < lVar37) && (lVar86 <= lVar98)) &&
                                       (((lVar49 < lVar40 &&
                                         ((lVar66 <= lVar48 && (lVar96 <= lVar26)))) &&
                                        (lVar26 <= lVar92)))) {
                                      dVar146 = *(double *)(local_d30 + -8 + lVar103 * 8);
                                      dVar121 = *(double *)(local_d30 + lVar103 * 8);
                                      dVar122 = *(double *)(local_9e8 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_c38 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(local_df8 + -8 + lVar103 * 8);
                                      dVar125 = *(double *)(local_9e8 + lVar103 * 8);
                                      dVar126 = *(double *)(local_c38 + lVar103 * 8);
                                      dVar110 = *(double *)(local_df8 + lVar103 * 8);
                                      dVar133 = dVar133 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_cc0 + lVar103 * 8);
                                    }
                                    if (((((lVar95 <= lVar37) && (lVar37 <= lVar98)) &&
                                         (lVar49 < lVar40)) &&
                                        ((lVar66 <= lVar48 && (lVar96 <= lVar26)))) &&
                                       (lVar26 <= lVar92)) {
                                      lVar91 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar91 + lVar27 * 8);
                                      dVar121 = *(double *)(local_bb8 + lVar103 * 8);
                                      lVar99 = lVar108 + (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar99 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar91 + lVar35 * 8);
                                      dVar124 = *(double *)(lVar99 + lVar35 * 8);
                                      dVar125 = *(double *)(local_dc8 + lVar103 * 8);
                                      dVar126 = *(double *)(local_db0 + lVar103 * 8);
                                      dVar110 = *(double *)(local_de0 + lVar103 * 8);
                                      dVar133 = dVar133 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d00 + lVar103 * 8);
                                    }
                                    if (((lVar95 < lVar37) && (lVar86 <= lVar98)) &&
                                       ((lVar49 <= lVar40 &&
                                        (((lVar40 <= lVar48 && (lVar96 <= lVar26)) &&
                                         (lVar26 <= lVar92)))))) {
                                      dVar146 = *(double *)(local_a98 + -8 + lVar103 * 8);
                                      dVar121 = *(double *)(local_a98 + lVar103 * 8);
                                      dVar122 = *(double *)(lVar90 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_c68 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(lVar81 + -8 + lVar103 * 8);
                                      dVar125 = *(double *)(lVar90 + lVar103 * 8);
                                      dVar126 = *(double *)(local_c68 + lVar103 * 8);
                                      dVar110 = *(double *)(lVar81 + lVar103 * 8);
                                      dVar133 = dVar133 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_c80 + lVar103 * 8);
                                    }
                                    if (((lVar95 <= lVar37) && (lVar37 <= lVar98)) &&
                                       (((lVar49 <= lVar40 &&
                                         ((lVar40 <= lVar48 && (lVar96 <= lVar26)))) &&
                                        (lVar26 <= lVar92)))) {
                                      lVar37 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar37 + lVar27 * 8);
                                      dVar121 = *(double *)(local_d98 + lVar103 * 8);
                                      lVar86 = lVar62 + (iVar34 - local_838.begin.y) * lVar63 * 8 +
                                               (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar86 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar37 + lVar29 * 8);
                                      dVar124 = *(double *)(lVar86 + lVar29 * 8);
                                      dVar125 = *(double *)
                                                 (iVar101 * lVar61 + local_bd0 + lVar103 * 8);
                                      dVar126 = *(double *)(local_da8 + lVar103 * 8);
                                      dVar110 = *(double *)
                                                 ((long)local_7d8 + lVar103 * 8 + iVar101 * lVar61);
                                      dVar133 = dVar133 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d08 + lVar103 * 8);
                                    }
                                  }
                                  dVar118 = dVar118 + (double)((iVar14 + 2) *
                                                              (iVar77 + 2) * (iVar52 + 2)) * dVar133
                                  ;
                                  lVar37 = lVar88 + lVar103;
                                  lVar103 = lVar103 + 1;
                                  iVar33 = iVar33 + -1;
                                } while (lVar37 < (int)uVar32);
                              }
                              local_dd0 = local_dd0 + local_768.jstride * 8;
                              local_de8 = local_de8 + local_878.jstride * 8;
                              local_c80 = local_c80 + lVar102;
                              local_cc0 = local_cc0 + lVar102;
                              local_cb8 = local_cb8 + lVar102;
                              local_bf0 = local_bf0 + lVar102;
                              local_c40 = local_c40 + lVar61;
                              local_cb0 = local_cb0 + lVar61;
                              local_d18 = local_d18 + lVar61;
                              local_d40 = local_d40 + lVar61;
                              local_d38 = local_d38 + lVar61;
                              local_d10 = local_d10 + lVar61;
                              local_d08 = local_d08 + lVar102;
                              local_d00 = local_d00 + lVar102;
                              local_c38 = local_c38 + lVar61;
                              local_d30 = local_d30 + lVar61;
                              local_df8 = local_df8 + lVar61;
                              local_9e8 = local_9e8 + lVar61;
                              local_c68 = local_c68 + lVar61;
                              local_a98 = local_a98 + lVar61;
                              iVar107 = iVar107 + 1;
                              local_d78 = local_d78 + lVar102;
                              local_da8 = local_da8 + lVar61;
                              local_d98 = local_d98 + lVar61;
                              iVar101 = iVar101 + 1;
                              local_db0 = local_db0 + lVar61;
                              local_bb8 = local_bb8 + lVar61;
                              local_de0 = local_de0 + lVar61;
                              local_dc8 = local_dc8 + lVar61;
                              local_ba8 = local_ba8 + lVar61;
                              local_d58 = local_d58 + lVar61;
                              iVar54 = iVar54 + 1;
                              iVar22 = iVar22 + 1;
                              local_d50 = local_d50 + lVar61;
                              local_d68 = local_d68 + lVar61;
                              local_db8 = local_db8 + lVar61;
                              local_d60 = local_d60 + lVar61;
                              local_d88 = local_d88 + lVar102;
                              bVar109 = lVar40 < iVar11;
                              lVar40 = lVar40 + 1;
                            } while (bVar109);
                          }
                          lVar94 = lVar94 + local_768.kstride * 8;
                          lVar93 = lVar93 + local_878.kstride * 8;
                          local_b38 = local_b38 + lVar85;
                          local_b40 = local_b40 + lVar85;
                          local_b48 = local_b48 + lVar85;
                          local_b50 = local_b50 + lVar85;
                          local_b68 = local_b68 + lVar47;
                          local_998 = local_998 + lVar47;
                          local_a38 = local_a38 + lVar47;
                          local_a40 = local_a40 + lVar47;
                          local_a30 = local_a30 + lVar47;
                          local_a70 = local_a70 + lVar47;
                          local_c90 = local_c90 + lVar85;
                          lVar78 = lVar78 + lVar85;
                          iVar57 = iVar57 + 1;
                          local_a68 = local_a68 + lVar47;
                          local_ac0 = local_ac0 + lVar47;
                          iVar58 = iVar58 + 1;
                          local_a60 = local_a60 + lVar47;
                          lVar97 = lVar97 + lVar85;
                          iVar69 = iVar69 + 1;
                          local_a58 = local_a58 + lVar47;
                          local_bd0 = local_bd0 + lVar47;
                          local_988 = local_988 + lVar47;
                          iVar21 = iVar21 + 1;
                          local_a50 = local_a50 + lVar47;
                          local_b20 = local_b20 + lVar47;
                          local_b28 = local_b28 + lVar47;
                          local_a48 = local_a48 + lVar47;
                          local_c50 = local_c50 + lVar47;
                          local_978 = local_978 + lVar47;
                          local_c20 = local_c20 + lVar47;
                          local_cf8 = local_cf8 + lVar47;
                          local_ca0 = local_ca0 + lVar47;
                          local_b30 = local_b30 + lVar47;
                          local_d48 = local_d48 + lVar47;
                          local_c98 = local_c98 + lVar47;
                          local_c28 = local_c28 + lVar85;
                          bVar109 = lVar26 < iVar13;
                          lVar26 = lVar26 + 1;
                        } while (bVar109);
                        dVar133 = dVar118 * 0.015625;
                      }
                      *(double *)
                       (CONCAT44(local_728._4_4_,local_728._0_4_) +
                        (lVar104 -
                        local_718.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_728._12_4_,local_728._8_4_) * 8 +
                        (lVar38 - (int)local_718.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8 +
                       (lVar24 - local_700) *
                       (long)local_718.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start * 8) = dVar133;
                      lVar38 = lVar38 + 1;
                      iVar23 = iVar23 + 2;
                      local_ce4 = local_ce4 + 2;
                    } while (local_6b8.jstride._4_4_ + 1 != (int)lVar38);
                  }
                  lVar104 = lVar104 + 1;
                  iVar45 = iVar45 + 2;
                } while ((uint)local_6b8.kstride + 1 != (int)lVar104);
              }
              lVar24 = lVar24 + 1;
              iVar59 = iVar59 + 2;
            } while (local_6b8.kstride._4_4_ + 1 != (int)lVar24);
          }
        }
        else {
          lVar24 = (long)(int)local_6b8.jstride;
          if ((int)local_6b8.jstride <= local_6b8.kstride._4_4_) {
            local_5e0 = (ulong)local_6b8.jstride._4_4_;
            local_600 = (ulong)(uint)local_6b8.kstride;
            local_7c0 = (long)local_6b8.p._4_4_;
            local_7b8 = (long)(int)local_6b8.p;
            lVar79 = (long)iVar31;
            lVar64 = (long)iVar73;
            iVar59 = (int)local_6b8.jstride * 4 + -3;
            lVar80 = (long)iVar76;
            do {
              lVar65 = (long)iVar59;
              if (iVar59 < lVar80) {
                lVar65 = lVar80;
              }
              iVar46 = iVar59;
              if (iVar59 < iVar76) {
                iVar46 = iVar76;
              }
              if (local_6b8.p._4_4_ <= (int)(uint)local_6b8.kstride) {
                local_5e8 = (long)local_678.begin.y;
                local_5f0 = local_678.jstride;
                local_5f8 = local_678.p + (lVar24 * 4 - (long)local_678.begin.z) * local_678.kstride
                ;
                iVar84 = (int)(lVar24 * 4);
                iVar12 = iVar84 + -3;
                if (iVar84 + -3 <= iVar76) {
                  iVar12 = iVar76;
                }
                iVar13 = iVar84 + 3;
                if (iVar53 < iVar84 + 3) {
                  iVar13 = iVar53;
                }
                iVar19 = (int)lVar65 + 1;
                lVar104 = local_7c0;
                iVar45 = local_6b8.p._4_4_ * 4 + -3;
                do {
                  lVar60 = (long)iVar45;
                  if (iVar45 < lVar64) {
                    lVar60 = lVar64;
                  }
                  iVar42 = iVar45;
                  if (iVar45 < iVar73) {
                    iVar42 = iVar73;
                  }
                  if ((int)local_6b8.p <= (int)local_6b8.jstride._4_4_) {
                    iVar55 = (int)(lVar104 * 4);
                    iVar18 = iVar55 + -3;
                    if (iVar55 + -3 <= iVar73) {
                      iVar18 = iVar73;
                    }
                    iVar11 = iVar55 + 3;
                    if (iVar87 < iVar55 + 3) {
                      iVar11 = iVar87;
                    }
                    iVar20 = (int)lVar60 + 1;
                    lVar38 = local_7b8;
                    iVar23 = (int)local_6b8.p * 4 + -3;
                    local_ce4 = (int)local_6b8.p * 4;
                    do {
                      lVar88 = (long)iVar23;
                      if (iVar23 < lVar79) {
                        lVar88 = lVar79;
                      }
                      dVar133 = 0.0;
                      if ((local_5f8[(lVar104 * 4 - local_5e8) * local_678.jstride +
                                     (lVar38 * 4 - (long)local_678.begin.x)] != 0) &&
                         (iVar12 <= iVar13)) {
                        lVar25 = lVar88 * 8;
                        uVar43 = (uint)(lVar38 * 4);
                        uVar32 = uVar43 | 3;
                        if ((int)uVar83 < (int)uVar32) {
                          uVar32 = uVar83;
                        }
                        iVar44 = uVar43 - 3;
                        if (iVar44 <= iVar31) {
                          iVar44 = iVar31;
                        }
                        lVar85 = local_5b8.kstride * 8;
                        lVar62 = (lVar65 - local_5b8.begin.z) * lVar85;
                        lVar102 = local_5b8.jstride * 8;
                        lVar63 = (lVar60 - local_5b8.begin.y) * lVar102;
                        lVar47 = ((lVar60 + -1) - (long)local_5b8.begin.y) * lVar102;
                        lVar61 = ((lVar65 + -1) - (long)local_5b8.begin.z) * lVar85;
                        lVar26 = (long)local_5b8.begin.x;
                        local_c90 = lVar62 + lVar63 + lVar25 + lVar26 * -8;
                        lVar78 = lVar62 + lVar47 + lVar25 + lVar26 * -8;
                        lVar97 = lVar63 + lVar61 + lVar25 + lVar26 * -8;
                        local_c28 = lVar61 + lVar47 + lVar25 + lVar26 * -8;
                        lVar89 = (long)local_838.begin.z;
                        lVar74 = CONCAT44(local_838.kstride._4_4_,(int)local_838.kstride);
                        lVar47 = lVar74 * 8;
                        lVar75 = ((lVar65 + -1) - lVar89) * lVar47;
                        lVar62 = (lVar65 - lVar89) * lVar47;
                        lVar50 = (long)local_838.begin.y;
                        lVar63 = CONCAT44(local_838.jstride._4_4_,(int)local_838.jstride);
                        lVar61 = lVar63 * 8;
                        lVar96 = ((lVar60 + -1) - lVar50) * lVar61;
                        lVar26 = lVar62 + lVar25;
                        lVar92 = (long)local_838.begin.x;
                        lVar95 = (lVar60 - lVar50) * lVar61;
                        local_ca0 = lVar95 + lVar25 + lVar75 + lVar92 * -8;
                        local_d48 = lVar75 + lVar96 + lVar25 + lVar92 * -8;
                        local_c98 = lVar26 + lVar96 + lVar92 * -8;
                        local_b28 = lVar95 + lVar75 + lVar25 + lVar92 * -8;
                        local_b20 = lVar96 + lVar25 + lVar62 + lVar92 * -8;
                        local_c20 = lVar75 + lVar25 + lVar92 * -8;
                        local_b38 = (long)local_5b8.p + local_c90 + -8;
                        local_c90 = local_c90 + (long)local_5b8.p;
                        local_b40 = (long)local_5b8.p + lVar78 + -8;
                        lVar78 = lVar78 + (long)local_5b8.p;
                        local_b48 = (long)local_5b8.p + lVar97 + -8;
                        lVar97 = lVar97 + (long)local_5b8.p;
                        local_b50 = (long)local_5b8.p + local_c28 + -8;
                        local_c28 = local_c28 + (long)local_5b8.p;
                        lVar94 = (lVar60 - local_768.begin.y) * local_768.jstride * 8 +
                                 (lVar65 - local_768.begin.z) * local_768.kstride * 8 + lVar25 +
                                 (long)local_768.begin.x * -8 + (long)local_768.p;
                        iVar56 = ((int)lVar88 - local_838.begin.x) + 1;
                        lVar93 = (lVar60 - local_878.begin.y) * local_878.jstride * 8 +
                                 (lVar65 - local_878.begin.z) * local_878.kstride * 8 + lVar25 +
                                 (long)local_878.begin.x * -8 + (long)local_878.p;
                        lVar62 = CONCAT44(local_838.p._4_4_,(int)local_838.p);
                        local_b30 = lVar26 + lVar95 + lVar92 * -8 + lVar62;
                        lVar75 = lVar95 + lVar25 + lVar92 * -8 + lVar62;
                        iVar57 = iVar19 - local_838.begin.z;
                        lVar51 = lVar96 + lVar25 + lVar92 * -8 + lVar62;
                        iVar58 = iVar19 - local_838.begin.z;
                        lVar25 = lVar25 + lVar92 * -8 + lVar62;
                        iVar69 = iVar19 - local_838.begin.z;
                        local_cf8 = lVar26 + lVar92 * -8 + lVar62;
                        iVar21 = iVar19 - local_838.begin.z;
                        local_ac0 = lVar62 + local_b20;
                        local_b20 = local_b20 + lVar62;
                        local_a30 = lVar62 + local_b28;
                        local_b28 = local_b28 + lVar62;
                        local_c50 = lVar62 + local_c20;
                        local_c20 = local_c20 + lVar62;
                        local_b68 = lVar62 + local_ca0;
                        local_ca0 = local_ca0 + lVar62;
                        local_a38 = lVar62 + local_d48;
                        local_d48 = local_d48 + lVar62;
                        local_a40 = lVar62 + local_c98;
                        local_c98 = local_c98 + lVar62;
                        lVar96 = (long)(int)local_7a8.p;
                        lVar98 = (long)(int)local_7a8.jstride._4_4_;
                        lVar49 = (long)local_7a8.p._4_4_;
                        lVar48 = (long)(int)local_7a8.kstride;
                        lVar92 = (long)(int)local_7a8.jstride;
                        lVar95 = (long)local_7a8.kstride._4_4_;
                        lVar26 = (long)iVar46;
                        local_bd0 = local_cf8;
                        local_a70 = local_b30;
                        local_a68 = local_b30;
                        local_a60 = local_b30;
                        local_a58 = local_b30;
                        local_a50 = local_b30;
                        local_a48 = local_b30;
                        local_998 = local_b30;
                        local_988 = local_cf8;
                        local_978 = local_cf8;
                        do {
                          if (iVar18 <= iVar11) {
                            local_c38 = lVar75 + iVar57 * lVar47;
                            local_df8 = iVar57 * lVar47 + lVar51;
                            local_c68 = lVar75 + iVar58 * lVar47;
                            local_da8 = lVar75 + iVar69 * lVar47;
                            local_db0 = lVar75 + iVar21 * lVar47;
                            local_de0 = iVar21 * lVar47 + lVar51;
                            iVar22 = iVar84 - (int)lVar26;
                            iVar52 = -iVar22;
                            if (iVar22 < 1) {
                              iVar52 = iVar22;
                            }
                            lVar71 = lVar26 + -1;
                            lVar27 = (lVar26 - lVar89) * lVar74;
                            lVar28 = ((lVar26 - lVar89) + -1) * lVar74;
                            iVar22 = (int)lVar26 + 1;
                            lVar35 = (iVar22 - local_838.begin.z) * lVar74;
                            lVar29 = (iVar22 - local_838.begin.z) * lVar74;
                            local_7d8 = (double *)(iVar69 * lVar47 + lVar25);
                            local_d88 = local_c28;
                            local_d60 = local_c98;
                            local_db8 = local_d48;
                            local_d68 = local_b30;
                            local_d50 = local_ca0;
                            local_d58 = local_a48;
                            local_ba8 = local_b28;
                            local_dc8 = local_b20;
                            local_bb8 = local_a50;
                            local_d98 = local_a58;
                            local_a98 = local_a60;
                            local_9e8 = local_ac0;
                            local_d30 = local_a68;
                            local_d08 = local_c90;
                            local_d10 = local_a70;
                            local_d38 = local_a30;
                            local_d40 = local_a40;
                            local_d18 = local_a38;
                            local_cb0 = local_998;
                            local_c40 = local_b68;
                            local_bf0 = local_b50;
                            local_cb8 = local_b48;
                            local_cc0 = local_b40;
                            local_c80 = local_b38;
                            lVar40 = (long)iVar42;
                            iVar22 = iVar20 - local_838.begin.y;
                            iVar54 = iVar20 - local_838.begin.y;
                            iVar107 = iVar20 - local_838.begin.y;
                            iVar101 = iVar20 - local_838.begin.y;
                            local_de8 = lVar93;
                            local_dd0 = lVar94;
                            local_d78 = lVar97;
                            local_d00 = lVar78;
                            do {
                              if (iVar44 <= (int)uVar32) {
                                lVar81 = iVar58 * lVar47 + lVar25 + iVar101 * lVar61;
                                lVar90 = iVar101 * lVar61 + local_988;
                                lVar36 = local_c20 + iVar22 * lVar61;
                                lVar82 = iVar22 * lVar61 + local_cf8;
                                iVar33 = iVar55 - (int)lVar40;
                                iVar77 = -iVar33;
                                if (iVar33 < 1) {
                                  iVar77 = iVar33;
                                }
                                lVar66 = lVar40 + -1;
                                lVar72 = lVar62 + (lVar40 - lVar50) * lVar63 * 8;
                                lVar108 = lVar62 + ((lVar40 - lVar50) + -1) * lVar63 * 8;
                                iVar34 = (int)lVar40 + 1;
                                lVar103 = 0;
                                iVar33 = local_ce4 - (int)lVar88;
                                do {
                                  lVar37 = lVar88 + lVar103;
                                  iVar14 = -iVar33;
                                  if (iVar33 < 1) {
                                    iVar14 = iVar33;
                                  }
                                  if ((((lVar79 < lVar37) && (lVar37 < (int)uVar83)) &&
                                      (lVar64 < lVar40)) &&
                                     (((lVar40 < iVar87 && (lVar80 < lVar26)) && (lVar26 < iVar53)))
                                     ) {
                                    dVar118 = *(double *)(local_dd0 + lVar103 * 8) -
                                              *(double *)(local_de8 + lVar103 * 8);
                                  }
                                  else {
                                    lVar86 = lVar88 + lVar103 + -1;
                                    dVar118 = 0.0;
                                    if (((lVar96 < lVar37) && (lVar86 <= lVar98)) &&
                                       ((lVar49 < lVar40 &&
                                        (((lVar66 <= lVar48 && (lVar92 < lVar26)) &&
                                         (lVar71 <= lVar95)))))) {
                                      dVar118 = *(double *)(local_cb0 + -8 + lVar103 * 8);
                                      dVar146 = *(double *)(local_cb0 + lVar103 * 8);
                                      dVar121 = *(double *)(local_d40 + -8 + lVar103 * 8);
                                      dVar122 = *(double *)(local_c40 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_d18 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(local_d40 + lVar103 * 8);
                                      dVar125 = *(double *)(local_c40 + lVar103 * 8);
                                      dVar126 = *(double *)(local_d18 + lVar103 * 8);
                                      dVar118 = (((dVar123 - dVar121) +
                                                 (dVar126 - dVar124) + (dVar126 - dVar124) +
                                                 (dVar125 - dVar146) * 4.0 +
                                                 (dVar122 - dVar118) + (dVar122 - dVar118)) *
                                                 local_608 +
                                                ((dVar123 - dVar126) +
                                                (dVar122 - dVar125) + (dVar122 - dVar125) +
                                                (dVar118 - dVar146) * 4.0 +
                                                (dVar121 - dVar124) + (dVar121 - dVar124)) *
                                                local_610 +
                                                ((dVar123 - dVar122) +
                                                (dVar126 - dVar125) + (dVar126 - dVar125) +
                                                (dVar124 - dVar146) * 4.0 +
                                                (dVar121 - dVar118) + (dVar121 - dVar118)) *
                                                local_618) * *(double *)(local_bf0 + lVar103 * 8) +
                                                0.0;
                                    }
                                    iVar100 = (int)lVar103;
                                    if (((lVar96 <= lVar37) && (lVar37 <= lVar98)) &&
                                       (((lVar49 < lVar40 &&
                                         ((lVar66 <= lVar48 && (lVar92 < lVar26)))) &&
                                        (lVar71 <= lVar95)))) {
                                      lVar91 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar91 + lVar27 * 8);
                                      dVar121 = *(double *)(local_d68 + lVar103 * 8);
                                      lVar99 = lVar108 + (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar99 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar91 + lVar28 * 8);
                                      dVar124 = *(double *)(lVar99 + lVar28 * 8);
                                      dVar125 = *(double *)(local_d60 + lVar103 * 8);
                                      dVar126 = *(double *)(local_d50 + lVar103 * 8);
                                      dVar110 = *(double *)(local_db8 + lVar103 * 8);
                                      dVar118 = dVar118 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d88 + lVar103 * 8);
                                    }
                                    if (((((lVar96 < lVar37) && (lVar86 <= lVar98)) &&
                                         (lVar49 <= lVar40)) &&
                                        ((lVar40 <= lVar48 && (lVar92 < lVar26)))) &&
                                       (lVar71 <= lVar95)) {
                                      dVar146 = *(double *)(local_d10 + -8 + lVar103 * 8);
                                      dVar121 = *(double *)(local_d10 + lVar103 * 8);
                                      dVar122 = *(double *)(lVar82 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_d38 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(lVar36 + -8 + lVar103 * 8);
                                      dVar125 = *(double *)(lVar82 + lVar103 * 8);
                                      dVar126 = *(double *)(local_d38 + lVar103 * 8);
                                      dVar110 = *(double *)(lVar36 + lVar103 * 8);
                                      dVar118 = dVar118 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_cb8 + lVar103 * 8);
                                    }
                                    if (((lVar96 <= lVar37) && (lVar37 <= lVar98)) &&
                                       ((lVar49 <= lVar40 &&
                                        (((lVar40 <= lVar48 && (lVar92 < lVar26)) &&
                                         (lVar71 <= lVar95)))))) {
                                      lVar91 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar91 + lVar27 * 8);
                                      dVar121 = *(double *)(local_d58 + lVar103 * 8);
                                      lVar99 = lVar62 + (iVar34 - local_838.begin.y) * lVar63 * 8 +
                                               (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar99 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar91 + lVar28 * 8);
                                      dVar124 = *(double *)(lVar99 + lVar28 * 8);
                                      dVar125 = *(double *)
                                                 (iVar54 * lVar61 + local_978 + lVar103 * 8);
                                      dVar126 = *(double *)(local_ba8 + lVar103 * 8);
                                      dVar110 = *(double *)
                                                 (local_c50 + iVar54 * lVar61 + lVar103 * 8);
                                      dVar118 = dVar118 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d78 + lVar103 * 8);
                                    }
                                    if ((((lVar96 < lVar37) && (lVar86 <= lVar98)) &&
                                        ((lVar49 < lVar40 &&
                                         ((lVar66 <= lVar48 && (lVar92 <= lVar26)))))) &&
                                       (lVar26 <= lVar95)) {
                                      dVar146 = *(double *)(local_d30 + -8 + lVar103 * 8);
                                      dVar121 = *(double *)(local_d30 + lVar103 * 8);
                                      dVar122 = *(double *)(local_9e8 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_c38 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(local_df8 + -8 + lVar103 * 8);
                                      dVar125 = *(double *)(local_9e8 + lVar103 * 8);
                                      dVar126 = *(double *)(local_c38 + lVar103 * 8);
                                      dVar110 = *(double *)(local_df8 + lVar103 * 8);
                                      dVar118 = dVar118 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_cc0 + lVar103 * 8);
                                    }
                                    if ((((lVar96 <= lVar37) && (lVar37 <= lVar98)) &&
                                        (lVar49 < lVar40)) &&
                                       (((lVar66 <= lVar48 && (lVar92 <= lVar26)) &&
                                        (lVar26 <= lVar95)))) {
                                      lVar91 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar91 + lVar27 * 8);
                                      dVar121 = *(double *)(local_bb8 + lVar103 * 8);
                                      lVar99 = lVar108 + (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar99 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar91 + lVar35 * 8);
                                      dVar124 = *(double *)(lVar99 + lVar35 * 8);
                                      dVar125 = *(double *)(local_dc8 + lVar103 * 8);
                                      dVar126 = *(double *)(local_db0 + lVar103 * 8);
                                      dVar110 = *(double *)(local_de0 + lVar103 * 8);
                                      dVar118 = dVar118 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d00 + lVar103 * 8);
                                    }
                                    if (((lVar96 < lVar37) && (lVar86 <= lVar98)) &&
                                       ((lVar49 <= lVar40 &&
                                        (((lVar40 <= lVar48 && (lVar92 <= lVar26)) &&
                                         (lVar26 <= lVar95)))))) {
                                      dVar146 = *(double *)(local_a98 + -8 + lVar103 * 8);
                                      dVar121 = *(double *)(local_a98 + lVar103 * 8);
                                      dVar122 = *(double *)(lVar90 + -8 + lVar103 * 8);
                                      dVar123 = *(double *)(local_c68 + -8 + lVar103 * 8);
                                      dVar124 = *(double *)(lVar81 + -8 + lVar103 * 8);
                                      dVar125 = *(double *)(lVar90 + lVar103 * 8);
                                      dVar126 = *(double *)(local_c68 + lVar103 * 8);
                                      dVar110 = *(double *)(lVar81 + lVar103 * 8);
                                      dVar118 = dVar118 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_c80 + lVar103 * 8);
                                    }
                                    if (((lVar96 <= lVar37) && (lVar37 <= lVar98)) &&
                                       (((lVar49 <= lVar40 &&
                                         ((lVar40 <= lVar48 && (lVar92 <= lVar26)))) &&
                                        (lVar26 <= lVar95)))) {
                                      lVar37 = lVar72 + (long)(iVar56 + iVar100) * 8;
                                      dVar146 = *(double *)(lVar37 + lVar27 * 8);
                                      dVar121 = *(double *)(local_d98 + lVar103 * 8);
                                      lVar86 = lVar62 + (iVar34 - local_838.begin.y) * lVar63 * 8 +
                                               (long)(iVar56 + iVar100) * 8;
                                      dVar122 = *(double *)(lVar86 + lVar27 * 8);
                                      dVar123 = *(double *)(lVar37 + lVar29 * 8);
                                      dVar124 = *(double *)(lVar86 + lVar29 * 8);
                                      dVar125 = *(double *)
                                                 (iVar107 * lVar61 + local_bd0 + lVar103 * 8);
                                      dVar126 = *(double *)(local_da8 + lVar103 * 8);
                                      dVar110 = *(double *)
                                                 ((long)local_7d8 + lVar103 * 8 + iVar107 * lVar61);
                                      dVar118 = dVar118 + (((dVar124 - dVar122) +
                                                           (dVar110 - dVar125) + (dVar110 - dVar125)
                                                           + (dVar126 - dVar121) * 4.0 +
                                                             (dVar123 - dVar146) +
                                                             (dVar123 - dVar146)) * local_608 +
                                                          ((dVar124 - dVar110) +
                                                          (dVar123 - dVar126) + (dVar123 - dVar126)
                                                          + (dVar146 - dVar121) * 4.0 +
                                                            (dVar122 - dVar125) +
                                                            (dVar122 - dVar125)) * local_610 +
                                                          ((dVar124 - dVar123) +
                                                          (dVar110 - dVar126) + (dVar110 - dVar126)
                                                          + (dVar125 - dVar121) * 4.0 +
                                                            (dVar122 - dVar146) +
                                                            (dVar122 - dVar146)) * local_618) *
                                                          *(double *)(local_d08 + lVar103 * 8);
                                    }
                                  }
                                  dVar133 = dVar133 + (double)((iVar14 + 4) *
                                                              (iVar77 + 4) * (iVar52 + 4)) * dVar118
                                  ;
                                  lVar37 = lVar88 + lVar103;
                                  lVar103 = lVar103 + 1;
                                  iVar33 = iVar33 + -1;
                                } while (lVar37 < (int)uVar32);
                              }
                              local_dd0 = local_dd0 + local_768.jstride * 8;
                              local_de8 = local_de8 + local_878.jstride * 8;
                              local_c80 = local_c80 + lVar102;
                              local_cc0 = local_cc0 + lVar102;
                              local_cb8 = local_cb8 + lVar102;
                              local_bf0 = local_bf0 + lVar102;
                              local_c40 = local_c40 + lVar61;
                              local_cb0 = local_cb0 + lVar61;
                              local_d18 = local_d18 + lVar61;
                              local_d40 = local_d40 + lVar61;
                              local_d38 = local_d38 + lVar61;
                              local_d10 = local_d10 + lVar61;
                              local_d08 = local_d08 + lVar102;
                              local_d00 = local_d00 + lVar102;
                              local_c38 = local_c38 + lVar61;
                              local_d30 = local_d30 + lVar61;
                              local_df8 = local_df8 + lVar61;
                              local_9e8 = local_9e8 + lVar61;
                              local_c68 = local_c68 + lVar61;
                              local_a98 = local_a98 + lVar61;
                              iVar101 = iVar101 + 1;
                              local_d78 = local_d78 + lVar102;
                              local_da8 = local_da8 + lVar61;
                              local_d98 = local_d98 + lVar61;
                              iVar107 = iVar107 + 1;
                              local_db0 = local_db0 + lVar61;
                              local_bb8 = local_bb8 + lVar61;
                              local_de0 = local_de0 + lVar61;
                              local_dc8 = local_dc8 + lVar61;
                              local_ba8 = local_ba8 + lVar61;
                              local_d58 = local_d58 + lVar61;
                              iVar54 = iVar54 + 1;
                              iVar22 = iVar22 + 1;
                              local_d50 = local_d50 + lVar61;
                              local_d68 = local_d68 + lVar61;
                              local_db8 = local_db8 + lVar61;
                              local_d60 = local_d60 + lVar61;
                              local_d88 = local_d88 + lVar102;
                              bVar109 = lVar40 < iVar11;
                              lVar40 = lVar40 + 1;
                            } while (bVar109);
                          }
                          lVar94 = lVar94 + local_768.kstride * 8;
                          lVar93 = lVar93 + local_878.kstride * 8;
                          local_b38 = local_b38 + lVar85;
                          local_b40 = local_b40 + lVar85;
                          local_b48 = local_b48 + lVar85;
                          local_b50 = local_b50 + lVar85;
                          local_b68 = local_b68 + lVar47;
                          local_998 = local_998 + lVar47;
                          local_a38 = local_a38 + lVar47;
                          local_a40 = local_a40 + lVar47;
                          local_a30 = local_a30 + lVar47;
                          local_a70 = local_a70 + lVar47;
                          local_c90 = local_c90 + lVar85;
                          lVar78 = lVar78 + lVar85;
                          iVar57 = iVar57 + 1;
                          local_a68 = local_a68 + lVar47;
                          local_ac0 = local_ac0 + lVar47;
                          iVar58 = iVar58 + 1;
                          local_a60 = local_a60 + lVar47;
                          lVar97 = lVar97 + lVar85;
                          iVar69 = iVar69 + 1;
                          local_a58 = local_a58 + lVar47;
                          local_bd0 = local_bd0 + lVar47;
                          local_988 = local_988 + lVar47;
                          iVar21 = iVar21 + 1;
                          local_a50 = local_a50 + lVar47;
                          local_b20 = local_b20 + lVar47;
                          local_b28 = local_b28 + lVar47;
                          local_a48 = local_a48 + lVar47;
                          local_c50 = local_c50 + lVar47;
                          local_978 = local_978 + lVar47;
                          local_c20 = local_c20 + lVar47;
                          local_cf8 = local_cf8 + lVar47;
                          local_ca0 = local_ca0 + lVar47;
                          local_b30 = local_b30 + lVar47;
                          local_d48 = local_d48 + lVar47;
                          local_c98 = local_c98 + lVar47;
                          local_c28 = local_c28 + lVar85;
                          bVar109 = lVar26 < iVar13;
                          lVar26 = lVar26 + 1;
                        } while (bVar109);
                        dVar133 = dVar133 * 0.000244140625;
                      }
                      *(double *)
                       (CONCAT44(local_728._4_4_,local_728._0_4_) +
                        (lVar104 -
                        local_718.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_728._12_4_,local_728._8_4_) * 8 +
                        (lVar38 - (int)local_718.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8 +
                       (lVar24 - local_700) *
                       (long)local_718.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start * 8) = dVar133;
                      lVar38 = lVar38 + 1;
                      iVar23 = iVar23 + 4;
                      local_ce4 = local_ce4 + 4;
                    } while (local_6b8.jstride._4_4_ + 1 != (int)lVar38);
                  }
                  lVar104 = lVar104 + 1;
                  iVar45 = iVar45 + 4;
                } while ((uint)local_6b8.kstride + 1 != (int)lVar104);
              }
              lVar24 = lVar24 + 1;
              iVar59 = iVar59 + 4;
            } while (local_6b8.kstride._4_4_ + 1 != (int)lVar24);
          }
        }
      }
      MFIter::operator++((MFIter *)local_518);
    } while ((int)local_518._32_4_ < (int)local_518._40_4_);
  }
  MFIter::~MFIter((MFIter *)local_518);
  local_728._4_4_ = 0;
  local_728._0_4_ = 1;
  local_728._8_4_ = 0;
  local_728._12_4_ = 0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_878.p = (double *)&PTR__FabFactory_008378d0;
  MultiFab::MultiFab((MultiFab *)local_518,
                     &(((FabArray<amrex::FArrayBox> *)&local_550->super_FabArrayBase)->
                      super_FabArrayBase).boxarray,
                     &(((FabArray<amrex::FArrayBox> *)&local_550->super_FabArrayBase)->
                      super_FabArrayBase).distributionMap,1,0,(MFInfo *)local_728,
                     (FabFactory<amrex::FArrayBox> *)&local_878);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_718);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)local_518,0.0,0,local_44c,&local_458);
  PVar269 = Geometry::periodicity(local_558);
  local_728._0_4_ = PVar269.period.vect[0];
  local_728._4_4_ = PVar269.period.vect[1];
  local_728._8_4_ = PVar269.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)local_518,(FabArray<amrex::FArrayBox> *)local_338,
             (Periodicity *)local_728,ADD);
  puVar7 = (this->super_MLNodeLinOp).m_cc_fine_mask.
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_02 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(this->super_MLNodeLinOp).m_dirichlet_mask.
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_6c0].
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  puVar8 = (this->super_MLNodeLinOp).m_nd_fine_mask.
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->super_MLNodeLinOp).m_has_fine_bndry.
           super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar10 = *(long **)&(this->m_sigma).
                       super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_6c0].
                       super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                       .
                       super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  MFIter::MFIter((MFIter *)local_728,&local_6c8->super_FabArrayBase,&local_34c);
  LVar17 = local_7e0;
  LVar16 = local_7f0;
  if ((int)local_718.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_700) {
    dVar146 = local_540 * 0.027777777777777776 * local_540;
    dVar121 = local_538 * 0.027777777777777776 * local_538;
    dVar118 = local_530 * 0.027777777777777776 * local_530;
    lVar24 = (long)(int)local_638;
    iVar2 = (int)local_7e8;
    dVar133 = *(double *)(&DAT_007a40a0 + (ulong)(((int)local_7f8 - 0x66U & 0xfffffffb) == 0) * 8);
    do {
      ppbVar39 = &local_718.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_6e8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar39 = (pointer *)
                   ((local_6e8->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                   (int)local_718.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (*(int *)(*(long *)((long)puVar9[local_6c0]._M_t.
                                   super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                            + 0xf0) + (long)*(int *)ppbVar39 * 4) != 0) {
        MFIter::tilebox(&local_5d4,(MFIter *)local_728);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_878,local_6c8,(MFIter *)local_728);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_768,local_550,(MFIter *)local_728);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_838,local_528,(MFIter *)local_728);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_678,this_02,(MFIter *)local_728);
        lVar64 = local_6c0;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_5b8,
                   (FabArray<amrex::IArrayBox> *)
                   puVar8[local_6c0]._M_t.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                   (MFIter *)local_728);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_6b8,
                   (FabArray<amrex::IArrayBox> *)
                   puVar7[lVar64]._M_t.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                   (MFIter *)local_728);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_7a8,(FabArray<amrex::FArrayBox> *)local_518,(MFIter *)local_728);
        if (*plVar10 == 0) {
          if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
            dVar122 = this->m_const_sigma;
            lVar80 = (long)local_5d4.smallend.vect[1];
            lVar65 = (long)local_5d4.smallend.vect[0];
            lVar64 = lVar65 * 8;
            lVar79 = lVar65 * 4;
            iVar31 = local_5d4.smallend.vect[2] + -1;
            iVar73 = local_5d4.smallend.vect[2];
            iVar76 = local_5d4.smallend.vect[2];
            do {
              iVar76 = iVar76 + 1;
              if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
                lVar60 = (long)iVar73;
                iVar53 = iVar73 + -1;
                lVar38 = (long)local_678.p +
                         (lVar80 - local_678.begin.y) * local_678.jstride * 4 +
                         (lVar60 - local_678.begin.z) * local_678.kstride * 4 +
                         (long)local_678.begin.x * -4 + lVar79;
                lVar104 = lVar80;
                local_c68 = lVar80 + -1;
                iVar87 = local_5d4.smallend.vect[1];
                do {
                  iVar87 = iVar87 + 1;
                  if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                    lVar88 = CONCAT44(local_6b8.jstride._4_4_,(int)local_6b8.jstride);
                    lVar25 = CONCAT44(local_6b8.kstride._4_4_,(uint)local_6b8.kstride);
                    lVar95 = lVar104 - local_6b8.begin.y;
                    lVar40 = lVar88 * lVar95 + lVar65;
                    lVar48 = lVar60 - local_6b8.begin.z;
                    lVar96 = lVar25 * lVar48;
                    lVar27 = local_c68 - local_6b8.begin.y;
                    lVar102 = lVar88 * lVar27 + lVar65;
                    lVar94 = (long)iVar31 - (long)local_6b8.begin.z;
                    lVar51 = lVar25 * lVar94;
                    lVar26 = (long)local_768.begin.y;
                    lVar50 = lVar104 + -1;
                    iVar46 = (int)lVar104;
                    lVar93 = local_768.jstride * (lVar104 - lVar26);
                    lVar78 = (lVar50 - lVar26) * local_768.jstride;
                    lVar75 = ((iVar46 - local_768.begin.y) + 1) * local_768.jstride;
                    lVar97 = local_768.jstride * 8;
                    lVar85 = (lVar104 - lVar26) * lVar97;
                    lVar89 = (local_c68 - lVar26) * lVar97;
                    lVar97 = (iVar87 - local_768.begin.y) * lVar97;
                    lVar29 = (iVar73 - local_768.begin.z) * local_768.kstride;
                    lVar35 = (iVar53 - local_768.begin.z) * local_768.kstride;
                    lVar71 = ((iVar73 + 1) - local_768.begin.z) * local_768.kstride;
                    lVar49 = local_768.kstride * 8;
                    lVar63 = ((long)iVar31 - (long)local_768.begin.z) * lVar49;
                    lVar74 = (lVar60 - local_768.begin.z) * lVar49;
                    lVar49 = (iVar76 - local_768.begin.z) * lVar49;
                    lVar92 = (long)local_768.begin.x;
                    iVar59 = (local_5d4.smallend.vect[0] + 1) - local_768.begin.x;
                    lVar26 = lVar85 + lVar63 + lVar92 * -8 + lVar64;
                    lVar47 = lVar85 + lVar74 + lVar92 * -8 + lVar64;
                    lVar61 = lVar89 + lVar63 + lVar92 * -8 + lVar64;
                    lVar62 = lVar89 + lVar74 + lVar92 * -8 + lVar64;
                    lVar63 = lVar63 + lVar97 + lVar92 * -8 + lVar64;
                    lVar74 = lVar74 + lVar97 + lVar92 * -8 + lVar64;
                    lVar85 = lVar85 + lVar49 + lVar92 * -8 + lVar64;
                    lVar89 = lVar89 + lVar49 + lVar92 * -8 + lVar64;
                    lVar92 = lVar49 + lVar97 + lVar92 * -8 + lVar64;
                    lVar27 = lVar27 * lVar88 * 4;
                    lVar95 = lVar88 * 4 * lVar95;
                    lVar94 = lVar94 * lVar25 * 4;
                    lVar48 = lVar25 * 4 * lVar48;
                    lVar25 = (long)local_6b8.begin.x;
                    lVar88 = CONCAT44(local_6b8.p._4_4_,(int)local_6b8.p);
                    lVar49 = lVar88 + lVar79;
                    lVar28 = (long)local_cdc;
                    lVar98 = (long)local_cd0;
                    lVar97 = 0;
                    do {
                      if ((*(int *)(lVar38 + lVar97 * 4) == 0) &&
                         (*(int *)((long)local_5b8.p +
                                  lVar97 * 4 +
                                  (lVar60 - local_5b8.begin.z) * local_5b8.kstride * 4 +
                                  (lVar104 - local_5b8.begin.y) * local_5b8.jstride * 4 +
                                  (long)local_5b8.begin.x * -4 + lVar79) == 1)) {
                        lVar36 = lVar65 + lVar97;
                        lVar81 = lVar65 + lVar97 + -1;
                        dVar123 = 0.0;
                        if (((lVar28 < lVar36) &&
                            (((lVar81 <= lVar98 && (local_cd8 < lVar104)) && (lVar50 <= local_ccc)))
                            ) && (((local_cd4 < iVar73 && (iVar53 <= local_cc8)) &&
                                  (*(int *)(lVar88 + (lVar51 + lVar102) * 4 + lVar25 * -4 + -4 +
                                           lVar97 * 4) == 0)))) {
                          dVar123 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47 + -8);
                          dVar124 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar62 + -8);
                          dVar126 = *(double *)((long)local_768.p + lVar97 * 8 + lVar26 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar97 * 8 + lVar61 + -8);
                          dVar111 = *(double *)((long)local_768.p + lVar97 * 8 + lVar62);
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar26);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar61);
                          dVar123 = (((dVar110 - dVar125) +
                                     (dVar113 - dVar111) + (dVar113 - dVar111) +
                                     (dVar112 - dVar124) * 4.0 +
                                     (dVar126 - dVar123) + (dVar126 - dVar123)) * dVar118 +
                                    ((dVar110 - dVar113) +
                                    (dVar126 - dVar112) + (dVar126 - dVar112) +
                                    (dVar123 - dVar124) * 4.0 +
                                    (dVar125 - dVar111) + (dVar125 - dVar111)) * dVar146 +
                                    ((dVar110 - dVar126) +
                                    (dVar113 - dVar112) + (dVar113 - dVar112) +
                                    (dVar111 - dVar124) * 4.0 +
                                    (dVar125 - dVar123) + (dVar125 - dVar123)) * dVar121) * dVar122
                                    + 0.0;
                        }
                        iVar84 = (int)lVar97;
                        if (((lVar28 <= lVar36) && (lVar36 <= lVar98)) &&
                           ((local_cd8 < lVar104 &&
                            ((((lVar50 <= local_ccc && (local_cd4 < iVar73)) &&
                              (iVar53 <= local_cc8)) &&
                             (*(int *)(lVar27 + lVar94 + lVar25 * -4 + lVar49 + lVar97 * 4) == 0))))
                           )) {
                          lVar82 = (long)(iVar59 + iVar84);
                          dVar124 = local_768.p[lVar93 + lVar82 + lVar29];
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar126 = local_768.p[lVar78 + lVar82 + lVar29];
                          dVar110 = local_768.p[lVar93 + lVar82 + lVar35];
                          dVar111 = local_768.p[lVar78 + lVar82 + lVar35];
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar62);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar26);
                          dVar114 = *(double *)((long)local_768.p + lVar97 * 8 + lVar61);
                          dVar123 = dVar123 + (((dVar111 - dVar126) +
                                               (dVar114 - dVar112) + (dVar114 - dVar112) +
                                               (dVar113 - dVar125) * 4.0 +
                                               (dVar110 - dVar124) + (dVar110 - dVar124)) * dVar118
                                              + ((dVar111 - dVar114) +
                                                (dVar110 - dVar113) + (dVar110 - dVar113) +
                                                (dVar124 - dVar125) * 4.0 +
                                                (dVar126 - dVar112) + (dVar126 - dVar112)) * dVar146
                                                + ((dVar111 - dVar110) +
                                                  (dVar114 - dVar113) + (dVar114 - dVar113) +
                                                  (dVar112 - dVar125) * 4.0 +
                                                  (dVar126 - dVar124) + (dVar126 - dVar124)) *
                                                  dVar121) * dVar122;
                        }
                        if (((lVar28 < lVar36) && (lVar81 <= lVar98)) &&
                           ((((local_cd8 <= lVar104 &&
                              ((lVar104 <= local_ccc && (local_cd4 < iVar73)))) &&
                             (iVar53 <= local_cc8)) &&
                            (*(int *)(lVar88 + -4 + (lVar40 + lVar51) * 4 + lVar25 * -4 + lVar97 * 4
                                     ) == 0)))) {
                          dVar124 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47 + -8);
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar126 = *(double *)((long)local_768.p + lVar97 * 8 + lVar74 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar97 * 8 + lVar26 + -8);
                          dVar111 = *(double *)((long)local_768.p + lVar97 * 8 + lVar63 + -8);
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar74);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar26);
                          dVar114 = *(double *)((long)local_768.p + lVar97 * 8 + lVar63);
                          dVar123 = dVar123 + (((dVar111 - dVar126) +
                                               (dVar114 - dVar112) + (dVar114 - dVar112) +
                                               (dVar113 - dVar125) * 4.0 +
                                               (dVar110 - dVar124) + (dVar110 - dVar124)) * dVar118
                                              + ((dVar111 - dVar114) +
                                                (dVar110 - dVar113) + (dVar110 - dVar113) +
                                                (dVar124 - dVar125) * 4.0 +
                                                (dVar126 - dVar112) + (dVar126 - dVar112)) * dVar146
                                                + ((dVar111 - dVar110) +
                                                  (dVar114 - dVar113) + (dVar114 - dVar113) +
                                                  (dVar112 - dVar125) * 4.0 +
                                                  (dVar126 - dVar124) + (dVar126 - dVar124)) *
                                                  dVar121) * dVar122;
                        }
                        if ((((lVar28 <= lVar36) && (lVar36 <= lVar98)) && (local_cd8 <= lVar104))
                           && (((lVar104 <= local_ccc && (local_cd4 < iVar73)) &&
                               ((iVar53 <= local_cc8 &&
                                (*(int *)(lVar94 + lVar95 + lVar25 * -4 + lVar49 + lVar97 * 4) == 0)
                                ))))) {
                          lVar82 = (long)(iVar59 + iVar84);
                          dVar124 = local_768.p[lVar93 + lVar82 + lVar29];
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar126 = local_768.p[lVar75 + lVar82 + lVar29];
                          dVar110 = local_768.p[lVar93 + lVar82 + lVar35];
                          dVar111 = local_768.p[lVar75 + lVar82 + lVar35];
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar74);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar26);
                          dVar114 = *(double *)((long)local_768.p + lVar97 * 8 + lVar63);
                          dVar123 = dVar123 + (((dVar111 - dVar126) +
                                               (dVar114 - dVar112) + (dVar114 - dVar112) +
                                               (dVar113 - dVar125) * 4.0 +
                                               (dVar110 - dVar124) + (dVar110 - dVar124)) * dVar118
                                              + ((dVar111 - dVar114) +
                                                (dVar110 - dVar113) + (dVar110 - dVar113) +
                                                (dVar124 - dVar125) * 4.0 +
                                                (dVar126 - dVar112) + (dVar126 - dVar112)) * dVar146
                                                + ((dVar111 - dVar110) +
                                                  (dVar114 - dVar113) + (dVar114 - dVar113) +
                                                  (dVar112 - dVar125) * 4.0 +
                                                  (dVar126 - dVar124) + (dVar126 - dVar124)) *
                                                  dVar121) * dVar122;
                        }
                        if ((((lVar28 < lVar36) && (lVar81 <= lVar98)) &&
                            ((local_cd8 < lVar104 &&
                             (((lVar50 <= local_ccc && (local_cd4 <= iVar73)) &&
                              (iVar73 <= local_cc8)))))) &&
                           (*(int *)(lVar88 + -4 + (lVar96 + lVar102) * 4 + lVar25 * -4 + lVar97 * 4
                                    ) == 0)) {
                          dVar124 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47 + -8);
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar126 = *(double *)((long)local_768.p + lVar97 * 8 + lVar62 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar97 * 8 + lVar85 + -8);
                          dVar111 = *(double *)((long)local_768.p + lVar97 * 8 + lVar89 + -8);
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar62);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar85);
                          dVar114 = *(double *)((long)local_768.p + lVar97 * 8 + lVar89);
                          dVar123 = dVar123 + (((dVar111 - dVar126) +
                                               (dVar114 - dVar112) + (dVar114 - dVar112) +
                                               (dVar113 - dVar125) * 4.0 +
                                               (dVar110 - dVar124) + (dVar110 - dVar124)) * dVar118
                                              + ((dVar111 - dVar114) +
                                                (dVar110 - dVar113) + (dVar110 - dVar113) +
                                                (dVar124 - dVar125) * 4.0 +
                                                (dVar126 - dVar112) + (dVar126 - dVar112)) * dVar146
                                                + ((dVar111 - dVar110) +
                                                  (dVar114 - dVar113) + (dVar114 - dVar113) +
                                                  (dVar112 - dVar125) * 4.0 +
                                                  (dVar126 - dVar124) + (dVar126 - dVar124)) *
                                                  dVar121) * dVar122;
                        }
                        if (((((lVar28 <= lVar36) && (lVar36 <= lVar98)) &&
                             ((local_cd8 < lVar104 &&
                              ((lVar50 <= local_ccc && (local_cd4 <= iVar73)))))) &&
                            (iVar73 <= local_cc8)) &&
                           (*(int *)(lVar27 + lVar48 + lVar25 * -4 + lVar49 + lVar97 * 4) == 0)) {
                          lVar82 = (long)(iVar59 + iVar84);
                          dVar124 = local_768.p[lVar93 + lVar82 + lVar29];
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar126 = local_768.p[lVar78 + lVar82 + lVar29];
                          dVar110 = local_768.p[lVar93 + lVar82 + lVar71];
                          dVar111 = local_768.p[lVar78 + lVar82 + lVar71];
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar62);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar85);
                          dVar114 = *(double *)((long)local_768.p + lVar97 * 8 + lVar89);
                          dVar123 = dVar123 + (((dVar111 - dVar126) +
                                               (dVar114 - dVar112) + (dVar114 - dVar112) +
                                               (dVar113 - dVar125) * 4.0 +
                                               (dVar110 - dVar124) + (dVar110 - dVar124)) * dVar118
                                              + ((dVar111 - dVar114) +
                                                (dVar110 - dVar113) + (dVar110 - dVar113) +
                                                (dVar124 - dVar125) * 4.0 +
                                                (dVar126 - dVar112) + (dVar126 - dVar112)) * dVar146
                                                + ((dVar111 - dVar110) +
                                                  (dVar114 - dVar113) + (dVar114 - dVar113) +
                                                  (dVar112 - dVar125) * 4.0 +
                                                  (dVar126 - dVar124) + (dVar126 - dVar124)) *
                                                  dVar121) * dVar122;
                        }
                        if ((((((lVar28 < lVar36) && (lVar81 <= lVar98)) && (local_cd8 <= lVar104))
                             && ((lVar104 <= local_ccc && (local_cd4 <= iVar73)))) &&
                            (iVar73 <= local_cc8)) &&
                           (*(int *)(lVar88 + (lVar96 + lVar40) * 4 + lVar25 * -4 + -4 + lVar97 * 4)
                            == 0)) {
                          dVar124 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47 + -8);
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar126 = *(double *)((long)local_768.p + lVar97 * 8 + lVar74 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar97 * 8 + lVar85 + -8);
                          dVar111 = *(double *)((long)local_768.p + lVar97 * 8 + lVar92 + -8);
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar74);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar85);
                          dVar114 = *(double *)((long)local_768.p + lVar97 * 8 + lVar92);
                          dVar123 = dVar123 + (((dVar111 - dVar126) +
                                               (dVar114 - dVar112) + (dVar114 - dVar112) +
                                               (dVar113 - dVar125) * 4.0 +
                                               (dVar110 - dVar124) + (dVar110 - dVar124)) * dVar118
                                              + ((dVar111 - dVar114) +
                                                (dVar110 - dVar113) + (dVar110 - dVar113) +
                                                (dVar124 - dVar125) * 4.0 +
                                                (dVar126 - dVar112) + (dVar126 - dVar112)) * dVar146
                                                + ((dVar111 - dVar110) +
                                                  (dVar114 - dVar113) + (dVar114 - dVar113) +
                                                  (dVar112 - dVar125) * 4.0 +
                                                  (dVar126 - dVar124) + (dVar126 - dVar124)) *
                                                  dVar121) * dVar122;
                        }
                        if ((((lVar28 <= lVar36) && (lVar36 <= lVar98)) &&
                            ((local_cd8 <= lVar104 &&
                             (((lVar104 <= local_ccc && (local_cd4 <= iVar73)) &&
                              (iVar73 <= local_cc8)))))) &&
                           (*(int *)(lVar48 + lVar95 + lVar25 * -4 + lVar49 + lVar97 * 4) == 0)) {
                          lVar36 = (long)(iVar59 + iVar84);
                          dVar124 = local_768.p[lVar93 + lVar36 + lVar29];
                          dVar125 = *(double *)((long)local_768.p + lVar97 * 8 + lVar47);
                          dVar126 = local_768.p[lVar75 + lVar36 + lVar29];
                          dVar110 = local_768.p[lVar93 + lVar36 + lVar71];
                          dVar111 = local_768.p[lVar75 + lVar36 + lVar71];
                          dVar112 = *(double *)((long)local_768.p + lVar97 * 8 + lVar74);
                          dVar113 = *(double *)((long)local_768.p + lVar97 * 8 + lVar85);
                          dVar114 = *(double *)((long)local_768.p + lVar97 * 8 + lVar92);
                          dVar123 = dVar123 + (((dVar111 - dVar126) +
                                               (dVar114 - dVar112) + (dVar114 - dVar112) +
                                               (dVar113 - dVar125) * 4.0 +
                                               (dVar110 - dVar124) + (dVar110 - dVar124)) * dVar118
                                              + ((dVar111 - dVar114) +
                                                (dVar110 - dVar113) + (dVar110 - dVar113) +
                                                (dVar124 - dVar125) * 4.0 +
                                                (dVar126 - dVar112) + (dVar126 - dVar112)) * dVar146
                                                + ((dVar111 - dVar110) +
                                                  (dVar114 - dVar113) + (dVar114 - dVar113) +
                                                  (dVar112 - dVar125) * 4.0 +
                                                  (dVar126 - dVar124) + (dVar126 - dVar124)) *
                                                  dVar121) * dVar122;
                        }
                        dVar124 = 1.0;
                        if ((char)local_7ac != '\0') {
                          if (((lVar24 - lVar65 != lVar97) ||
                              ((dVar124 = 2.0, iVar2 != 0x66 && (dVar124 = 2.0, iVar2 != 0x6a)))) &&
                             (dVar124 = 1.0, local_62c[0] - local_5d4.smallend.vect[0] == iVar84)) {
                            dVar124 = dVar133;
                          }
                          if ((local_638._4_4_ == iVar46) &&
                             ((local_7e8._4_4_ == 0x6a || (local_7e8._4_4_ == 0x66)))) {
                            dVar124 = dVar124 + dVar124;
                          }
                          else if ((local_62c[1] == iVar46) &&
                                  ((local_7f8._4_4_ == 0x6a || (local_7f8._4_4_ == 0x66)))) {
                            dVar124 = dVar124 + dVar124;
                          }
                          if (((local_630 == iVar73) && ((LVar17 == inflow || (LVar17 == Neumann))))
                             || (((int)uStack_624 == iVar73 &&
                                 ((LVar16 == inflow || (LVar16 == Neumann)))))) {
                            dVar124 = dVar124 + dVar124;
                          }
                        }
                        local_878.p
                        [lVar65 + (((lVar104 - local_878.begin.y) * local_878.jstride +
                                   (lVar60 - local_878.begin.z) * local_878.kstride + lVar97) -
                                  (long)local_878.begin.x)] =
                             (double)(*(double *)
                                       ((lVar60 - local_838.begin.z) *
                                        CONCAT44(local_838.kstride._4_4_,(int)local_838.kstride) * 8
                                        + (lVar104 - local_838.begin.y) *
                                          CONCAT44(local_838.jstride._4_4_,(int)local_838.jstride) *
                                          8 + (long)local_838.begin.x * -8 +
                                        CONCAT44(local_838.p._4_4_,(int)local_838.p) + lVar64 +
                                       lVar97 * 8) -
                                     (dVar123 +
                                     *(double *)
                                      ((lVar60 - local_7a8.begin.z) *
                                       CONCAT44(local_7a8.kstride._4_4_,(int)local_7a8.kstride) * 8
                                       + (lVar104 - local_7a8.begin.y) *
                                         CONCAT44(local_7a8.jstride._4_4_,(int)local_7a8.jstride) *
                                         8 + (long)local_7a8.begin.x * -8 +
                                       CONCAT44(local_7a8.p._4_4_,(int)local_7a8.p) + lVar64 +
                                      lVar97 * 8)) * dVar124);
                      }
                      lVar97 = lVar97 + 1;
                    } while ((local_5d4.bigend.vect[0] - local_5d4.smallend.vect[0]) + 1 !=
                             (int)lVar97);
                  }
                  lVar104 = lVar104 + 1;
                  lVar38 = lVar38 + local_678.jstride * 4;
                  local_c68 = local_c68 + 1;
                } while (local_5d4.bigend.vect[1] + 1 != (int)lVar104);
              }
              iVar31 = iVar31 + 1;
              bVar109 = iVar73 != local_5d4.bigend.vect[2];
              iVar73 = iVar73 + 1;
            } while (bVar109);
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_390,(FabArray<amrex::FArrayBox> *)*plVar10,(MFIter *)local_728);
          if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
            lVar80 = (long)local_5d4.smallend.vect[1];
            lVar65 = (long)local_5d4.smallend.vect[0];
            lVar64 = lVar65 * 8;
            lVar79 = lVar65 * 4;
            iVar31 = local_5d4.smallend.vect[2] + -1;
            iVar73 = local_5d4.smallend.vect[2];
            iVar76 = local_5d4.smallend.vect[2];
            do {
              iVar76 = iVar76 + 1;
              if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
                lVar88 = (long)iVar73;
                lVar60 = (long)iVar31;
                iVar53 = iVar73 + -1;
                lVar38 = (long)local_678.p +
                         (lVar80 - local_678.begin.y) * local_678.jstride * 4 +
                         (lVar88 - local_678.begin.z) * local_678.kstride * 4 +
                         (long)local_678.begin.x * -4 + lVar79;
                lVar104 = lVar80;
                local_dc0 = lVar80 + -1;
                iVar87 = local_5d4.smallend.vect[1];
                do {
                  iVar87 = iVar87 + 1;
                  if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                    lVar29 = lVar104 - local_390.begin.y;
                    lVar72 = local_390.jstride * lVar29 + lVar65;
                    lVar103 = lVar88 - local_390.begin.z;
                    lVar91 = local_390.kstride * lVar103;
                    lVar51 = lVar104 - local_6b8.begin.y;
                    lVar82 = lVar88 - local_6b8.begin.z;
                    lVar108 = local_dc0 - local_390.begin.y;
                    lVar81 = local_dc0 - local_6b8.begin.y;
                    lVar37 = lVar60 - local_390.begin.z;
                    lVar90 = lVar60 - local_6b8.begin.z;
                    lVar75 = local_390.jstride * lVar108 + lVar65;
                    lVar98 = local_390.kstride * lVar37;
                    lVar26 = CONCAT44(local_6b8.jstride._4_4_,(int)local_6b8.jstride);
                    lVar48 = lVar26 * lVar51 + lVar65;
                    lVar47 = CONCAT44(local_6b8.kstride._4_4_,(uint)local_6b8.kstride);
                    lVar66 = lVar47 * lVar82;
                    lVar71 = lVar26 * lVar81 + lVar65;
                    lVar35 = lVar47 * lVar90;
                    lVar61 = (long)local_768.begin.y;
                    lVar25 = lVar104 + -1;
                    iVar59 = (int)lVar104;
                    lVar40 = local_768.jstride * (lVar104 - lVar61);
                    lVar105 = (lVar25 - lVar61) * local_768.jstride;
                    lVar49 = ((iVar59 - local_768.begin.y) + 1) * local_768.jstride;
                    lVar78 = local_768.jstride * 8;
                    lVar102 = (lVar104 - lVar61) * lVar78;
                    lVar95 = (local_dc0 - lVar61) * lVar78;
                    lVar78 = (iVar87 - local_768.begin.y) * lVar78;
                    lVar93 = lVar88 - local_768.begin.z;
                    lVar36 = (iVar53 - local_768.begin.z) * local_768.kstride;
                    lVar50 = (long)local_768.begin.x;
                    iVar46 = (local_5d4.smallend.vect[0] + 1) - local_768.begin.x;
                    lVar96 = local_768.kstride * 8;
                    lVar85 = (lVar60 - local_768.begin.z) * lVar96;
                    lVar89 = lVar96 * lVar93;
                    lVar96 = lVar96 * (iVar76 - local_768.begin.z);
                    lVar61 = lVar102 + lVar85 + lVar50 * -8 + lVar64;
                    lVar62 = lVar102 + lVar89 + lVar50 * -8 + lVar64;
                    lVar63 = lVar95 + lVar85 + lVar50 * -8 + lVar64;
                    lVar74 = lVar95 + lVar89 + lVar50 * -8 + lVar64;
                    lVar85 = lVar85 + lVar78 + lVar50 * -8 + lVar64;
                    lVar89 = lVar89 + lVar78 + lVar50 * -8 + lVar64;
                    lVar92 = lVar102 + lVar96 + lVar50 * -8 + lVar64;
                    lVar95 = lVar95 + lVar96 + lVar50 * -8 + lVar64;
                    lVar96 = lVar96 + lVar78 + lVar50 * -8 + lVar64;
                    lVar102 = lVar102 + lVar50 * -8 + lVar64;
                    lVar78 = lVar78 + lVar50 * -8 + lVar64;
                    lVar81 = lVar81 * lVar26 * 4;
                    lVar51 = lVar26 * 4 * lVar51;
                    lVar108 = lVar108 * local_390.jstride * 8;
                    lVar29 = local_390.jstride * 8 * lVar29;
                    lVar90 = lVar90 * lVar47 * 4;
                    lVar82 = lVar47 * 4 * lVar82;
                    lVar37 = lVar37 * local_390.kstride * 8;
                    lVar103 = local_390.kstride * 8 * lVar103;
                    lVar47 = (long)local_6b8.begin.x;
                    lVar26 = CONCAT44(local_6b8.p._4_4_,(int)local_6b8.p);
                    lVar50 = lVar26 + lVar79;
                    lVar94 = (long)local_390.begin.x;
                    lVar27 = local_768.kstride * (iVar73 - local_768.begin.z);
                    lVar97 = (long)((iVar73 + 1) - local_768.begin.z);
                    lVar28 = local_768.kstride * lVar97;
                    lVar99 = (long)local_cdc;
                    lVar106 = (long)local_cd0;
                    lVar86 = 0;
                    do {
                      if ((*(int *)(lVar38 + lVar86 * 4) == 0) &&
                         (*(int *)((long)local_5b8.p +
                                  lVar86 * 4 +
                                  (lVar88 - local_5b8.begin.z) * local_5b8.kstride * 4 +
                                  (lVar104 - local_5b8.begin.y) * local_5b8.jstride * 4 +
                                  (long)local_5b8.begin.x * -4 + lVar79) == 1)) {
                        lVar67 = lVar65 + lVar86;
                        lVar30 = lVar65 + lVar86 + -1;
                        dVar122 = 0.0;
                        if (((lVar99 < lVar67) &&
                            (((lVar30 <= lVar106 && (local_cd8 < lVar104)) && (lVar25 <= local_ccc))
                            )) && (((local_cd4 < iVar73 && (iVar53 <= local_cc8)) &&
                                   (*(int *)(lVar26 + (lVar35 + lVar71) * 4 + lVar47 * -4 + -4 +
                                            lVar86 * 4) == 0)))) {
                          dVar122 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62 + -8);
                          dVar123 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62);
                          dVar124 = *(double *)((long)local_768.p + lVar86 * 8 + lVar74 + -8);
                          dVar125 = *(double *)((long)local_768.p + lVar86 * 8 + lVar61 + -8);
                          dVar126 = *(double *)((long)local_768.p + lVar86 * 8 + lVar63 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar86 * 8 + lVar74);
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar61);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar63);
                          dVar122 = (((dVar126 - dVar124) +
                                     (dVar112 - dVar110) + (dVar112 - dVar110) +
                                     (dVar111 - dVar123) * 4.0 +
                                     (dVar125 - dVar122) + (dVar125 - dVar122)) * dVar118 +
                                    ((dVar126 - dVar112) +
                                    (dVar125 - dVar111) + (dVar125 - dVar111) +
                                    (dVar122 - dVar123) * 4.0 +
                                    (dVar124 - dVar110) + (dVar124 - dVar110)) * dVar146 +
                                    ((dVar126 - dVar125) +
                                    (dVar112 - dVar111) + (dVar112 - dVar111) +
                                    (dVar110 - dVar123) * 4.0 +
                                    (dVar124 - dVar122) + (dVar124 - dVar122)) * dVar121) *
                                    local_390.p[(lVar98 + lVar75 + lVar86 + -1) - lVar94] + 0.0;
                        }
                        iVar84 = (int)lVar86;
                        if (((lVar99 <= lVar67) && (lVar67 <= lVar106)) &&
                           ((local_cd8 < lVar104 &&
                            ((((lVar25 <= local_ccc && (local_cd4 < iVar73)) &&
                              (iVar53 <= local_cc8)) &&
                             (*(int *)(lVar81 + lVar90 + lVar47 * -4 + lVar50 + lVar86 * 4) == 0))))
                           )) {
                          lVar41 = (long)(iVar46 + iVar84);
                          dVar123 = local_768.p[lVar40 + lVar41 + lVar27];
                          dVar124 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62);
                          dVar125 = local_768.p[lVar105 + lVar41 + lVar27];
                          dVar126 = local_768.p[lVar40 + lVar41 + lVar36];
                          dVar110 = local_768.p[lVar105 + lVar41 + lVar36];
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar74);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar61);
                          dVar113 = *(double *)((long)local_768.p + lVar86 * 8 + lVar63);
                          dVar122 = dVar122 + (((dVar110 - dVar125) +
                                               (dVar113 - dVar111) + (dVar113 - dVar111) +
                                               (dVar112 - dVar124) * 4.0 +
                                               (dVar126 - dVar123) + (dVar126 - dVar123)) * dVar118
                                              + ((dVar110 - dVar113) +
                                                (dVar126 - dVar112) + (dVar126 - dVar112) +
                                                (dVar123 - dVar124) * 4.0 +
                                                (dVar125 - dVar111) + (dVar125 - dVar111)) * dVar146
                                                + ((dVar110 - dVar126) +
                                                  (dVar113 - dVar112) + (dVar113 - dVar112) +
                                                  (dVar111 - dVar124) * 4.0 +
                                                  (dVar125 - dVar123) + (dVar125 - dVar123)) *
                                                  dVar121) *
                                              *(double *)
                                               ((long)local_390.p +
                                               lVar86 * 8 + lVar108 + lVar37 + lVar94 * -8 + lVar64)
                          ;
                        }
                        if (((lVar99 < lVar67) && (lVar30 <= lVar106)) &&
                           ((((local_cd8 <= lVar104 &&
                              ((lVar104 <= local_ccc && (local_cd4 < iVar73)))) &&
                             (iVar53 <= local_cc8)) &&
                            (*(int *)(lVar26 + -4 + (lVar48 + lVar35) * 4 + lVar47 * -4 + lVar86 * 4
                                     ) == 0)))) {
                          dVar123 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62 + -8);
                          dVar124 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62);
                          dVar125 = *(double *)((long)local_768.p + lVar86 * 8 + lVar89 + -8);
                          dVar126 = *(double *)((long)local_768.p + lVar86 * 8 + lVar61 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar86 * 8 + lVar85 + -8);
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar89);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar61);
                          dVar113 = *(double *)((long)local_768.p + lVar86 * 8 + lVar85);
                          dVar122 = dVar122 + (((dVar110 - dVar125) +
                                               (dVar113 - dVar111) + (dVar113 - dVar111) +
                                               (dVar112 - dVar124) * 4.0 +
                                               (dVar126 - dVar123) + (dVar126 - dVar123)) * dVar118
                                              + ((dVar110 - dVar113) +
                                                (dVar126 - dVar112) + (dVar126 - dVar112) +
                                                (dVar123 - dVar124) * 4.0 +
                                                (dVar125 - dVar111) + (dVar125 - dVar111)) * dVar146
                                                + ((dVar110 - dVar126) +
                                                  (dVar113 - dVar112) + (dVar113 - dVar112) +
                                                  (dVar111 - dVar124) * 4.0 +
                                                  (dVar125 - dVar123) + (dVar125 - dVar123)) *
                                                  dVar121) *
                                              local_390.p[(lVar72 + lVar98 + lVar86 + -1) - lVar94];
                        }
                        if ((((lVar99 <= lVar67) && (lVar67 <= lVar106)) && (local_cd8 <= lVar104))
                           && (((lVar104 <= local_ccc && (local_cd4 < iVar73)) &&
                               ((iVar53 <= local_cc8 &&
                                (*(int *)(lVar90 + lVar51 + lVar47 * -4 + lVar50 + lVar86 * 4) == 0)
                                ))))) {
                          lVar41 = (long)(iVar46 + iVar84);
                          dVar123 = local_768.p[lVar40 + lVar41 + lVar27];
                          dVar124 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62);
                          dVar125 = local_768.p[lVar49 + lVar41 + lVar27];
                          dVar126 = local_768.p[lVar40 + lVar41 + lVar36];
                          dVar110 = local_768.p[lVar49 + lVar41 + lVar36];
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar89);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar61);
                          dVar113 = *(double *)((long)local_768.p + lVar86 * 8 + lVar85);
                          dVar122 = dVar122 + (((dVar110 - dVar125) +
                                               (dVar113 - dVar111) + (dVar113 - dVar111) +
                                               (dVar112 - dVar124) * 4.0 +
                                               (dVar126 - dVar123) + (dVar126 - dVar123)) * dVar118
                                              + ((dVar110 - dVar113) +
                                                (dVar126 - dVar112) + (dVar126 - dVar112) +
                                                (dVar123 - dVar124) * 4.0 +
                                                (dVar125 - dVar111) + (dVar125 - dVar111)) * dVar146
                                                + ((dVar110 - dVar126) +
                                                  (dVar113 - dVar112) + (dVar113 - dVar112) +
                                                  (dVar111 - dVar124) * 4.0 +
                                                  (dVar125 - dVar123) + (dVar125 - dVar123)) *
                                                  dVar121) *
                                              *(double *)
                                               ((long)local_390.p +
                                               lVar86 * 8 + lVar37 + lVar29 + lVar94 * -8 + lVar64);
                        }
                        if ((((lVar99 < lVar67) && (lVar30 <= lVar106)) &&
                            ((local_cd8 < lVar104 &&
                             (((lVar25 <= local_ccc && (local_cd4 <= iVar73)) &&
                              (iVar73 <= local_cc8)))))) &&
                           (*(int *)(lVar26 + -4 + (lVar66 + lVar71) * 4 + lVar47 * -4 + lVar86 * 4)
                            == 0)) {
                          dVar123 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62 + -8);
                          dVar124 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62);
                          dVar125 = *(double *)((long)local_768.p + lVar86 * 8 + lVar74 + -8);
                          dVar126 = *(double *)((long)local_768.p + lVar86 * 8 + lVar92 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar86 * 8 + lVar95 + -8);
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar74);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar92);
                          dVar113 = *(double *)((long)local_768.p + lVar86 * 8 + lVar95);
                          dVar122 = dVar122 + (((dVar110 - dVar125) +
                                               (dVar113 - dVar111) + (dVar113 - dVar111) +
                                               (dVar112 - dVar124) * 4.0 +
                                               (dVar126 - dVar123) + (dVar126 - dVar123)) * dVar118
                                              + ((dVar110 - dVar113) +
                                                (dVar126 - dVar112) + (dVar126 - dVar112) +
                                                (dVar123 - dVar124) * 4.0 +
                                                (dVar125 - dVar111) + (dVar125 - dVar111)) * dVar146
                                                + ((dVar110 - dVar126) +
                                                  (dVar113 - dVar112) + (dVar113 - dVar112) +
                                                  (dVar111 - dVar124) * 4.0 +
                                                  (dVar125 - dVar123) + (dVar125 - dVar123)) *
                                                  dVar121) *
                                              local_390.p[(lVar91 + lVar75 + lVar86 + -1) - lVar94];
                        }
                        if ((((lVar99 <= lVar67) && (lVar67 <= lVar106)) &&
                            ((local_cd8 < lVar104 &&
                             ((lVar25 <= local_ccc && (local_cd4 <= iVar73)))))) &&
                           ((iVar73 <= local_cc8 &&
                            (*(int *)(lVar81 + lVar82 + lVar47 * -4 + lVar50 + lVar86 * 4) == 0))))
                        {
                          lVar41 = (long)(iVar46 + iVar84);
                          dVar123 = local_768.p[lVar40 + lVar41 + lVar27];
                          dVar124 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62);
                          dVar125 = local_768.p[lVar105 + lVar41 + lVar27];
                          dVar126 = local_768.p[lVar40 + lVar41 + lVar28];
                          dVar110 = local_768.p[lVar105 + lVar41 + lVar28];
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar74);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar92);
                          dVar113 = *(double *)((long)local_768.p + lVar86 * 8 + lVar95);
                          dVar122 = dVar122 + (((dVar110 - dVar125) +
                                               (dVar113 - dVar111) + (dVar113 - dVar111) +
                                               (dVar112 - dVar124) * 4.0 +
                                               (dVar126 - dVar123) + (dVar126 - dVar123)) * dVar118
                                              + ((dVar110 - dVar113) +
                                                (dVar126 - dVar112) + (dVar126 - dVar112) +
                                                (dVar123 - dVar124) * 4.0 +
                                                (dVar125 - dVar111) + (dVar125 - dVar111)) * dVar146
                                                + ((dVar110 - dVar126) +
                                                  (dVar113 - dVar112) + (dVar113 - dVar112) +
                                                  (dVar111 - dVar124) * 4.0 +
                                                  (dVar125 - dVar123) + (dVar125 - dVar123)) *
                                                  dVar121) *
                                              *(double *)
                                               ((long)local_390.p +
                                               lVar86 * 8 + lVar108 + lVar103 + lVar94 * -8 + lVar64
                                               );
                        }
                        if (((((lVar99 < lVar67) && (lVar30 <= lVar106)) && (local_cd8 <= lVar104))
                            && ((lVar104 <= local_ccc && (local_cd4 <= iVar73)))) &&
                           ((iVar73 <= local_cc8 &&
                            (*(int *)(lVar26 + (lVar48 + lVar66) * 4 + lVar47 * -4 + -4 + lVar86 * 4
                                     ) == 0)))) {
                          dVar123 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62 + -8);
                          dVar124 = *(double *)((long)local_768.p + lVar86 * 8 + lVar62);
                          dVar125 = *(double *)((long)local_768.p + lVar86 * 8 + lVar89 + -8);
                          dVar126 = *(double *)((long)local_768.p + lVar86 * 8 + lVar92 + -8);
                          dVar110 = *(double *)((long)local_768.p + lVar86 * 8 + lVar96 + -8);
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar89);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar92);
                          dVar113 = *(double *)((long)local_768.p + lVar86 * 8 + lVar96);
                          dVar122 = dVar122 + (((dVar110 - dVar125) +
                                               (dVar113 - dVar111) + (dVar113 - dVar111) +
                                               (dVar112 - dVar124) * 4.0 +
                                               (dVar126 - dVar123) + (dVar126 - dVar123)) * dVar118
                                              + ((dVar110 - dVar113) +
                                                (dVar126 - dVar112) + (dVar126 - dVar112) +
                                                (dVar123 - dVar124) * 4.0 +
                                                (dVar125 - dVar111) + (dVar125 - dVar111)) * dVar146
                                                + ((dVar110 - dVar126) +
                                                  (dVar113 - dVar112) + (dVar113 - dVar112) +
                                                  (dVar111 - dVar124) * 4.0 +
                                                  (dVar125 - dVar123) + (dVar125 - dVar123)) *
                                                  dVar121) *
                                              local_390.p[(lVar72 + lVar91 + lVar86 + -1) - lVar94];
                        }
                        if (((lVar99 <= lVar67) && (lVar67 <= lVar106)) &&
                           (((local_cd8 <= lVar104 &&
                             (((lVar104 <= local_ccc && (local_cd4 <= iVar73)) &&
                              (iVar73 <= local_cc8)))) &&
                            (*(int *)(lVar82 + lVar51 + lVar47 * -4 + lVar50 + lVar86 * 4) == 0))))
                        {
                          lVar41 = (long)(iVar46 + iVar84);
                          lVar67 = local_768.kstride * (iVar73 - local_768.begin.z);
                          dVar123 = local_768.p[lVar40 + lVar41 + lVar67];
                          lVar30 = lVar93 * 8 * local_768.kstride;
                          dVar124 = local_768.p[lVar49 + lVar41 + lVar67];
                          lVar68 = (long)(iVar76 - local_768.begin.z) * 8 * local_768.kstride;
                          lVar67 = local_768.kstride * lVar97;
                          dVar125 = local_768.p[lVar40 + lVar41 + lVar67];
                          dVar126 = local_768.p[lVar49 + lVar41 + lVar67];
                          dVar110 = *(double *)((long)local_768.p + lVar86 * 8 + lVar30 + lVar102);
                          dVar111 = *(double *)((long)local_768.p + lVar86 * 8 + lVar30 + lVar78);
                          dVar112 = *(double *)((long)local_768.p + lVar86 * 8 + lVar68 + lVar102);
                          dVar113 = *(double *)((long)local_768.p + lVar86 * 8 + lVar68 + lVar78);
                          dVar122 = dVar122 + (((dVar126 - dVar124) +
                                               (dVar113 - dVar111) + (dVar113 - dVar111) +
                                               (dVar112 - dVar110) * 4.0 +
                                               (dVar125 - dVar123) + (dVar125 - dVar123)) * dVar118
                                              + ((dVar126 - dVar113) +
                                                (dVar125 - dVar112) + (dVar125 - dVar112) +
                                                (dVar123 - dVar110) * 4.0 +
                                                (dVar124 - dVar111) + (dVar124 - dVar111)) * dVar146
                                                + ((dVar126 - dVar125) +
                                                  (dVar113 - dVar112) + (dVar113 - dVar112) +
                                                  (dVar111 - dVar110) * 4.0 +
                                                  (dVar124 - dVar123) + (dVar124 - dVar123)) *
                                                  dVar121) *
                                              *(double *)
                                               ((long)local_390.p +
                                               lVar86 * 8 + lVar103 + lVar29 + lVar94 * -8 + lVar64)
                          ;
                        }
                        dVar123 = 1.0;
                        if ((char)local_7ac != '\0') {
                          if (((lVar24 - lVar65 != lVar86) ||
                              ((dVar123 = 2.0, iVar2 != 0x66 && (dVar123 = 2.0, iVar2 != 0x6a)))) &&
                             (dVar123 = 1.0, local_5d4.smallend.vect[0] + iVar84 == local_62c[0])) {
                            dVar123 = dVar133;
                          }
                          if (((local_638._4_4_ == iVar59) &&
                              ((local_7e8._4_4_ == 0x6a || (local_7e8._4_4_ == 0x66)))) ||
                             ((local_62c[1] == iVar59 &&
                              ((local_7f8._4_4_ == 0x6a || (local_7f8._4_4_ == 0x66)))))) {
                            dVar123 = dVar123 + dVar123;
                          }
                          if (((local_630 == iVar73) && ((LVar17 == inflow || (LVar17 == Neumann))))
                             || (((int)uStack_624 == iVar73 &&
                                 ((LVar16 == inflow || (LVar16 == Neumann)))))) {
                            dVar123 = dVar123 + dVar123;
                          }
                        }
                        local_878.p
                        [lVar65 + (((lVar104 - local_878.begin.y) * local_878.jstride +
                                   (lVar88 - local_878.begin.z) * local_878.kstride + lVar86) -
                                  (long)local_878.begin.x)] =
                             (double)(*(double *)
                                       ((lVar88 - local_838.begin.z) *
                                        CONCAT44(local_838.kstride._4_4_,(int)local_838.kstride) * 8
                                        + (lVar104 - local_838.begin.y) *
                                          CONCAT44(local_838.jstride._4_4_,(int)local_838.jstride) *
                                          8 + (long)local_838.begin.x * -8 +
                                        CONCAT44(local_838.p._4_4_,(int)local_838.p) + lVar64 +
                                       lVar86 * 8) -
                                     (dVar122 +
                                     *(double *)
                                      ((lVar88 - local_7a8.begin.z) *
                                       CONCAT44(local_7a8.kstride._4_4_,(int)local_7a8.kstride) * 8
                                       + (lVar104 - local_7a8.begin.y) *
                                         CONCAT44(local_7a8.jstride._4_4_,(int)local_7a8.jstride) *
                                         8 + (long)local_7a8.begin.x * -8 +
                                       CONCAT44(local_7a8.p._4_4_,(int)local_7a8.p) + lVar64 +
                                      lVar86 * 8)) * dVar123);
                      }
                      lVar86 = lVar86 + 1;
                    } while (~local_5d4.bigend.vect[0] + local_5d4.smallend.vect[0] + (int)lVar86 !=
                             0);
                  }
                  lVar104 = lVar104 + 1;
                  lVar38 = lVar38 + local_678.jstride * 4;
                  local_dc0 = local_dc0 + 1;
                } while (local_5d4.bigend.vect[1] + 1 != (int)lVar104);
              }
              iVar31 = iVar31 + 1;
              bVar109 = iVar73 != local_5d4.bigend.vect[2];
              iVar73 = iVar73 + 1;
            } while (bVar109);
          }
        }
      }
      MFIter::operator++((MFIter *)local_728);
    } while ((int)local_718.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_700);
  }
  MFIter::~MFIter((MFIter *)local_728);
  EB_set_covered((MultiFab *)local_6c8,0.0);
  MultiFab::~MultiFab((MultiFab *)local_518);
  MultiFab::~MultiFab((MultiFab *)local_338);
  if (this_03 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(((FabArray<amrex::FArrayBox> *)&this_03->super_FabArrayBase)->super_FabArrayBase).
      _vptr_FabArrayBase[1])();
  }
  MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
MLNodeLaplacian::reflux (int crse_amrlev,
                         MultiFab& res, const MultiFab& crse_sol, const MultiFab& crse_rhs,
                         MultiFab& a_fine_res, MultiFab& fine_sol, const MultiFab& fine_rhs) const
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(crse_amrlev,res,crse_sol,crse_rhs,a_fine_res,fine_sol,fine_rhs);
#else
    //
    //  Note that the residue we copmute on a coarse/fine node is not a
    //  composite divergence.  It has been restricted so that it is suitable
    //  as RHS for our geometric mulitgrid solver with a MG hirerachy
    //  including multiple AMR levels.
    //

    BL_PROFILE("MLNodeLaplacian::reflux()");

    const int amrrr = AMRRefRatio(crse_amrlev);
    AMREX_ALWAYS_ASSERT(amrrr == 2 || m_coarsening_strategy == CoarseningStrategy::Sigma);

    const Geometry& cgeom = m_geom[crse_amrlev  ][0];
    const Geometry& fgeom = m_geom[crse_amrlev+1][0];
    const auto cdxinv = cgeom.InvCellSizeArray();
    const auto fdxinv = fgeom.InvCellSizeArray();
    const Box& c_cc_domain = cgeom.Domain();
    const Box& c_cc_domain_p = cgeom.growPeriodicDomain(1);
    const Box& c_nd_domain = amrex::surroundingNodes(c_cc_domain);
    const Box& f_nd_domain = amrex::surroundingNodes(fgeom.Domain());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    bool neumann_doubling = false;
    if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            neumann_doubling = neumann_doubling || (lobc[idim] == LinOpBCType::inflow  ||
                                                    lobc[idim] == LinOpBCType::Neumann ||
                                                    hibc[idim] == LinOpBCType::inflow  ||
                                                    hibc[idim] == LinOpBCType::Neumann);
        }
    }

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const BoxArray& fba = fine_sol.boxArray();
    const DistributionMapping& fdm = fine_sol.DistributionMap();

    const iMultiFab& fdmsk = *m_dirichlet_mask[crse_amrlev+1][0];
    const auto& stencil    =  m_nosigma_stencil[crse_amrlev+1];

    MultiFab fine_res_for_coarse(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    std::unique_ptr<MultiFab> tmp_fine_res;
    if (amrrr == 4 && !a_fine_res.nGrowVect().allGE(IntVect(3))) {
        tmp_fine_res = std::make_unique<MultiFab>(a_fine_res.boxArray(),
                                                  a_fine_res.DistributionMap(), 1, 3);
        MultiFab::Copy(*tmp_fine_res, a_fine_res, 0, 0, 1, 0);
    }
    MultiFab& fine_res = (tmp_fine_res) ? *tmp_fine_res :  a_fine_res;

    fine_res.FillBoundary(fgeom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine_res_for_coarse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& cfab = fine_res_for_coarse.array(mfi);
        Array4<Real const> const& ffab = fine_res.const_array(mfi);
        Array4<int const> const& mfab = fdmsk.const_array(mfi);
        if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<2>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<4>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            }
        } else {
            Array4<Real const> const& stfab = stencil->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
            });
        }
    }
    res.ParallelCopy(fine_res_for_coarse, cgeom.periodicity());

    MultiFab fine_contrib(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    const auto& fsigma = m_sigma[crse_amrlev+1][0][0];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine_contrib,mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& cbx = mfi.tilebox();
        const Box& fvbx = amrex::refine(mfi.validbox(),amrrr);
        const Box& cc_fvbx = amrex::enclosedCells(fvbx);

        Array4<Real> const& farr = fine_contrib.array(mfi);
        Array4<Real const> const& resarr = fine_res.const_array(mfi);
        Array4<Real const> const& rhsarr = fine_rhs.const_array(mfi);
        Array4<Real const> const& solarr = fine_sol.const_array(mfi);
        Array4<int const> const& marr = fdmsk.const_array(mfi);

        if (fsigma) {
            Array4<Real const> const& sigarr = fsigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,is_rz,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,is_rz,fdxinv);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,fdxinv);
                });
            }
#endif
        } else {
            Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 1)
            amrex::ignore_unused(const_sigma);
#elif (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,is_rz,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,is_rz,fdxinv);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,fdxinv);
                });
            }
#endif
        }
    }

    MultiFab fine_contrib_on_crse(crse_sol.boxArray(), crse_sol.DistributionMap(), 1, 0);
    fine_contrib_on_crse.setVal(0.0);
    fine_contrib_on_crse.ParallelAdd(fine_contrib, cgeom.periodicity());

    const iMultiFab& cdmsk = *m_dirichlet_mask[crse_amrlev][0];
    const auto& nd_mask     = m_nd_fine_mask[crse_amrlev];
    const auto& cc_mask     = m_cc_fine_mask[crse_amrlev];
    const auto& has_fine_bndry = m_has_fine_bndry[crse_amrlev];

    const auto& csigma = m_sigma[crse_amrlev][0][0];

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(res,mfi_info); mfi.isValid(); ++mfi)
    {
        if ((*has_fine_bndry)[mfi])
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& resarr = res.array(mfi);
            Array4<Real const> const& csolarr = crse_sol.const_array(mfi);
            Array4<Real const> const& crhsarr = crse_rhs.const_array(mfi);
            Array4<int const> const& cdmskarr = cdmsk.const_array(mfi);
            Array4<int const> const& ndmskarr = nd_mask->const_array(mfi);
            Array4<int const> const& ccmskarr = cc_mask->const_array(mfi);
            Array4<Real const> const& fcocarr = fine_contrib_on_crse.const_array(mfi);

            if (csigma) {
                Array4<Real const> const& csigarr = csigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib(i,j,k,resarr,csolarr,crhsarr,csigarr,
                                           cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                           cdxinv,c_cc_domain_p,c_nd_domain,
                                           is_rz,
                                           lobc,hibc, neumann_doubling);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib(i,j,k,resarr,csolarr,crhsarr,csigarr,
                                           cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                           cdxinv,c_cc_domain_p,c_nd_domain,
                                           lobc,hibc, neumann_doubling);
                });
#endif
            } else {
                Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 1)
                amrex::ignore_unused(const_sigma);
#elif (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib_cs(i,j,k,resarr,csolarr,crhsarr,const_sigma,
                                              cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                              cdxinv,c_cc_domain_p,c_nd_domain,
                                              is_rz,
                                              lobc,hibc, neumann_doubling);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib_cs(i,j,k,resarr,csolarr,crhsarr,const_sigma,
                                              cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                              cdxinv,c_cc_domain_p,c_nd_domain,
                                              lobc,hibc, neumann_doubling);
                });
#endif
            }
        }
    }
#ifdef AMREX_USE_EB
    // Make sure to zero out the residual on any nodes completely surrounded by covered cells
    amrex::EB_set_covered(res,0.0);
#endif
#endif
}